

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Primitive PVar23;
  Geometry *pGVar24;
  __int_type_conflict _Var25;
  long lVar26;
  long lVar27;
  RTCFilterFunctionN p_Var28;
  RTCRayQueryContext *pRVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [12];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  uint uVar98;
  uint uVar99;
  undefined1 (*pauVar100) [32];
  ulong uVar101;
  uint uVar102;
  uint uVar103;
  uint uVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  int iVar108;
  ulong uVar109;
  float fVar110;
  float fVar144;
  float fVar146;
  __m128 a;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar111;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar112;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar148;
  undefined1 auVar130 [32];
  float fVar145;
  float fVar147;
  float fVar149;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar116 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar153;
  float fVar181;
  float fVar182;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar183;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  float fVar205;
  undefined1 auVar192 [32];
  undefined1 auVar184 [16];
  undefined1 auVar193 [32];
  undefined1 auVar185 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar187 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar206;
  float fVar233;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [28];
  float fVar231;
  float fVar232;
  float fVar234;
  float fVar235;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar236;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar237;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [28];
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar260;
  float fVar276;
  float fVar278;
  undefined1 auVar262 [16];
  float fVar261;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar282;
  float fVar284;
  float fVar286;
  undefined1 auVar268 [32];
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar283;
  float fVar285;
  float fVar287;
  undefined1 auVar269 [32];
  float fVar288;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar306;
  float fVar309;
  float fVar315;
  float fVar318;
  float fVar321;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar312;
  undefined1 auVar297 [32];
  float fVar307;
  float fVar310;
  float fVar313;
  float fVar316;
  float fVar319;
  float fVar322;
  undefined1 auVar298 [32];
  float fVar308;
  float fVar311;
  float fVar314;
  float fVar317;
  float fVar320;
  float fVar323;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [64];
  float fVar324;
  float fVar334;
  float fVar335;
  float fVar337;
  float fVar339;
  float fVar341;
  float fVar343;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar336;
  float fVar338;
  float fVar340;
  float fVar342;
  float fVar344;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [64];
  float fVar359;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar372;
  float fVar374;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar371;
  float fVar373;
  float fVar375;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar377 [16];
  float fVar376;
  float fVar387;
  float fVar388;
  float fVar390;
  float fVar391;
  float fVar392;
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  float fVar389;
  float fVar393;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  float fVar394;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  float fVar409;
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [64];
  undefined1 auVar411 [16];
  float fVar410;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar421;
  float fVar422;
  float in_register_0000151c;
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  float fVar423;
  float fVar424;
  float fVar432;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar438 [16];
  float fVar444;
  float fVar445;
  float in_register_0000159c;
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  float in_register_000015dc;
  undefined1 auVar449 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  float local_c40;
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 auStack_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 (*local_9d8) [16];
  undefined1 (*local_9d0) [16];
  uint *local_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  ulong local_920;
  undefined1 auStack_918 [24];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  Primitive *local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  RTCHitN local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar23 = prim[1];
  uVar109 = (ulong)(byte)PVar23;
  lVar106 = uVar109 * 0x25;
  auVar157 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar157 = vinsertps_avx(auVar157,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar157 = vsubps_avx(auVar157,*(undefined1 (*) [16])(prim + lVar106 + 6));
  fVar206 = *(float *)(prim + lVar106 + 0x12);
  auVar154._0_4_ = fVar206 * auVar157._0_4_;
  auVar154._4_4_ = fVar206 * auVar157._4_4_;
  auVar154._8_4_ = fVar206 * auVar157._8_4_;
  auVar154._12_4_ = fVar206 * auVar157._12_4_;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 4 + 6)));
  auVar262._0_4_ = fVar206 * auVar33._0_4_;
  auVar262._4_4_ = fVar206 * auVar33._4_4_;
  auVar262._8_4_ = fVar206 * auVar33._8_4_;
  auVar262._12_4_ = fVar206 * auVar33._12_4_;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 4 + 10)));
  auVar125._16_16_ = auVar33;
  auVar125._0_16_ = auVar157;
  auVar125 = vcvtdq2ps_avx(auVar125);
  lVar1 = uVar109 * 5;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 10)));
  auVar191._16_16_ = auVar33;
  auVar191._0_16_ = auVar157;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 6 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 6 + 10)));
  auVar180 = vcvtdq2ps_avx(auVar191);
  auVar223._16_16_ = auVar33;
  auVar223._0_16_ = auVar157;
  auVar30 = vcvtdq2ps_avx(auVar223);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0xf + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0xf + 10)));
  auVar224._16_16_ = auVar33;
  auVar224._0_16_ = auVar157;
  auVar366 = vcvtdq2ps_avx(auVar224);
  lVar107 = (ulong)(byte)PVar23 * 0x10;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar107 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar107 + 10)));
  auVar295._16_16_ = auVar33;
  auVar295._0_16_ = auVar157;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar107 + uVar109 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar295);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar107 + uVar109 + 10)));
  auVar325._16_16_ = auVar33;
  auVar325._0_16_ = auVar157;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0x1a + 6)));
  auVar195 = vcvtdq2ps_avx(auVar325);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0x1a + 10)));
  auVar326._16_16_ = auVar33;
  auVar326._0_16_ = auVar157;
  auVar431 = vcvtdq2ps_avx(auVar326);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0x1b + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0x1b + 10)));
  auVar360._16_16_ = auVar33;
  auVar360._0_16_ = auVar157;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0x1c + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0x1c + 10)));
  auVar353 = vcvtdq2ps_avx(auVar360);
  auVar378._16_16_ = auVar33;
  auVar378._0_16_ = auVar157;
  auVar32 = vcvtdq2ps_avx(auVar378);
  auVar157 = vshufps_avx(auVar262,auVar262,0);
  auVar33 = vshufps_avx(auVar262,auVar262,0x55);
  auVar42 = vshufps_avx(auVar262,auVar262,0xaa);
  fVar206 = auVar42._0_4_;
  fVar288 = auVar42._4_4_;
  fVar231 = auVar42._8_4_;
  fVar112 = auVar42._12_4_;
  fVar205 = auVar33._0_4_;
  fVar232 = auVar33._4_4_;
  fVar233 = auVar33._8_4_;
  fVar111 = auVar33._12_4_;
  fVar234 = auVar157._0_4_;
  fVar235 = auVar157._4_4_;
  fVar236 = auVar157._8_4_;
  fVar237 = auVar157._12_4_;
  auVar412._0_4_ = fVar234 * auVar125._0_4_ + fVar205 * auVar180._0_4_ + fVar206 * auVar30._0_4_;
  auVar412._4_4_ = fVar235 * auVar125._4_4_ + fVar232 * auVar180._4_4_ + fVar288 * auVar30._4_4_;
  auVar412._8_4_ = fVar236 * auVar125._8_4_ + fVar233 * auVar180._8_4_ + fVar231 * auVar30._8_4_;
  auVar412._12_4_ = fVar237 * auVar125._12_4_ + fVar111 * auVar180._12_4_ + fVar112 * auVar30._12_4_
  ;
  auVar412._16_4_ = fVar234 * auVar125._16_4_ + fVar205 * auVar180._16_4_ + fVar206 * auVar30._16_4_
  ;
  auVar412._20_4_ = fVar235 * auVar125._20_4_ + fVar232 * auVar180._20_4_ + fVar288 * auVar30._20_4_
  ;
  auVar412._24_4_ = fVar236 * auVar125._24_4_ + fVar233 * auVar180._24_4_ + fVar231 * auVar30._24_4_
  ;
  auVar412._28_4_ = fVar111 + in_register_000015dc + in_register_0000151c;
  auVar395._0_4_ = fVar234 * auVar366._0_4_ + fVar205 * auVar31._0_4_ + auVar195._0_4_ * fVar206;
  auVar395._4_4_ = fVar235 * auVar366._4_4_ + fVar232 * auVar31._4_4_ + auVar195._4_4_ * fVar288;
  auVar395._8_4_ = fVar236 * auVar366._8_4_ + fVar233 * auVar31._8_4_ + auVar195._8_4_ * fVar231;
  auVar395._12_4_ = fVar237 * auVar366._12_4_ + fVar111 * auVar31._12_4_ + auVar195._12_4_ * fVar112
  ;
  auVar395._16_4_ = fVar234 * auVar366._16_4_ + fVar205 * auVar31._16_4_ + auVar195._16_4_ * fVar206
  ;
  auVar395._20_4_ = fVar235 * auVar366._20_4_ + fVar232 * auVar31._20_4_ + auVar195._20_4_ * fVar288
  ;
  auVar395._24_4_ = fVar236 * auVar366._24_4_ + fVar233 * auVar31._24_4_ + auVar195._24_4_ * fVar231
  ;
  auVar395._28_4_ = fVar111 + in_register_000015dc + in_register_0000159c;
  auVar268._0_4_ = fVar234 * auVar431._0_4_ + fVar205 * auVar353._0_4_ + auVar32._0_4_ * fVar206;
  auVar268._4_4_ = fVar235 * auVar431._4_4_ + fVar232 * auVar353._4_4_ + auVar32._4_4_ * fVar288;
  auVar268._8_4_ = fVar236 * auVar431._8_4_ + fVar233 * auVar353._8_4_ + auVar32._8_4_ * fVar231;
  auVar268._12_4_ = fVar237 * auVar431._12_4_ + fVar111 * auVar353._12_4_ + auVar32._12_4_ * fVar112
  ;
  auVar268._16_4_ = fVar234 * auVar431._16_4_ + fVar205 * auVar353._16_4_ + auVar32._16_4_ * fVar206
  ;
  auVar268._20_4_ = fVar235 * auVar431._20_4_ + fVar232 * auVar353._20_4_ + auVar32._20_4_ * fVar288
  ;
  auVar268._24_4_ = fVar236 * auVar431._24_4_ + fVar233 * auVar353._24_4_ + auVar32._24_4_ * fVar231
  ;
  auVar268._28_4_ = fVar237 + fVar111 + fVar112;
  auVar157 = vshufps_avx(auVar154,auVar154,0);
  auVar33 = vshufps_avx(auVar154,auVar154,0x55);
  auVar42 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar206 = auVar42._0_4_;
  fVar288 = auVar42._4_4_;
  fVar231 = auVar42._8_4_;
  fVar112 = auVar42._12_4_;
  fVar235 = auVar33._0_4_;
  fVar236 = auVar33._4_4_;
  fVar237 = auVar33._8_4_;
  fVar254 = auVar33._12_4_;
  fVar205 = auVar180._28_4_ + auVar30._28_4_;
  fVar232 = auVar157._0_4_;
  fVar233 = auVar157._4_4_;
  fVar111 = auVar157._8_4_;
  fVar234 = auVar157._12_4_;
  auVar169._0_4_ = fVar232 * auVar125._0_4_ + fVar235 * auVar180._0_4_ + fVar206 * auVar30._0_4_;
  auVar169._4_4_ = fVar233 * auVar125._4_4_ + fVar236 * auVar180._4_4_ + fVar288 * auVar30._4_4_;
  auVar169._8_4_ = fVar111 * auVar125._8_4_ + fVar237 * auVar180._8_4_ + fVar231 * auVar30._8_4_;
  auVar169._12_4_ = fVar234 * auVar125._12_4_ + fVar254 * auVar180._12_4_ + fVar112 * auVar30._12_4_
  ;
  auVar169._16_4_ = fVar232 * auVar125._16_4_ + fVar235 * auVar180._16_4_ + fVar206 * auVar30._16_4_
  ;
  auVar169._20_4_ = fVar233 * auVar125._20_4_ + fVar236 * auVar180._20_4_ + fVar288 * auVar30._20_4_
  ;
  auVar169._24_4_ = fVar111 * auVar125._24_4_ + fVar237 * auVar180._24_4_ + fVar231 * auVar30._24_4_
  ;
  auVar169._28_4_ = auVar125._28_4_ + fVar205;
  auVar126._0_4_ = fVar232 * auVar366._0_4_ + auVar195._0_4_ * fVar206 + fVar235 * auVar31._0_4_;
  auVar126._4_4_ = fVar233 * auVar366._4_4_ + auVar195._4_4_ * fVar288 + fVar236 * auVar31._4_4_;
  auVar126._8_4_ = fVar111 * auVar366._8_4_ + auVar195._8_4_ * fVar231 + fVar237 * auVar31._8_4_;
  auVar126._12_4_ = fVar234 * auVar366._12_4_ + auVar195._12_4_ * fVar112 + fVar254 * auVar31._12_4_
  ;
  auVar126._16_4_ = fVar232 * auVar366._16_4_ + auVar195._16_4_ * fVar206 + fVar235 * auVar31._16_4_
  ;
  auVar126._20_4_ = fVar233 * auVar366._20_4_ + auVar195._20_4_ * fVar288 + fVar236 * auVar31._20_4_
  ;
  auVar126._24_4_ = fVar111 * auVar366._24_4_ + auVar195._24_4_ * fVar231 + fVar237 * auVar31._24_4_
  ;
  auVar126._28_4_ = auVar125._28_4_ + auVar195._28_4_ + auVar30._28_4_;
  auVar327._8_4_ = 0x7fffffff;
  auVar327._0_8_ = 0x7fffffff7fffffff;
  auVar327._12_4_ = 0x7fffffff;
  auVar327._16_4_ = 0x7fffffff;
  auVar327._20_4_ = 0x7fffffff;
  auVar327._24_4_ = 0x7fffffff;
  auVar327._28_4_ = 0x7fffffff;
  auVar347._8_4_ = 0x219392ef;
  auVar347._0_8_ = 0x219392ef219392ef;
  auVar347._12_4_ = 0x219392ef;
  auVar347._16_4_ = 0x219392ef;
  auVar347._20_4_ = 0x219392ef;
  auVar347._24_4_ = 0x219392ef;
  auVar347._28_4_ = 0x219392ef;
  auVar125 = vandps_avx(auVar412,auVar327);
  auVar125 = vcmpps_avx(auVar125,auVar347,1);
  auVar180 = vblendvps_avx(auVar412,auVar347,auVar125);
  auVar125 = vandps_avx(auVar395,auVar327);
  auVar125 = vcmpps_avx(auVar125,auVar347,1);
  auVar30 = vblendvps_avx(auVar395,auVar347,auVar125);
  auVar125 = vandps_avx(auVar268,auVar327);
  auVar125 = vcmpps_avx(auVar125,auVar347,1);
  auVar125 = vblendvps_avx(auVar268,auVar347,auVar125);
  auVar192._0_4_ = fVar232 * auVar431._0_4_ + fVar235 * auVar353._0_4_ + auVar32._0_4_ * fVar206;
  auVar192._4_4_ = fVar233 * auVar431._4_4_ + fVar236 * auVar353._4_4_ + auVar32._4_4_ * fVar288;
  auVar192._8_4_ = fVar111 * auVar431._8_4_ + fVar237 * auVar353._8_4_ + auVar32._8_4_ * fVar231;
  auVar192._12_4_ = fVar234 * auVar431._12_4_ + fVar254 * auVar353._12_4_ + auVar32._12_4_ * fVar112
  ;
  auVar192._16_4_ = fVar232 * auVar431._16_4_ + fVar235 * auVar353._16_4_ + auVar32._16_4_ * fVar206
  ;
  auVar192._20_4_ = fVar233 * auVar431._20_4_ + fVar236 * auVar353._20_4_ + auVar32._20_4_ * fVar288
  ;
  auVar192._24_4_ = fVar111 * auVar431._24_4_ + fVar237 * auVar353._24_4_ + auVar32._24_4_ * fVar231
  ;
  auVar192._28_4_ = fVar205 + auVar31._28_4_ + fVar112;
  auVar366 = vrcpps_avx(auVar180);
  fVar206 = auVar366._0_4_;
  fVar231 = auVar366._4_4_;
  auVar31._4_4_ = auVar180._4_4_ * fVar231;
  auVar31._0_4_ = auVar180._0_4_ * fVar206;
  fVar205 = auVar366._8_4_;
  auVar31._8_4_ = auVar180._8_4_ * fVar205;
  fVar233 = auVar366._12_4_;
  auVar31._12_4_ = auVar180._12_4_ * fVar233;
  fVar234 = auVar366._16_4_;
  auVar31._16_4_ = auVar180._16_4_ * fVar234;
  fVar235 = auVar366._20_4_;
  auVar31._20_4_ = auVar180._20_4_ * fVar235;
  fVar236 = auVar366._24_4_;
  auVar31._24_4_ = auVar180._24_4_ * fVar236;
  auVar31._28_4_ = auVar180._28_4_;
  auVar348._8_4_ = 0x3f800000;
  auVar348._0_8_ = 0x3f8000003f800000;
  auVar348._12_4_ = 0x3f800000;
  auVar348._16_4_ = 0x3f800000;
  auVar348._20_4_ = 0x3f800000;
  auVar348._24_4_ = 0x3f800000;
  auVar348._28_4_ = 0x3f800000;
  auVar195 = vsubps_avx(auVar348,auVar31);
  auVar31 = vrcpps_avx(auVar30);
  fVar206 = fVar206 + fVar206 * auVar195._0_4_;
  fVar231 = fVar231 + fVar231 * auVar195._4_4_;
  fVar205 = fVar205 + fVar205 * auVar195._8_4_;
  fVar233 = fVar233 + fVar233 * auVar195._12_4_;
  fVar234 = fVar234 + fVar234 * auVar195._16_4_;
  fVar235 = fVar235 + fVar235 * auVar195._20_4_;
  fVar236 = fVar236 + fVar236 * auVar195._24_4_;
  fVar237 = auVar31._0_4_;
  fVar254 = auVar31._4_4_;
  auVar180._4_4_ = fVar254 * auVar30._4_4_;
  auVar180._0_4_ = fVar237 * auVar30._0_4_;
  fVar255 = auVar31._8_4_;
  auVar180._8_4_ = fVar255 * auVar30._8_4_;
  fVar256 = auVar31._12_4_;
  auVar180._12_4_ = fVar256 * auVar30._12_4_;
  fVar257 = auVar31._16_4_;
  auVar180._16_4_ = fVar257 * auVar30._16_4_;
  fVar258 = auVar31._20_4_;
  auVar180._20_4_ = fVar258 * auVar30._20_4_;
  fVar259 = auVar31._24_4_;
  auVar180._24_4_ = fVar259 * auVar30._24_4_;
  auVar180._28_4_ = auVar30._28_4_;
  auVar30 = vsubps_avx(auVar348,auVar180);
  fVar237 = fVar237 + fVar237 * auVar30._0_4_;
  fVar254 = fVar254 + fVar254 * auVar30._4_4_;
  fVar255 = fVar255 + fVar255 * auVar30._8_4_;
  fVar256 = fVar256 + fVar256 * auVar30._12_4_;
  fVar257 = fVar257 + fVar257 * auVar30._16_4_;
  fVar258 = fVar258 + fVar258 * auVar30._20_4_;
  fVar259 = fVar259 + fVar259 * auVar30._24_4_;
  auVar180 = vrcpps_avx(auVar125);
  fVar260 = auVar180._0_4_;
  fVar276 = auVar180._4_4_;
  auVar431._4_4_ = fVar276 * auVar125._4_4_;
  auVar431._0_4_ = fVar260 * auVar125._0_4_;
  fVar278 = auVar180._8_4_;
  auVar431._8_4_ = fVar278 * auVar125._8_4_;
  fVar280 = auVar180._12_4_;
  auVar431._12_4_ = fVar280 * auVar125._12_4_;
  fVar282 = auVar180._16_4_;
  auVar431._16_4_ = fVar282 * auVar125._16_4_;
  fVar284 = auVar180._20_4_;
  auVar431._20_4_ = fVar284 * auVar125._20_4_;
  fVar286 = auVar180._24_4_;
  auVar431._24_4_ = fVar286 * auVar125._24_4_;
  auVar431._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar348,auVar431);
  fVar260 = fVar260 + fVar260 * auVar125._0_4_;
  fVar276 = fVar276 + fVar276 * auVar125._4_4_;
  fVar278 = fVar278 + fVar278 * auVar125._8_4_;
  fVar280 = fVar280 + fVar280 * auVar125._12_4_;
  fVar282 = fVar282 + fVar282 * auVar125._16_4_;
  fVar284 = fVar284 + fVar284 * auVar125._20_4_;
  fVar286 = fVar286 + fVar286 * auVar125._24_4_;
  auVar157 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar106 + 0x16)) *
                           *(float *)(prim + lVar106 + 0x1a)));
  auVar43 = vshufps_avx(auVar157,auVar157,0);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar109 * 7 + 6);
  auVar157 = vpmovsxwd_avx(auVar157);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar109 * 7 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar328._16_16_ = auVar33;
  auVar328._0_16_ = auVar157;
  auVar125 = vcvtdq2ps_avx(auVar328);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar109 * 0xb + 6);
  auVar157 = vpmovsxwd_avx(auVar42);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar109 * 0xb + 0xe);
  auVar33 = vpmovsxwd_avx(auVar11);
  auVar349._16_16_ = auVar33;
  auVar349._0_16_ = auVar157;
  auVar180 = vcvtdq2ps_avx(auVar349);
  auVar180 = vsubps_avx(auVar180,auVar125);
  fVar288 = auVar43._0_4_;
  fVar112 = auVar43._4_4_;
  fVar232 = auVar43._8_4_;
  fVar111 = auVar43._12_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar109 * 9 + 6);
  auVar157 = vpmovsxwd_avx(auVar43);
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *(ulong *)(prim + uVar109 * 9 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar263);
  auVar329._0_4_ = auVar180._0_4_ * fVar288 + auVar125._0_4_;
  auVar329._4_4_ = auVar180._4_4_ * fVar112 + auVar125._4_4_;
  auVar329._8_4_ = auVar180._8_4_ * fVar232 + auVar125._8_4_;
  auVar329._12_4_ = auVar180._12_4_ * fVar111 + auVar125._12_4_;
  auVar329._16_4_ = auVar180._16_4_ * fVar288 + auVar125._16_4_;
  auVar329._20_4_ = auVar180._20_4_ * fVar112 + auVar125._20_4_;
  auVar329._24_4_ = auVar180._24_4_ * fVar232 + auVar125._24_4_;
  auVar329._28_4_ = auVar180._28_4_ + auVar125._28_4_;
  auVar350._16_16_ = auVar33;
  auVar350._0_16_ = auVar157;
  auVar125 = vcvtdq2ps_avx(auVar350);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar109 * 0xd + 6);
  auVar157 = vpmovsxwd_avx(auVar158);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar109 * 0xd + 0xe);
  auVar33 = vpmovsxwd_avx(auVar118);
  auVar361._16_16_ = auVar33;
  auVar361._0_16_ = auVar157;
  auVar180 = vcvtdq2ps_avx(auVar361);
  auVar180 = vsubps_avx(auVar180,auVar125);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar109 * 0x12 + 6);
  auVar157 = vpmovsxwd_avx(auVar122);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar109 * 0x12 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar188);
  auVar351._0_4_ = auVar125._0_4_ + auVar180._0_4_ * fVar288;
  auVar351._4_4_ = auVar125._4_4_ + auVar180._4_4_ * fVar112;
  auVar351._8_4_ = auVar125._8_4_ + auVar180._8_4_ * fVar232;
  auVar351._12_4_ = auVar125._12_4_ + auVar180._12_4_ * fVar111;
  auVar351._16_4_ = auVar125._16_4_ + auVar180._16_4_ * fVar288;
  auVar351._20_4_ = auVar125._20_4_ + auVar180._20_4_ * fVar112;
  auVar351._24_4_ = auVar125._24_4_ + auVar180._24_4_ * fVar232;
  auVar351._28_4_ = auVar125._28_4_ + auVar180._28_4_;
  auVar362._16_16_ = auVar33;
  auVar362._0_16_ = auVar157;
  auVar125 = vcvtdq2ps_avx(auVar362);
  uVar101 = (ulong)(uint)((int)lVar1 << 2);
  lVar106 = uVar109 * 2 + uVar101;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + lVar106 + 6);
  auVar157 = vpmovsxwd_avx(auVar217);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar106 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar12);
  auVar379._16_16_ = auVar33;
  auVar379._0_16_ = auVar157;
  auVar180 = vcvtdq2ps_avx(auVar379);
  auVar180 = vsubps_avx(auVar180,auVar125);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar101 + 6);
  auVar157 = vpmovsxwd_avx(auVar13);
  auVar363._0_4_ = auVar125._0_4_ + auVar180._0_4_ * fVar288;
  auVar363._4_4_ = auVar125._4_4_ + auVar180._4_4_ * fVar112;
  auVar363._8_4_ = auVar125._8_4_ + auVar180._8_4_ * fVar232;
  auVar363._12_4_ = auVar125._12_4_ + auVar180._12_4_ * fVar111;
  auVar363._16_4_ = auVar125._16_4_ + auVar180._16_4_ * fVar288;
  auVar363._20_4_ = auVar125._20_4_ + auVar180._20_4_ * fVar112;
  auVar363._24_4_ = auVar125._24_4_ + auVar180._24_4_ * fVar232;
  auVar363._28_4_ = auVar125._28_4_ + auVar180._28_4_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar101 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar120);
  auVar380._16_16_ = auVar33;
  auVar380._0_16_ = auVar157;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar109 * 0x18 + 6);
  auVar157 = vpmovsxwd_avx(auVar124);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar109 * 0x18 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar14);
  auVar125 = vcvtdq2ps_avx(auVar380);
  auVar396._16_16_ = auVar33;
  auVar396._0_16_ = auVar157;
  auVar180 = vcvtdq2ps_avx(auVar396);
  auVar180 = vsubps_avx(auVar180,auVar125);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar109 * 0x1d + 6);
  auVar157 = vpmovsxwd_avx(auVar15);
  auVar381._0_4_ = auVar125._0_4_ + auVar180._0_4_ * fVar288;
  auVar381._4_4_ = auVar125._4_4_ + auVar180._4_4_ * fVar112;
  auVar381._8_4_ = auVar125._8_4_ + auVar180._8_4_ * fVar232;
  auVar381._12_4_ = auVar125._12_4_ + auVar180._12_4_ * fVar111;
  auVar381._16_4_ = auVar125._16_4_ + auVar180._16_4_ * fVar288;
  auVar381._20_4_ = auVar125._20_4_ + auVar180._20_4_ * fVar112;
  auVar381._24_4_ = auVar125._24_4_ + auVar180._24_4_ * fVar232;
  auVar381._28_4_ = auVar125._28_4_ + auVar180._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar109 * 0x1d + 0xe);
  auVar33 = vpmovsxwd_avx(auVar16);
  lVar106 = uVar109 + (ulong)(byte)PVar23 * 0x20;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar106 + 6);
  auVar42 = vpmovsxwd_avx(auVar17);
  auVar397._16_16_ = auVar33;
  auVar397._0_16_ = auVar157;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar106 + 0xe);
  auVar157 = vpmovsxwd_avx(auVar18);
  auVar413._16_16_ = auVar157;
  auVar413._0_16_ = auVar42;
  auVar125 = vcvtdq2ps_avx(auVar397);
  auVar180 = vcvtdq2ps_avx(auVar413);
  auVar180 = vsubps_avx(auVar180,auVar125);
  auVar398._0_4_ = auVar125._0_4_ + auVar180._0_4_ * fVar288;
  auVar398._4_4_ = auVar125._4_4_ + auVar180._4_4_ * fVar112;
  auVar398._8_4_ = auVar125._8_4_ + auVar180._8_4_ * fVar232;
  auVar398._12_4_ = auVar125._12_4_ + auVar180._12_4_ * fVar111;
  auVar398._16_4_ = auVar125._16_4_ + auVar180._16_4_ * fVar288;
  auVar398._20_4_ = auVar125._20_4_ + auVar180._20_4_ * fVar112;
  auVar398._24_4_ = auVar125._24_4_ + auVar180._24_4_ * fVar232;
  auVar398._28_4_ = auVar125._28_4_ + auVar180._28_4_;
  lVar106 = (ulong)(byte)PVar23 * 0x20 - uVar109;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar106 + 6);
  auVar157 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar106 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar20);
  auVar414._16_16_ = auVar33;
  auVar414._0_16_ = auVar157;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar109 * 0x23 + 6);
  auVar157 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar109 * 0x23 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar22);
  auVar425._16_16_ = auVar33;
  auVar425._0_16_ = auVar157;
  auVar125 = vcvtdq2ps_avx(auVar414);
  auVar180 = vcvtdq2ps_avx(auVar425);
  auVar180 = vsubps_avx(auVar180,auVar125);
  auVar415._0_4_ = auVar125._0_4_ + auVar180._0_4_ * fVar288;
  auVar415._4_4_ = auVar125._4_4_ + auVar180._4_4_ * fVar112;
  auVar415._8_4_ = auVar125._8_4_ + auVar180._8_4_ * fVar232;
  auVar415._12_4_ = auVar125._12_4_ + auVar180._12_4_ * fVar111;
  auVar415._16_4_ = auVar125._16_4_ + auVar180._16_4_ * fVar288;
  auVar415._20_4_ = auVar125._20_4_ + auVar180._20_4_ * fVar112;
  auVar415._24_4_ = auVar125._24_4_ + auVar180._24_4_ * fVar232;
  auVar415._28_4_ = auVar125._28_4_ + fVar111;
  auVar125 = vsubps_avx(auVar329,auVar169);
  auVar292._0_4_ = fVar206 * auVar125._0_4_;
  auVar292._4_4_ = fVar231 * auVar125._4_4_;
  auVar292._8_4_ = fVar205 * auVar125._8_4_;
  auVar292._12_4_ = fVar233 * auVar125._12_4_;
  auVar353._16_4_ = fVar234 * auVar125._16_4_;
  auVar353._0_16_ = auVar292;
  auVar353._20_4_ = fVar235 * auVar125._20_4_;
  auVar353._24_4_ = fVar236 * auVar125._24_4_;
  auVar353._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar351,auVar169);
  auVar207._0_4_ = fVar206 * auVar125._0_4_;
  auVar207._4_4_ = fVar231 * auVar125._4_4_;
  auVar207._8_4_ = fVar205 * auVar125._8_4_;
  auVar207._12_4_ = fVar233 * auVar125._12_4_;
  auVar32._16_4_ = fVar234 * auVar125._16_4_;
  auVar32._0_16_ = auVar207;
  auVar32._20_4_ = fVar235 * auVar125._20_4_;
  auVar32._24_4_ = fVar236 * auVar125._24_4_;
  auVar32._28_4_ = auVar366._28_4_ + auVar195._28_4_;
  auVar125 = vsubps_avx(auVar363,auVar126);
  auVar155._0_4_ = fVar237 * auVar125._0_4_;
  auVar155._4_4_ = fVar254 * auVar125._4_4_;
  auVar155._8_4_ = fVar255 * auVar125._8_4_;
  auVar155._12_4_ = fVar256 * auVar125._12_4_;
  auVar366._16_4_ = fVar257 * auVar125._16_4_;
  auVar366._0_16_ = auVar155;
  auVar366._20_4_ = fVar258 * auVar125._20_4_;
  auVar366._24_4_ = fVar259 * auVar125._24_4_;
  auVar366._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar381,auVar126);
  auVar238._0_4_ = fVar237 * auVar125._0_4_;
  auVar238._4_4_ = fVar254 * auVar125._4_4_;
  auVar238._8_4_ = fVar255 * auVar125._8_4_;
  auVar238._12_4_ = fVar256 * auVar125._12_4_;
  auVar195._16_4_ = fVar257 * auVar125._16_4_;
  auVar195._0_16_ = auVar238;
  auVar195._20_4_ = fVar258 * auVar125._20_4_;
  auVar195._24_4_ = fVar259 * auVar125._24_4_;
  auVar195._28_4_ = auVar31._28_4_ + auVar30._28_4_;
  auVar125 = vsubps_avx(auVar398,auVar192);
  auVar113._0_4_ = fVar260 * auVar125._0_4_;
  auVar113._4_4_ = fVar276 * auVar125._4_4_;
  auVar113._8_4_ = fVar278 * auVar125._8_4_;
  auVar113._12_4_ = fVar280 * auVar125._12_4_;
  auVar30._16_4_ = fVar282 * auVar125._16_4_;
  auVar30._0_16_ = auVar113;
  auVar30._20_4_ = fVar284 * auVar125._20_4_;
  auVar30._24_4_ = fVar286 * auVar125._24_4_;
  auVar30._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar415,auVar192);
  auVar184._0_4_ = fVar260 * auVar125._0_4_;
  auVar184._4_4_ = fVar276 * auVar125._4_4_;
  auVar184._8_4_ = fVar278 * auVar125._8_4_;
  auVar184._12_4_ = fVar280 * auVar125._12_4_;
  auVar44._16_4_ = fVar282 * auVar125._16_4_;
  auVar44._0_16_ = auVar184;
  auVar44._20_4_ = fVar284 * auVar125._20_4_;
  auVar44._24_4_ = fVar286 * auVar125._24_4_;
  auVar44._28_4_ = auVar125._28_4_;
  auVar157 = vpminsd_avx(auVar353._16_16_,auVar32._16_16_);
  auVar33 = vpminsd_avx(auVar292,auVar207);
  auVar352._16_16_ = auVar157;
  auVar352._0_16_ = auVar33;
  auVar157 = vpminsd_avx(auVar366._16_16_,auVar195._16_16_);
  auVar33 = vpminsd_avx(auVar155,auVar238);
  auVar399._16_16_ = auVar157;
  auVar399._0_16_ = auVar33;
  auVar125 = vmaxps_avx(auVar352,auVar399);
  auVar157 = vpminsd_avx(auVar30._16_16_,auVar44._16_16_);
  auVar33 = vpminsd_avx(auVar113,auVar184);
  auVar426._16_16_ = auVar157;
  auVar426._0_16_ = auVar33;
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar439._4_4_ = uVar9;
  auVar439._0_4_ = uVar9;
  auVar439._8_4_ = uVar9;
  auVar439._12_4_ = uVar9;
  auVar439._16_4_ = uVar9;
  auVar439._20_4_ = uVar9;
  auVar439._24_4_ = uVar9;
  auVar439._28_4_ = uVar9;
  auVar180 = vmaxps_avx(auVar426,auVar439);
  auVar125 = vmaxps_avx(auVar125,auVar180);
  local_320._4_4_ = auVar125._4_4_ * 0.99999964;
  local_320._0_4_ = auVar125._0_4_ * 0.99999964;
  local_320._8_4_ = auVar125._8_4_ * 0.99999964;
  local_320._12_4_ = auVar125._12_4_ * 0.99999964;
  local_320._16_4_ = auVar125._16_4_ * 0.99999964;
  local_320._20_4_ = auVar125._20_4_ * 0.99999964;
  local_320._24_4_ = auVar125._24_4_ * 0.99999964;
  local_320._28_4_ = auVar125._28_4_;
  auVar157 = vpmaxsd_avx(auVar353._16_16_,auVar32._16_16_);
  auVar33 = vpmaxsd_avx(auVar292,auVar207);
  auVar225._16_16_ = auVar157;
  auVar225._0_16_ = auVar33;
  auVar157 = vpmaxsd_avx(auVar366._16_16_,auVar195._16_16_);
  auVar33 = vpmaxsd_avx(auVar155,auVar238);
  auVar170._16_16_ = auVar157;
  auVar170._0_16_ = auVar33;
  auVar125 = vminps_avx(auVar225,auVar170);
  auVar157 = vpmaxsd_avx(auVar30._16_16_,auVar44._16_16_);
  auVar33 = vpmaxsd_avx(auVar113,auVar184);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar193._4_4_ = uVar9;
  auVar193._0_4_ = uVar9;
  auVar193._8_4_ = uVar9;
  auVar193._12_4_ = uVar9;
  auVar193._16_4_ = uVar9;
  auVar193._20_4_ = uVar9;
  auVar193._24_4_ = uVar9;
  auVar193._28_4_ = uVar9;
  auVar127._16_16_ = auVar157;
  auVar127._0_16_ = auVar33;
  auVar180 = vminps_avx(auVar127,auVar193);
  auVar125 = vminps_avx(auVar125,auVar180);
  auVar45._4_4_ = auVar125._4_4_ * 1.0000004;
  auVar45._0_4_ = auVar125._0_4_ * 1.0000004;
  auVar45._8_4_ = auVar125._8_4_ * 1.0000004;
  auVar45._12_4_ = auVar125._12_4_ * 1.0000004;
  auVar45._16_4_ = auVar125._16_4_ * 1.0000004;
  auVar45._20_4_ = auVar125._20_4_ * 1.0000004;
  auVar45._24_4_ = auVar125._24_4_ * 1.0000004;
  auVar45._28_4_ = auVar125._28_4_;
  auVar125 = vcmpps_avx(local_320,auVar45,2);
  auVar157 = vpshufd_avx(ZEXT116((byte)PVar23),0);
  auVar171._16_16_ = auVar157;
  auVar171._0_16_ = auVar157;
  auVar180 = vcvtdq2ps_avx(auVar171);
  auVar180 = vcmpps_avx(_DAT_01faff40,auVar180,1);
  auVar125 = vandps_avx(auVar125,auVar180);
  uVar98 = vmovmskps_avx(auVar125);
  if (uVar98 == 0) {
    return;
  }
  uVar98 = uVar98 & 0xff;
  auVar128._16_16_ = mm_lookupmask_ps._240_16_;
  auVar128._0_16_ = mm_lookupmask_ps._240_16_;
  local_420 = vblendps_avx(auVar128,ZEXT832(0) << 0x20,0x80);
  uVar104 = 1 << ((byte)k & 0x1f);
  local_9c8 = &local_520;
  local_9d0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar104 & 0xf) << 4));
  local_9d8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar104 >> 4) * 0x10);
  local_8a8 = prim;
LAB_01178eaf:
  lVar106 = 0;
  if (uVar98 != 0) {
    for (; (uVar98 >> lVar106 & 1) == 0; lVar106 = lVar106 + 1) {
    }
  }
  uVar104 = *(uint *)(local_8a8 + 2);
  local_920 = (ulong)*(uint *)(local_8a8 + lVar106 * 4 + 6);
  pGVar24 = (context->scene->geometries).items[uVar104].ptr;
  uVar109 = (ulong)*(uint *)(*(long *)&pGVar24->field_0x58 +
                            local_920 *
                            pGVar24[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar206 = (pGVar24->time_range).lower;
  fVar206 = pGVar24->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar206) / ((pGVar24->time_range).upper - fVar206));
  auVar157 = vroundss_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),9);
  auVar157 = vminss_avx(auVar157,ZEXT416((uint)(pGVar24->fnumTimeSegments + -1.0)));
  auVar157 = vmaxss_avx(ZEXT816(0) << 0x20,auVar157);
  fVar206 = fVar206 - auVar157._0_4_;
  _Var25 = pGVar24[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar105 = (long)(int)auVar157._0_4_ * 0x38;
  lVar107 = *(long *)(_Var25 + 0x10 + lVar105);
  lVar26 = *(long *)(_Var25 + 0x38 + lVar105);
  lVar27 = *(long *)(_Var25 + 0x48 + lVar105);
  auVar157 = vshufps_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),0);
  pfVar2 = (float *)(lVar26 + lVar27 * uVar109);
  fVar111 = auVar157._0_4_;
  fVar234 = auVar157._4_4_;
  fVar235 = auVar157._8_4_;
  fVar236 = auVar157._12_4_;
  lVar1 = uVar109 + 1;
  pfVar3 = (float *)(lVar26 + lVar27 * lVar1);
  p_Var28 = pGVar24[4].occlusionFilterN;
  auVar157 = vshufps_avx(ZEXT416((uint)(1.0 - fVar206)),ZEXT416((uint)(1.0 - fVar206)),0);
  pfVar4 = (float *)(*(long *)(_Var25 + lVar105) + lVar107 * uVar109);
  fVar112 = auVar157._0_4_;
  fVar205 = auVar157._4_4_;
  fVar232 = auVar157._8_4_;
  fVar233 = auVar157._12_4_;
  pfVar5 = (float *)(*(long *)(_Var25 + lVar105) + lVar107 * lVar1);
  pfVar6 = (float *)(*(long *)(p_Var28 + lVar105 + 0x38) +
                    uVar109 * *(long *)(p_Var28 + lVar105 + 0x48));
  pfVar7 = (float *)(*(long *)(p_Var28 + lVar105 + 0x38) +
                    *(long *)(p_Var28 + lVar105 + 0x48) * lVar1);
  pfVar8 = (float *)(*(long *)(p_Var28 + lVar105) + *(long *)(p_Var28 + lVar105 + 0x10) * uVar109);
  auVar156._0_4_ = fVar112 * *pfVar4 + fVar111 * *pfVar2;
  auVar156._4_4_ = fVar205 * pfVar4[1] + fVar234 * pfVar2[1];
  auVar156._8_4_ = fVar232 * pfVar4[2] + fVar235 * pfVar2[2];
  auVar156._12_4_ = fVar233 * pfVar4[3] + fVar236 * pfVar2[3];
  pfVar2 = (float *)(*(long *)(p_Var28 + lVar105) + *(long *)(p_Var28 + lVar105 + 0x10) * lVar1);
  auVar185._0_4_ = fVar112 * *pfVar5 + fVar111 * *pfVar3;
  auVar185._4_4_ = fVar205 * pfVar5[1] + fVar234 * pfVar3[1];
  auVar185._8_4_ = fVar232 * pfVar5[2] + fVar235 * pfVar3[2];
  auVar185._12_4_ = fVar233 * pfVar5[3] + fVar236 * pfVar3[3];
  auVar157 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar33 = vinsertps_avx(auVar157,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar206 = *(float *)(ray + k * 4 + 0x80);
  auVar377._4_4_ = fVar206;
  auVar377._0_4_ = fVar206;
  auVar377._8_4_ = fVar206;
  auVar377._12_4_ = fVar206;
  fStack_810 = fVar206;
  _local_820 = auVar377;
  fStack_80c = fVar206;
  fStack_808 = fVar206;
  fStack_804 = fVar206;
  fVar288 = *(float *)(ray + k * 4 + 0xa0);
  auVar411._4_4_ = fVar288;
  auVar411._0_4_ = fVar288;
  auVar411._8_4_ = fVar288;
  auVar411._12_4_ = fVar288;
  fStack_830 = fVar288;
  _local_840 = auVar411;
  fStack_82c = fVar288;
  fStack_828 = fVar288;
  fStack_824 = fVar288;
  auVar157 = vunpcklps_avx(auVar377,auVar411);
  fVar231 = *(float *)(ray + k * 4 + 0xc0);
  auVar438._4_4_ = fVar231;
  auVar438._0_4_ = fVar231;
  auVar438._8_4_ = fVar231;
  auVar438._12_4_ = fVar231;
  fStack_7d0 = fVar231;
  _local_7e0 = auVar438;
  fStack_7cc = fVar231;
  fStack_7c8 = fVar231;
  fStack_7c4 = fVar231;
  _local_970 = vinsertps_avx(auVar157,auVar438,0x28);
  auVar239._0_4_ = auVar156._0_4_ + (fVar112 * *pfVar8 + fVar111 * *pfVar6) * 0.33333334;
  auVar239._4_4_ = auVar156._4_4_ + (fVar205 * pfVar8[1] + fVar234 * pfVar6[1]) * 0.33333334;
  auVar239._8_4_ = auVar156._8_4_ + (fVar232 * pfVar8[2] + fVar235 * pfVar6[2]) * 0.33333334;
  auVar239._12_4_ = auVar156._12_4_ + (fVar233 * pfVar8[3] + fVar236 * pfVar6[3]) * 0.33333334;
  auVar114._0_4_ = (fVar112 * *pfVar2 + fVar111 * *pfVar7) * 0.33333334;
  auVar114._4_4_ = (fVar205 * pfVar2[1] + fVar234 * pfVar7[1]) * 0.33333334;
  auVar114._8_4_ = (fVar232 * pfVar2[2] + fVar235 * pfVar7[2]) * 0.33333334;
  auVar114._12_4_ = (fVar233 * pfVar2[3] + fVar236 * pfVar7[3]) * 0.33333334;
  auVar11 = vsubps_avx(auVar185,auVar114);
  auVar115._0_4_ = (auVar185._0_4_ + auVar156._0_4_ + auVar239._0_4_ + auVar11._0_4_) * 0.25;
  auVar115._4_4_ = (auVar185._4_4_ + auVar156._4_4_ + auVar239._4_4_ + auVar11._4_4_) * 0.25;
  auVar115._8_4_ = (auVar185._8_4_ + auVar156._8_4_ + auVar239._8_4_ + auVar11._8_4_) * 0.25;
  auVar115._12_4_ = (auVar185._12_4_ + auVar156._12_4_ + auVar239._12_4_ + auVar11._12_4_) * 0.25;
  auVar157 = vsubps_avx(auVar115,auVar33);
  auVar157 = vdpps_avx(auVar157,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar42 = vrcpss_avx(local_980,local_980);
  fVar112 = auVar157._0_4_ * auVar42._0_4_ * (2.0 - local_980._0_4_ * auVar42._0_4_);
  auVar42 = vshufps_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),0);
  auVar208._0_4_ = auVar33._0_4_ + local_970._0_4_ * auVar42._0_4_;
  auVar208._4_4_ = auVar33._4_4_ + local_970._4_4_ * auVar42._4_4_;
  auVar208._8_4_ = auVar33._8_4_ + local_970._8_4_ * auVar42._8_4_;
  auVar208._12_4_ = auVar33._12_4_ + local_970._12_4_ * auVar42._12_4_;
  auVar157 = vblendps_avx(auVar208,_DAT_01f7aa10,8);
  _local_ae0 = vsubps_avx(auVar156,auVar157);
  _local_af0 = vsubps_avx(auVar11,auVar157);
  _local_b00 = vsubps_avx(auVar239,auVar157);
  _local_b10 = vsubps_avx(auVar185,auVar157);
  auVar33 = vshufps_avx(_local_ae0,_local_ae0,0);
  auVar157 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  local_a00._16_16_ = auVar157;
  local_a00._0_16_ = auVar157;
  auVar358 = ZEXT3264(local_a00);
  auVar157 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  local_a20._16_16_ = auVar157;
  local_a20._0_16_ = auVar157;
  auVar402 = ZEXT3264(local_a20);
  auVar11 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  auVar157 = vshufps_avx(_local_b00,_local_b00,0);
  auVar296._16_16_ = auVar157;
  auVar296._0_16_ = auVar157;
  auVar43 = vshufps_avx(_local_b00,_local_b00,0x55);
  auVar157 = vshufps_avx(_local_b00,_local_b00,0xaa);
  local_a40._16_16_ = auVar157;
  local_a40._0_16_ = auVar157;
  auVar449 = ZEXT3264(local_a40);
  auVar157 = vshufps_avx(_local_b00,_local_b00,0xff);
  local_a60._16_16_ = auVar157;
  local_a60._0_16_ = auVar157;
  auVar157 = vshufps_avx(_local_af0,_local_af0,0);
  local_2c0._16_16_ = auVar157;
  local_2c0._0_16_ = auVar157;
  auVar157 = vshufps_avx(_local_af0,_local_af0,0x55);
  local_2e0._16_16_ = auVar157;
  local_2e0._0_16_ = auVar157;
  auVar157 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar157;
  _local_1e0 = auVar157;
  auVar157 = vshufps_avx(_local_af0,_local_af0,0xff);
  auVar305 = ZEXT3264(local_a60);
  register0x00001290 = auVar157;
  _local_200 = auVar157;
  auVar157 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001290 = auVar157;
  _local_220 = auVar157;
  auVar157 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001290 = auVar157;
  _local_240 = auVar157;
  auVar157 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar157;
  _local_260 = auVar157;
  auVar157 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar157;
  _local_280 = auVar157;
  auVar157 = ZEXT416((uint)(fVar206 * fVar206 + fVar288 * fVar288 + fVar231 * fVar231));
  auVar157 = vshufps_avx(auVar157,auVar157,0);
  local_2a0._16_16_ = auVar157;
  local_2a0._0_16_ = auVar157;
  fVar206 = *(float *)(ray + k * 4 + 0x60);
  local_8c0 = ZEXT416((uint)fVar112);
  auVar157 = vshufps_avx(ZEXT416((uint)(fVar206 - fVar112)),ZEXT416((uint)(fVar206 - fVar112)),0);
  local_300._16_16_ = auVar157;
  local_300._0_16_ = auVar157;
  auVar157 = vpshufd_avx(ZEXT416(uVar104),0);
  local_480._16_16_ = auVar157;
  local_480._0_16_ = auVar157;
  auVar157 = vpshufd_avx(ZEXT416(*(uint *)(local_8a8 + lVar106 * 4 + 6)),0);
  local_4a0._16_16_ = auVar157;
  local_4a0._0_16_ = auVar157;
  local_cc0 = auVar42._0_8_;
  uStack_cb8 = auVar42._8_8_;
  local_900 = local_cc0;
  uStack_8f8 = uStack_cb8;
  uStack_8f0 = local_cc0;
  uStack_8e8 = uStack_cb8;
  uVar109 = 0;
  local_cc8 = 1;
  auVar129._8_4_ = 0x7fffffff;
  auVar129._0_8_ = 0x7fffffff7fffffff;
  auVar129._12_4_ = 0x7fffffff;
  auVar129._16_4_ = 0x7fffffff;
  auVar129._20_4_ = 0x7fffffff;
  auVar129._24_4_ = 0x7fffffff;
  auVar129._28_4_ = 0x7fffffff;
  local_460 = vandps_avx(local_2a0,auVar129);
  auVar157 = vsqrtss_avx(local_980,local_980);
  auVar42 = vsqrtss_avx(local_980,local_980);
  local_610 = ZEXT816(0x3f80000000000000);
  local_440 = auVar296;
  do {
    auVar226._8_4_ = 0x3f800000;
    auVar226._0_8_ = 0x3f8000003f800000;
    auVar226._12_4_ = 0x3f800000;
    auVar226._16_4_ = 0x3f800000;
    auVar226._20_4_ = 0x3f800000;
    iVar108 = (int)uVar109;
    auVar226._24_4_ = 0x3f800000;
    auVar226._28_4_ = 0x3f800000;
    auVar263 = vmovshdup_avx(local_610);
    auVar118 = vsubps_avx(auVar263,local_610);
    auVar263 = vshufps_avx(local_610,local_610,0);
    local_780._16_16_ = auVar263;
    local_780._0_16_ = auVar263;
    auVar158 = vshufps_avx(auVar118,auVar118,0);
    local_7a0._16_16_ = auVar158;
    local_7a0._0_16_ = auVar158;
    fVar153 = auVar158._0_4_;
    fVar181 = auVar158._4_4_;
    fVar182 = auVar158._8_4_;
    fVar183 = auVar158._12_4_;
    fVar110 = auVar263._0_4_;
    auVar172._0_4_ = fVar110 + fVar153 * 0.0;
    fVar144 = auVar263._4_4_;
    auVar172._4_4_ = fVar144 + fVar181 * 0.14285715;
    fVar146 = auVar263._8_4_;
    auVar172._8_4_ = fVar146 + fVar182 * 0.2857143;
    fVar148 = auVar263._12_4_;
    auVar172._12_4_ = fVar148 + fVar183 * 0.42857146;
    auVar172._16_4_ = fVar110 + fVar153 * 0.5714286;
    auVar172._20_4_ = fVar144 + fVar181 * 0.71428573;
    auVar172._24_4_ = fVar146 + fVar182 * 0.8571429;
    auVar172._28_4_ = fVar148 + fVar183;
    auVar125 = vsubps_avx(auVar226,auVar172);
    fVar235 = auVar43._0_4_;
    fVar444 = auVar43._4_4_;
    fVar445 = auVar43._8_4_;
    fVar234 = auVar296._28_4_;
    fVar288 = auVar125._0_4_;
    fVar231 = auVar125._4_4_;
    fVar112 = auVar125._8_4_;
    fVar205 = auVar125._12_4_;
    fVar232 = auVar125._16_4_;
    fVar233 = auVar125._20_4_;
    fVar111 = auVar125._24_4_;
    fVar418 = auVar11._12_4_;
    fVar259 = auVar305._28_4_ + fVar234 + auVar33._12_4_ + 1.0 + 1.0;
    fVar289 = local_2c0._0_4_ * auVar172._0_4_ + auVar296._0_4_ * fVar288;
    fVar306 = local_2c0._4_4_ * auVar172._4_4_ + auVar296._4_4_ * fVar231;
    fVar309 = local_2c0._8_4_ * auVar172._8_4_ + auVar296._8_4_ * fVar112;
    fVar312 = local_2c0._12_4_ * auVar172._12_4_ + auVar296._12_4_ * fVar205;
    fVar315 = local_2c0._16_4_ * auVar172._16_4_ + auVar296._16_4_ * fVar232;
    fVar318 = local_2c0._20_4_ * auVar172._20_4_ + auVar296._20_4_ * fVar233;
    fVar321 = local_2c0._24_4_ * auVar172._24_4_ + auVar296._24_4_ * fVar111;
    fVar236 = local_2e0._0_4_ * auVar172._0_4_ + fVar235 * fVar288;
    fVar237 = local_2e0._4_4_ * auVar172._4_4_ + fVar444 * fVar231;
    fVar254 = local_2e0._8_4_ * auVar172._8_4_ + fVar445 * fVar112;
    fVar255 = local_2e0._12_4_ * auVar172._12_4_ + auVar43._12_4_ * fVar205;
    fVar256 = local_2e0._16_4_ * auVar172._16_4_ + fVar235 * fVar232;
    fVar257 = local_2e0._20_4_ * auVar172._20_4_ + fVar444 * fVar233;
    fVar258 = local_2e0._24_4_ * auVar172._24_4_ + fVar445 * fVar111;
    fVar260 = (float)local_1e0._0_4_ * auVar172._0_4_ + auVar449._0_4_ * fVar288;
    fVar276 = (float)local_1e0._4_4_ * auVar172._4_4_ + auVar449._4_4_ * fVar231;
    fVar278 = fStack_1d8 * auVar172._8_4_ + auVar449._8_4_ * fVar112;
    fVar280 = fStack_1d4 * auVar172._12_4_ + auVar449._12_4_ * fVar205;
    fVar282 = fStack_1d0 * auVar172._16_4_ + auVar449._16_4_ * fVar232;
    fVar284 = fStack_1cc * auVar172._20_4_ + auVar449._20_4_ * fVar233;
    fVar286 = fStack_1c8 * auVar172._24_4_ + auVar449._24_4_ * fVar111;
    fVar261 = (float)local_200._0_4_ * auVar172._0_4_ + auVar305._0_4_ * fVar288;
    fVar277 = (float)local_200._4_4_ * auVar172._4_4_ + auVar305._4_4_ * fVar231;
    fVar279 = fStack_1f8 * auVar172._8_4_ + auVar305._8_4_ * fVar112;
    fVar281 = fStack_1f4 * auVar172._12_4_ + auVar305._12_4_ * fVar205;
    fVar283 = fStack_1f0 * auVar172._16_4_ + auVar305._16_4_ * fVar232;
    fVar285 = fStack_1ec * auVar172._20_4_ + auVar305._20_4_ * fVar233;
    fVar287 = fStack_1e8 * auVar172._24_4_ + auVar305._24_4_ * fVar111;
    fVar409 = auVar402._28_4_;
    fVar423 = fVar418 + fVar409;
    auVar364._0_4_ =
         fVar288 * (auVar296._0_4_ * auVar172._0_4_ + auVar33._0_4_ * fVar288) +
         auVar172._0_4_ * fVar289;
    auVar364._4_4_ =
         fVar231 * (auVar296._4_4_ * auVar172._4_4_ + auVar33._4_4_ * fVar231) +
         auVar172._4_4_ * fVar306;
    auVar364._8_4_ =
         fVar112 * (auVar296._8_4_ * auVar172._8_4_ + auVar33._8_4_ * fVar112) +
         auVar172._8_4_ * fVar309;
    auVar364._12_4_ =
         fVar205 * (auVar296._12_4_ * auVar172._12_4_ + auVar33._12_4_ * fVar205) +
         auVar172._12_4_ * fVar312;
    auVar364._16_4_ =
         fVar232 * (auVar296._16_4_ * auVar172._16_4_ + auVar33._0_4_ * fVar232) +
         auVar172._16_4_ * fVar315;
    auVar364._20_4_ =
         fVar233 * (auVar296._20_4_ * auVar172._20_4_ + auVar33._4_4_ * fVar233) +
         auVar172._20_4_ * fVar318;
    auVar364._24_4_ =
         fVar111 * (auVar296._24_4_ * auVar172._24_4_ + auVar33._8_4_ * fVar111) +
         auVar172._24_4_ * fVar321;
    auVar364._28_4_ = local_2e0._28_4_ + fVar409;
    auVar382._0_4_ =
         fVar288 * (fVar235 * auVar172._0_4_ + auVar358._0_4_ * fVar288) + auVar172._0_4_ * fVar236;
    auVar382._4_4_ =
         fVar231 * (fVar444 * auVar172._4_4_ + auVar358._4_4_ * fVar231) + auVar172._4_4_ * fVar237;
    auVar382._8_4_ =
         fVar112 * (fVar445 * auVar172._8_4_ + auVar358._8_4_ * fVar112) + auVar172._8_4_ * fVar254;
    auVar382._12_4_ =
         fVar205 * (auVar43._12_4_ * auVar172._12_4_ + auVar358._12_4_ * fVar205) +
         auVar172._12_4_ * fVar255;
    auVar382._16_4_ =
         fVar232 * (fVar235 * auVar172._16_4_ + auVar358._16_4_ * fVar232) +
         auVar172._16_4_ * fVar256;
    auVar382._20_4_ =
         fVar233 * (fVar444 * auVar172._20_4_ + auVar358._20_4_ * fVar233) +
         auVar172._20_4_ * fVar257;
    auVar382._24_4_ =
         fVar111 * (fVar445 * auVar172._24_4_ + auVar358._24_4_ * fVar111) +
         auVar172._24_4_ * fVar258;
    auVar382._28_4_ = fStack_1c4 + fVar409;
    fVar235 = local_2c0._28_4_;
    auVar400._0_4_ =
         fVar288 * (auVar449._0_4_ * auVar172._0_4_ + auVar402._0_4_ * fVar288) +
         auVar172._0_4_ * fVar260;
    auVar400._4_4_ =
         fVar231 * (auVar449._4_4_ * auVar172._4_4_ + auVar402._4_4_ * fVar231) +
         auVar172._4_4_ * fVar276;
    auVar400._8_4_ =
         fVar112 * (auVar449._8_4_ * auVar172._8_4_ + auVar402._8_4_ * fVar112) +
         auVar172._8_4_ * fVar278;
    auVar400._12_4_ =
         fVar205 * (auVar449._12_4_ * auVar172._12_4_ + auVar402._12_4_ * fVar205) +
         auVar172._12_4_ * fVar280;
    auVar400._16_4_ =
         fVar232 * (auVar449._16_4_ * auVar172._16_4_ + auVar402._16_4_ * fVar232) +
         auVar172._16_4_ * fVar282;
    auVar400._20_4_ =
         fVar233 * (auVar449._20_4_ * auVar172._20_4_ + auVar402._20_4_ * fVar233) +
         auVar172._20_4_ * fVar284;
    auVar400._24_4_ =
         fVar111 * (auVar449._24_4_ * auVar172._24_4_ + auVar402._24_4_ * fVar111) +
         auVar172._24_4_ * fVar286;
    auVar400._28_4_ = fVar235 + fVar409;
    auVar330._0_4_ =
         auVar172._0_4_ * fVar261 +
         fVar288 * (auVar305._0_4_ * auVar172._0_4_ + auVar11._0_4_ * fVar288);
    auVar330._4_4_ =
         auVar172._4_4_ * fVar277 +
         fVar231 * (auVar305._4_4_ * auVar172._4_4_ + auVar11._4_4_ * fVar231);
    auVar330._8_4_ =
         auVar172._8_4_ * fVar279 +
         fVar112 * (auVar305._8_4_ * auVar172._8_4_ + auVar11._8_4_ * fVar112);
    auVar330._12_4_ =
         auVar172._12_4_ * fVar281 +
         fVar205 * (auVar305._12_4_ * auVar172._12_4_ + fVar418 * fVar205);
    auVar330._16_4_ =
         auVar172._16_4_ * fVar283 +
         fVar232 * (auVar305._16_4_ * auVar172._16_4_ + auVar11._0_4_ * fVar232);
    auVar330._20_4_ =
         auVar172._20_4_ * fVar285 +
         fVar233 * (auVar305._20_4_ * auVar172._20_4_ + auVar11._4_4_ * fVar233);
    auVar330._24_4_ =
         auVar172._24_4_ * fVar287 +
         fVar111 * (auVar305._24_4_ * auVar172._24_4_ + auVar11._8_4_ * fVar111);
    auVar330._28_4_ = fVar235 + fStack_1e4;
    auVar297._0_4_ =
         (auVar172._0_4_ * (float)local_220._0_4_ + local_2c0._0_4_ * fVar288) * auVar172._0_4_ +
         fVar288 * fVar289;
    auVar297._4_4_ =
         (auVar172._4_4_ * (float)local_220._4_4_ + local_2c0._4_4_ * fVar231) * auVar172._4_4_ +
         fVar231 * fVar306;
    auVar297._8_4_ =
         (auVar172._8_4_ * fStack_218 + local_2c0._8_4_ * fVar112) * auVar172._8_4_ +
         fVar112 * fVar309;
    auVar297._12_4_ =
         (auVar172._12_4_ * fStack_214 + local_2c0._12_4_ * fVar205) * auVar172._12_4_ +
         fVar205 * fVar312;
    auVar297._16_4_ =
         (auVar172._16_4_ * fStack_210 + local_2c0._16_4_ * fVar232) * auVar172._16_4_ +
         fVar232 * fVar315;
    auVar297._20_4_ =
         (auVar172._20_4_ * fStack_20c + local_2c0._20_4_ * fVar233) * auVar172._20_4_ +
         fVar233 * fVar318;
    auVar297._24_4_ =
         (auVar172._24_4_ * fStack_208 + local_2c0._24_4_ * fVar111) * auVar172._24_4_ +
         fVar111 * fVar321;
    auVar297._28_4_ = fVar235 + fVar259 + auVar305._28_4_;
    auVar227._0_4_ =
         (auVar172._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar288) * auVar172._0_4_ +
         fVar288 * fVar236;
    auVar227._4_4_ =
         (auVar172._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar231) * auVar172._4_4_ +
         fVar231 * fVar237;
    auVar227._8_4_ =
         (auVar172._8_4_ * fStack_238 + local_2e0._8_4_ * fVar112) * auVar172._8_4_ +
         fVar112 * fVar254;
    auVar227._12_4_ =
         (auVar172._12_4_ * fStack_234 + local_2e0._12_4_ * fVar205) * auVar172._12_4_ +
         fVar205 * fVar255;
    auVar227._16_4_ =
         (auVar172._16_4_ * fStack_230 + local_2e0._16_4_ * fVar232) * auVar172._16_4_ +
         fVar232 * fVar256;
    auVar227._20_4_ =
         (auVar172._20_4_ * fStack_22c + local_2e0._20_4_ * fVar233) * auVar172._20_4_ +
         fVar233 * fVar257;
    auVar227._24_4_ =
         (auVar172._24_4_ * fStack_228 + local_2e0._24_4_ * fVar111) * auVar172._24_4_ +
         fVar111 * fVar258;
    auVar227._28_4_ = fVar235 + fVar259 + 1.0;
    auVar249._0_4_ =
         (auVar172._0_4_ * (float)local_260._0_4_ + (float)local_1e0._0_4_ * fVar288) *
         auVar172._0_4_ + fVar288 * fVar260;
    auVar249._4_4_ =
         (auVar172._4_4_ * (float)local_260._4_4_ + (float)local_1e0._4_4_ * fVar231) *
         auVar172._4_4_ + fVar231 * fVar276;
    auVar249._8_4_ =
         (auVar172._8_4_ * fStack_258 + fStack_1d8 * fVar112) * auVar172._8_4_ + fVar112 * fVar278;
    auVar249._12_4_ =
         (auVar172._12_4_ * fStack_254 + fStack_1d4 * fVar205) * auVar172._12_4_ + fVar205 * fVar280
    ;
    auVar249._16_4_ =
         (auVar172._16_4_ * fStack_250 + fStack_1d0 * fVar232) * auVar172._16_4_ + fVar232 * fVar282
    ;
    auVar249._20_4_ =
         (auVar172._20_4_ * fStack_24c + fStack_1cc * fVar233) * auVar172._20_4_ + fVar233 * fVar284
    ;
    auVar249._24_4_ =
         (auVar172._24_4_ * fStack_248 + fStack_1c8 * fVar111) * auVar172._24_4_ + fVar111 * fVar286
    ;
    auVar249._28_4_ = fVar423 + fVar234 + 1.0;
    auVar269._0_4_ =
         (auVar172._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar288) *
         auVar172._0_4_ + fVar288 * fVar261;
    auVar269._4_4_ =
         (auVar172._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar231) *
         auVar172._4_4_ + fVar231 * fVar277;
    auVar269._8_4_ =
         (auVar172._8_4_ * fStack_278 + fStack_1f8 * fVar112) * auVar172._8_4_ + fVar112 * fVar279;
    auVar269._12_4_ =
         (auVar172._12_4_ * fStack_274 + fStack_1f4 * fVar205) * auVar172._12_4_ + fVar205 * fVar281
    ;
    auVar269._16_4_ =
         (auVar172._16_4_ * fStack_270 + fStack_1f0 * fVar232) * auVar172._16_4_ + fVar232 * fVar283
    ;
    auVar269._20_4_ =
         (auVar172._20_4_ * fStack_26c + fStack_1ec * fVar233) * auVar172._20_4_ + fVar233 * fVar285
    ;
    auVar269._24_4_ =
         (auVar172._24_4_ * fStack_268 + fStack_1e8 * fVar111) * auVar172._24_4_ + fVar111 * fVar287
    ;
    auVar269._28_4_ = fVar409 + fVar234 + fVar409 + fVar234;
    auVar427._0_4_ = auVar364._0_4_ * fVar288 + auVar172._0_4_ * auVar297._0_4_;
    auVar427._4_4_ = auVar364._4_4_ * fVar231 + auVar172._4_4_ * auVar297._4_4_;
    auVar427._8_4_ = auVar364._8_4_ * fVar112 + auVar172._8_4_ * auVar297._8_4_;
    auVar427._12_4_ = auVar364._12_4_ * fVar205 + auVar172._12_4_ * auVar297._12_4_;
    auVar427._16_4_ = auVar364._16_4_ * fVar232 + auVar172._16_4_ * auVar297._16_4_;
    auVar427._20_4_ = auVar364._20_4_ * fVar233 + auVar172._20_4_ * auVar297._20_4_;
    auVar427._24_4_ = auVar364._24_4_ * fVar111 + auVar172._24_4_ * auVar297._24_4_;
    auVar427._28_4_ = fVar409 + fVar234 + fVar235;
    auVar440._0_4_ = auVar382._0_4_ * fVar288 + auVar172._0_4_ * auVar227._0_4_;
    auVar440._4_4_ = auVar382._4_4_ * fVar231 + auVar172._4_4_ * auVar227._4_4_;
    auVar440._8_4_ = auVar382._8_4_ * fVar112 + auVar172._8_4_ * auVar227._8_4_;
    auVar440._12_4_ = auVar382._12_4_ * fVar205 + auVar172._12_4_ * auVar227._12_4_;
    auVar440._16_4_ = auVar382._16_4_ * fVar232 + auVar172._16_4_ * auVar227._16_4_;
    auVar440._20_4_ = auVar382._20_4_ * fVar233 + auVar172._20_4_ * auVar227._20_4_;
    auVar440._24_4_ = auVar382._24_4_ * fVar111 + auVar172._24_4_ * auVar227._24_4_;
    auVar440._28_4_ = fVar235 + fVar423;
    auVar446._0_4_ = auVar400._0_4_ * fVar288 + auVar172._0_4_ * auVar249._0_4_;
    auVar446._4_4_ = auVar400._4_4_ * fVar231 + auVar172._4_4_ * auVar249._4_4_;
    auVar446._8_4_ = auVar400._8_4_ * fVar112 + auVar172._8_4_ * auVar249._8_4_;
    auVar446._12_4_ = auVar400._12_4_ * fVar205 + auVar172._12_4_ * auVar249._12_4_;
    auVar446._16_4_ = auVar400._16_4_ * fVar232 + auVar172._16_4_ * auVar249._16_4_;
    auVar446._20_4_ = auVar400._20_4_ * fVar233 + auVar172._20_4_ * auVar249._20_4_;
    auVar446._24_4_ = auVar400._24_4_ * fVar111 + auVar172._24_4_ * auVar249._24_4_;
    auVar446._28_4_ = fVar423 + fVar235;
    local_c40 = auVar118._0_4_;
    local_7c0._0_4_ = fVar288 * auVar330._0_4_ + auVar172._0_4_ * auVar269._0_4_;
    local_7c0._4_4_ = fVar231 * auVar330._4_4_ + auVar172._4_4_ * auVar269._4_4_;
    local_7c0._8_4_ = fVar112 * auVar330._8_4_ + auVar172._8_4_ * auVar269._8_4_;
    local_7c0._12_4_ = fVar205 * auVar330._12_4_ + auVar172._12_4_ * auVar269._12_4_;
    local_7c0._16_4_ = fVar232 * auVar330._16_4_ + auVar172._16_4_ * auVar269._16_4_;
    local_7c0._20_4_ = fVar233 * auVar330._20_4_ + auVar172._20_4_ * auVar269._20_4_;
    local_7c0._24_4_ = fVar111 * auVar330._24_4_ + auVar172._24_4_ * auVar269._24_4_;
    local_7c0._28_4_ = auVar125._28_4_ + auVar172._28_4_;
    auVar125 = vsubps_avx(auVar297,auVar364);
    auVar180 = vsubps_avx(auVar227,auVar382);
    auVar30 = vsubps_avx(auVar249,auVar400);
    auVar366 = vsubps_avx(auVar269,auVar330);
    auVar263 = vshufps_avx(ZEXT416((uint)(local_c40 * 0.04761905)),
                           ZEXT416((uint)(local_c40 * 0.04761905)),0);
    fVar233 = auVar263._0_4_;
    fVar290 = fVar233 * auVar125._0_4_ * 3.0;
    fVar234 = auVar263._4_4_;
    fVar307 = fVar234 * auVar125._4_4_ * 3.0;
    local_aa0._4_4_ = fVar307;
    local_aa0._0_4_ = fVar290;
    fVar256 = auVar263._8_4_;
    fVar310 = fVar256 * auVar125._8_4_ * 3.0;
    fStack_a98 = fVar310;
    fVar278 = auVar263._12_4_;
    fVar313 = fVar278 * auVar125._12_4_ * 3.0;
    fStack_a94 = fVar313;
    fVar316 = fVar233 * auVar125._16_4_ * 3.0;
    unique0x1000bc24 = fVar316;
    fVar319 = fVar234 * auVar125._20_4_ * 3.0;
    unique0x1000bc28 = fVar319;
    fVar322 = fVar256 * auVar125._24_4_ * 3.0;
    unique0x1000bc2c = fVar322;
    unique0x1000bc30 = auVar297._28_4_;
    fVar324 = fVar233 * auVar180._0_4_ * 3.0;
    fVar334 = fVar234 * auVar180._4_4_ * 3.0;
    auVar46._4_4_ = fVar334;
    auVar46._0_4_ = fVar324;
    fVar335 = fVar256 * auVar180._8_4_ * 3.0;
    auVar46._8_4_ = fVar335;
    fVar337 = fVar278 * auVar180._12_4_ * 3.0;
    auVar46._12_4_ = fVar337;
    fVar339 = fVar233 * auVar180._16_4_ * 3.0;
    auVar46._16_4_ = fVar339;
    fVar341 = fVar234 * auVar180._20_4_ * 3.0;
    auVar46._20_4_ = fVar341;
    fVar343 = fVar256 * auVar180._24_4_ * 3.0;
    auVar46._24_4_ = fVar343;
    auVar46._28_4_ = auVar330._28_4_;
    fVar410 = fVar233 * auVar30._0_4_ * 3.0;
    fVar416 = fVar234 * auVar30._4_4_ * 3.0;
    auVar47._4_4_ = fVar416;
    auVar47._0_4_ = fVar410;
    fVar417 = fVar256 * auVar30._8_4_ * 3.0;
    auVar47._8_4_ = fVar417;
    fVar419 = fVar278 * auVar30._12_4_ * 3.0;
    auVar47._12_4_ = fVar419;
    fVar420 = fVar233 * auVar30._16_4_ * 3.0;
    auVar47._16_4_ = fVar420;
    fVar421 = fVar234 * auVar30._20_4_ * 3.0;
    auVar47._20_4_ = fVar421;
    fVar422 = fVar256 * auVar30._24_4_ * 3.0;
    auVar47._24_4_ = fVar422;
    auVar47._28_4_ = fVar423;
    fVar111 = fVar233 * auVar366._0_4_ * 3.0;
    fVar255 = fVar234 * auVar366._4_4_ * 3.0;
    auVar48._4_4_ = fVar255;
    auVar48._0_4_ = fVar111;
    fVar257 = fVar256 * auVar366._8_4_ * 3.0;
    auVar48._8_4_ = fVar257;
    fVar280 = fVar278 * auVar366._12_4_ * 3.0;
    auVar48._12_4_ = fVar280;
    fVar233 = fVar233 * auVar366._16_4_ * 3.0;
    auVar48._16_4_ = fVar233;
    fVar234 = fVar234 * auVar366._20_4_ * 3.0;
    auVar48._20_4_ = fVar234;
    fVar256 = fVar256 * auVar366._24_4_ * 3.0;
    auVar48._24_4_ = fVar256;
    auVar48._28_4_ = fVar278;
    auVar125 = vperm2f128_avx(auVar440,auVar440,1);
    auVar125 = vshufps_avx(auVar125,auVar440,0x30);
    auVar366 = vshufps_avx(auVar440,auVar125,0x29);
    auVar125 = vperm2f128_avx(auVar446,auVar446,1);
    auVar125 = vshufps_avx(auVar125,auVar446,0x30);
    local_a80 = vshufps_avx(auVar446,auVar125,0x29);
    auVar180 = vsubps_avx(local_7c0,auVar48);
    auVar125 = vperm2f128_avx(auVar180,auVar180,1);
    auVar125 = vshufps_avx(auVar125,auVar180,0x30);
    auVar31 = vshufps_avx(auVar180,auVar125,0x29);
    auVar32 = vsubps_avx(auVar366,auVar440);
    auVar30 = vsubps_avx(local_a80,auVar446);
    fVar231 = auVar32._0_4_;
    fVar235 = auVar32._4_4_;
    auVar49._4_4_ = fVar416 * fVar235;
    auVar49._0_4_ = fVar410 * fVar231;
    fVar258 = auVar32._8_4_;
    auVar49._8_4_ = fVar417 * fVar258;
    fVar284 = auVar32._12_4_;
    auVar49._12_4_ = fVar419 * fVar284;
    fVar285 = auVar32._16_4_;
    auVar49._16_4_ = fVar420 * fVar285;
    fVar318 = auVar32._20_4_;
    auVar49._20_4_ = fVar421 * fVar318;
    fVar35 = auVar32._24_4_;
    auVar49._24_4_ = fVar422 * fVar35;
    auVar49._28_4_ = auVar180._28_4_;
    fVar394 = auVar30._0_4_;
    fVar403 = auVar30._4_4_;
    auVar50._4_4_ = fVar403 * fVar334;
    auVar50._0_4_ = fVar394 * fVar324;
    fVar404 = auVar30._8_4_;
    auVar50._8_4_ = fVar404 * fVar335;
    fVar405 = auVar30._12_4_;
    auVar50._12_4_ = fVar405 * fVar337;
    fVar406 = auVar30._16_4_;
    auVar50._16_4_ = fVar406 * fVar339;
    fVar407 = auVar30._20_4_;
    auVar50._20_4_ = fVar407 * fVar341;
    fVar408 = auVar30._24_4_;
    auVar50._24_4_ = fVar408 * fVar343;
    auVar50._28_4_ = auVar125._28_4_;
    auVar431 = vsubps_avx(auVar50,auVar49);
    auVar125 = vperm2f128_avx(auVar427,auVar427,1);
    auVar125 = vshufps_avx(auVar125,auVar427,0x30);
    auVar195 = vshufps_avx(auVar427,auVar125,0x29);
    auVar44 = vsubps_avx(auVar195,auVar427);
    auVar51._4_4_ = fVar403 * fVar307;
    auVar51._0_4_ = fVar394 * fVar290;
    auVar51._8_4_ = fVar404 * fVar310;
    auVar51._12_4_ = fVar405 * fVar313;
    auVar51._16_4_ = fVar406 * fVar316;
    auVar51._20_4_ = fVar407 * fVar319;
    auVar51._24_4_ = fVar408 * fVar322;
    auVar51._28_4_ = auVar195._28_4_;
    fVar112 = auVar44._0_4_;
    fVar236 = auVar44._4_4_;
    auVar52._4_4_ = fVar416 * fVar236;
    auVar52._0_4_ = fVar410 * fVar112;
    fVar259 = auVar44._8_4_;
    auVar52._8_4_ = fVar417 * fVar259;
    fVar286 = auVar44._12_4_;
    auVar52._12_4_ = fVar419 * fVar286;
    fVar287 = auVar44._16_4_;
    auVar52._16_4_ = fVar420 * fVar287;
    fVar321 = auVar44._20_4_;
    auVar52._20_4_ = fVar421 * fVar321;
    fVar36 = auVar44._24_4_;
    auVar52._24_4_ = fVar422 * fVar36;
    auVar52._28_4_ = local_a80._28_4_;
    auVar353 = vsubps_avx(auVar52,auVar51);
    auVar53._4_4_ = fVar236 * fVar334;
    auVar53._0_4_ = fVar112 * fVar324;
    auVar53._8_4_ = fVar259 * fVar335;
    auVar53._12_4_ = fVar286 * fVar337;
    auVar53._16_4_ = fVar287 * fVar339;
    auVar53._20_4_ = fVar321 * fVar341;
    auVar53._24_4_ = fVar36 * fVar343;
    auVar53._28_4_ = local_a80._28_4_;
    auVar54._4_4_ = fVar307 * fVar235;
    auVar54._0_4_ = fVar290 * fVar231;
    auVar54._8_4_ = fVar310 * fVar258;
    auVar54._12_4_ = fVar313 * fVar284;
    auVar54._16_4_ = fVar316 * fVar285;
    auVar54._20_4_ = fVar319 * fVar318;
    auVar54._24_4_ = fVar322 * fVar35;
    auVar54._28_4_ = auVar382._28_4_;
    auVar45 = vsubps_avx(auVar54,auVar53);
    fVar288 = auVar45._28_4_;
    auVar194._0_4_ = fVar112 * fVar112 + fVar231 * fVar231 + fVar394 * fVar394;
    auVar194._4_4_ = fVar236 * fVar236 + fVar235 * fVar235 + fVar403 * fVar403;
    auVar194._8_4_ = fVar259 * fVar259 + fVar258 * fVar258 + fVar404 * fVar404;
    auVar194._12_4_ = fVar286 * fVar286 + fVar284 * fVar284 + fVar405 * fVar405;
    auVar194._16_4_ = fVar287 * fVar287 + fVar285 * fVar285 + fVar406 * fVar406;
    auVar194._20_4_ = fVar321 * fVar321 + fVar318 * fVar318 + fVar407 * fVar407;
    auVar194._24_4_ = fVar36 * fVar36 + fVar35 * fVar35 + fVar408 * fVar408;
    auVar194._28_4_ = fVar288 + fVar288 + auVar431._28_4_;
    auVar125 = vrcpps_avx(auVar194);
    fVar282 = auVar125._0_4_;
    fVar279 = auVar125._4_4_;
    auVar55._4_4_ = fVar279 * auVar194._4_4_;
    auVar55._0_4_ = fVar282 * auVar194._0_4_;
    fVar281 = auVar125._8_4_;
    auVar55._8_4_ = fVar281 * auVar194._8_4_;
    fVar283 = auVar125._12_4_;
    auVar55._12_4_ = fVar283 * auVar194._12_4_;
    fVar309 = auVar125._16_4_;
    auVar55._16_4_ = fVar309 * auVar194._16_4_;
    fVar312 = auVar125._20_4_;
    auVar55._20_4_ = fVar312 * auVar194._20_4_;
    fVar315 = auVar125._24_4_;
    auVar55._24_4_ = fVar315 * auVar194._24_4_;
    auVar55._28_4_ = auVar382._28_4_;
    auVar428._8_4_ = 0x3f800000;
    auVar428._0_8_ = 0x3f8000003f800000;
    auVar428._12_4_ = 0x3f800000;
    auVar428._16_4_ = 0x3f800000;
    auVar428._20_4_ = 0x3f800000;
    auVar428._24_4_ = 0x3f800000;
    auVar428._28_4_ = 0x3f800000;
    auVar126 = vsubps_avx(auVar428,auVar55);
    fVar282 = auVar126._0_4_ * fVar282 + fVar282;
    fVar279 = auVar126._4_4_ * fVar279 + fVar279;
    fVar281 = auVar126._8_4_ * fVar281 + fVar281;
    fVar283 = auVar126._12_4_ * fVar283 + fVar283;
    fVar309 = auVar126._16_4_ * fVar309 + fVar309;
    fVar312 = auVar126._20_4_ * fVar312 + fVar312;
    fVar315 = auVar126._24_4_ * fVar315 + fVar315;
    auVar180 = vperm2f128_avx(auVar46,auVar46,1);
    auVar180 = vshufps_avx(auVar180,auVar46,0x30);
    auVar180 = vshufps_avx(auVar46,auVar180,0x29);
    auVar30 = vperm2f128_avx(auVar47,auVar47,1);
    auVar30 = vshufps_avx(auVar30,auVar47,0x30);
    local_760 = vshufps_avx(auVar47,auVar30,0x29);
    fVar424 = local_760._0_4_;
    fVar432 = local_760._4_4_;
    auVar56._4_4_ = fVar432 * fVar235;
    auVar56._0_4_ = fVar424 * fVar231;
    fVar433 = local_760._8_4_;
    auVar56._8_4_ = fVar433 * fVar258;
    fVar434 = local_760._12_4_;
    auVar56._12_4_ = fVar434 * fVar284;
    fVar435 = local_760._16_4_;
    auVar56._16_4_ = fVar435 * fVar285;
    fVar436 = local_760._20_4_;
    auVar56._20_4_ = fVar436 * fVar318;
    fVar437 = local_760._24_4_;
    auVar56._24_4_ = fVar437 * fVar35;
    auVar56._28_4_ = auVar30._28_4_;
    fVar205 = auVar180._0_4_;
    fVar237 = auVar180._4_4_;
    auVar57._4_4_ = fVar403 * fVar237;
    auVar57._0_4_ = fVar394 * fVar205;
    fVar260 = auVar180._8_4_;
    auVar57._8_4_ = fVar404 * fVar260;
    fVar261 = auVar180._12_4_;
    auVar57._12_4_ = fVar405 * fVar261;
    fVar289 = auVar180._16_4_;
    auVar57._16_4_ = fVar406 * fVar289;
    fVar409 = auVar180._20_4_;
    auVar57._20_4_ = fVar407 * fVar409;
    fVar37 = auVar180._24_4_;
    auVar57._24_4_ = fVar408 * fVar37;
    auVar57._28_4_ = fVar423;
    auVar30 = vsubps_avx(auVar57,auVar56);
    auVar180 = vperm2f128_avx(_local_aa0,_local_aa0,1);
    auVar180 = vshufps_avx(auVar180,_local_aa0,0x30);
    local_9a0 = vshufps_avx(_local_aa0,auVar180,0x29);
    fVar232 = local_9a0._0_4_;
    fVar254 = local_9a0._4_4_;
    auVar58._4_4_ = fVar403 * fVar254;
    auVar58._0_4_ = fVar394 * fVar232;
    fVar276 = local_9a0._8_4_;
    auVar58._8_4_ = fVar404 * fVar276;
    fVar277 = local_9a0._12_4_;
    auVar58._12_4_ = fVar405 * fVar277;
    fVar306 = local_9a0._16_4_;
    auVar58._16_4_ = fVar406 * fVar306;
    fVar423 = local_9a0._20_4_;
    auVar58._20_4_ = fVar407 * fVar423;
    fVar38 = local_9a0._24_4_;
    auVar58._24_4_ = fVar408 * fVar38;
    auVar58._28_4_ = auVar180._28_4_;
    auVar59._4_4_ = fVar432 * fVar236;
    auVar59._0_4_ = fVar424 * fVar112;
    auVar59._8_4_ = fVar433 * fVar259;
    auVar59._12_4_ = fVar434 * fVar286;
    auVar59._16_4_ = fVar435 * fVar287;
    auVar59._20_4_ = fVar436 * fVar321;
    uVar102 = local_760._28_4_;
    auVar59._24_4_ = fVar437 * fVar36;
    auVar59._28_4_ = uVar102;
    auVar180 = vsubps_avx(auVar59,auVar58);
    auVar60._4_4_ = fVar236 * fVar237;
    auVar60._0_4_ = fVar112 * fVar205;
    auVar60._8_4_ = fVar259 * fVar260;
    auVar60._12_4_ = fVar286 * fVar261;
    auVar60._16_4_ = fVar287 * fVar289;
    auVar60._20_4_ = fVar321 * fVar409;
    auVar60._24_4_ = fVar36 * fVar37;
    auVar60._28_4_ = uVar102;
    auVar61._4_4_ = fVar254 * fVar235;
    auVar61._0_4_ = fVar232 * fVar231;
    auVar61._8_4_ = fVar276 * fVar258;
    auVar61._12_4_ = fVar277 * fVar284;
    auVar61._16_4_ = fVar306 * fVar285;
    auVar61._20_4_ = fVar423 * fVar318;
    auVar61._24_4_ = fVar38 * fVar35;
    auVar61._28_4_ = auVar440._28_4_;
    auVar127 = vsubps_avx(auVar61,auVar60);
    auVar62._4_4_ =
         (auVar431._4_4_ * auVar431._4_4_ +
         auVar353._4_4_ * auVar353._4_4_ + auVar45._4_4_ * auVar45._4_4_) * fVar279;
    auVar62._0_4_ =
         (auVar431._0_4_ * auVar431._0_4_ +
         auVar353._0_4_ * auVar353._0_4_ + auVar45._0_4_ * auVar45._0_4_) * fVar282;
    auVar62._8_4_ =
         (auVar431._8_4_ * auVar431._8_4_ +
         auVar353._8_4_ * auVar353._8_4_ + auVar45._8_4_ * auVar45._8_4_) * fVar281;
    auVar62._12_4_ =
         (auVar431._12_4_ * auVar431._12_4_ +
         auVar353._12_4_ * auVar353._12_4_ + auVar45._12_4_ * auVar45._12_4_) * fVar283;
    auVar62._16_4_ =
         (auVar431._16_4_ * auVar431._16_4_ +
         auVar353._16_4_ * auVar353._16_4_ + auVar45._16_4_ * auVar45._16_4_) * fVar309;
    auVar62._20_4_ =
         (auVar431._20_4_ * auVar431._20_4_ +
         auVar353._20_4_ * auVar353._20_4_ + auVar45._20_4_ * auVar45._20_4_) * fVar312;
    auVar62._24_4_ =
         (auVar431._24_4_ * auVar431._24_4_ +
         auVar353._24_4_ * auVar353._24_4_ + auVar45._24_4_ * auVar45._24_4_) * fVar315;
    auVar62._28_4_ = auVar431._28_4_ + auVar353._28_4_ + fVar288;
    auVar63._4_4_ =
         (auVar30._4_4_ * auVar30._4_4_ +
         auVar180._4_4_ * auVar180._4_4_ + auVar127._4_4_ * auVar127._4_4_) * fVar279;
    auVar63._0_4_ =
         (auVar30._0_4_ * auVar30._0_4_ +
         auVar180._0_4_ * auVar180._0_4_ + auVar127._0_4_ * auVar127._0_4_) * fVar282;
    auVar63._8_4_ =
         (auVar30._8_4_ * auVar30._8_4_ +
         auVar180._8_4_ * auVar180._8_4_ + auVar127._8_4_ * auVar127._8_4_) * fVar281;
    auVar63._12_4_ =
         (auVar30._12_4_ * auVar30._12_4_ +
         auVar180._12_4_ * auVar180._12_4_ + auVar127._12_4_ * auVar127._12_4_) * fVar283;
    auVar63._16_4_ =
         (auVar30._16_4_ * auVar30._16_4_ +
         auVar180._16_4_ * auVar180._16_4_ + auVar127._16_4_ * auVar127._16_4_) * fVar309;
    auVar63._20_4_ =
         (auVar30._20_4_ * auVar30._20_4_ +
         auVar180._20_4_ * auVar180._20_4_ + auVar127._20_4_ * auVar127._20_4_) * fVar312;
    auVar63._24_4_ =
         (auVar30._24_4_ * auVar30._24_4_ +
         auVar180._24_4_ * auVar180._24_4_ + auVar127._24_4_ * auVar127._24_4_) * fVar315;
    auVar63._28_4_ = auVar126._28_4_ + auVar125._28_4_;
    auVar125 = vmaxps_avx(auVar62,auVar63);
    auVar180 = vperm2f128_avx(local_7c0,local_7c0,1);
    auVar180 = vshufps_avx(auVar180,local_7c0,0x30);
    auVar431 = vshufps_avx(local_7c0,auVar180,0x29);
    auVar130._0_4_ = (float)local_7c0._0_4_ + fVar111;
    auVar130._4_4_ = local_7c0._4_4_ + fVar255;
    auVar130._8_4_ = local_7c0._8_4_ + fVar257;
    auVar130._12_4_ = local_7c0._12_4_ + fVar280;
    auVar130._16_4_ = local_7c0._16_4_ + fVar233;
    auVar130._20_4_ = local_7c0._20_4_ + fVar234;
    auVar130._24_4_ = local_7c0._24_4_ + fVar256;
    auVar130._28_4_ = local_7c0._28_4_ + fVar278;
    auVar180 = vmaxps_avx(local_7c0,auVar130);
    auVar30 = vmaxps_avx(auVar31,auVar431);
    auVar180 = vmaxps_avx(auVar180,auVar30);
    auVar30 = vrsqrtps_avx(auVar194);
    fVar288 = auVar30._0_4_;
    fVar233 = auVar30._4_4_;
    fVar111 = auVar30._8_4_;
    fVar234 = auVar30._12_4_;
    fVar255 = auVar30._16_4_;
    fVar256 = auVar30._20_4_;
    fVar257 = auVar30._24_4_;
    local_4c0 = fVar288 * 1.5 + fVar288 * fVar288 * fVar288 * auVar194._0_4_ * -0.5;
    fStack_4bc = fVar233 * 1.5 + fVar233 * fVar233 * fVar233 * auVar194._4_4_ * -0.5;
    fStack_4b8 = fVar111 * 1.5 + fVar111 * fVar111 * fVar111 * auVar194._8_4_ * -0.5;
    fStack_4b4 = fVar234 * 1.5 + fVar234 * fVar234 * fVar234 * auVar194._12_4_ * -0.5;
    fStack_4b0 = fVar255 * 1.5 + fVar255 * fVar255 * fVar255 * auVar194._16_4_ * -0.5;
    fStack_4ac = fVar256 * 1.5 + fVar256 * fVar256 * fVar256 * auVar194._20_4_ * -0.5;
    fStack_4a8 = fVar257 * 1.5 + fVar257 * fVar257 * fVar257 * auVar194._24_4_ * -0.5;
    auVar353 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar45 = vsubps_avx(auVar353,auVar440);
    auVar126 = vsubps_avx(auVar353,auVar446);
    fVar233 = auVar126._0_4_;
    fVar255 = auVar126._4_4_;
    fVar278 = auVar126._8_4_;
    fVar279 = auVar126._12_4_;
    fVar309 = auVar126._16_4_;
    fVar444 = auVar126._20_4_;
    fVar39 = auVar126._24_4_;
    fVar111 = auVar45._0_4_;
    fVar256 = auVar45._4_4_;
    fVar280 = auVar45._8_4_;
    fVar281 = auVar45._12_4_;
    fVar312 = auVar45._16_4_;
    fVar445 = auVar45._20_4_;
    fVar40 = auVar45._24_4_;
    auVar171 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar169 = vsubps_avx(auVar171,auVar427);
    fVar234 = auVar169._0_4_;
    fVar257 = auVar169._4_4_;
    fVar282 = auVar169._8_4_;
    fVar283 = auVar169._12_4_;
    fVar315 = auVar169._16_4_;
    fVar34 = auVar169._20_4_;
    fVar41 = auVar169._24_4_;
    auVar429._0_4_ =
         (float)local_820._0_4_ * fVar234 +
         (float)local_840._0_4_ * fVar111 + (float)local_7e0._0_4_ * fVar233;
    auVar429._4_4_ =
         (float)local_820._4_4_ * fVar257 +
         (float)local_840._4_4_ * fVar256 + (float)local_7e0._4_4_ * fVar255;
    auVar429._8_4_ = fStack_818 * fVar282 + fStack_838 * fVar280 + fStack_7d8 * fVar278;
    auVar429._12_4_ = fStack_814 * fVar283 + fStack_834 * fVar281 + fStack_7d4 * fVar279;
    auVar429._16_4_ = fStack_810 * fVar315 + fStack_830 * fVar312 + fStack_7d0 * fVar309;
    auVar429._20_4_ = fStack_80c * fVar34 + fStack_82c * fVar445 + fStack_7cc * fVar444;
    auVar429._24_4_ = fStack_808 * fVar41 + fStack_828 * fVar40 + fStack_7c8 * fVar39;
    auVar429._28_4_ = auVar440._28_4_ + auVar127._28_4_ + 1.5;
    auVar441._0_4_ = fVar234 * fVar234 + fVar111 * fVar111 + fVar233 * fVar233;
    auVar441._4_4_ = fVar257 * fVar257 + fVar256 * fVar256 + fVar255 * fVar255;
    auVar441._8_4_ = fVar282 * fVar282 + fVar280 * fVar280 + fVar278 * fVar278;
    auVar441._12_4_ = fVar283 * fVar283 + fVar281 * fVar281 + fVar279 * fVar279;
    auVar441._16_4_ = fVar315 * fVar315 + fVar312 * fVar312 + fVar309 * fVar309;
    auVar441._20_4_ = fVar34 * fVar34 + fVar445 * fVar445 + fVar444 * fVar444;
    auVar441._24_4_ = fVar41 * fVar41 + fVar40 * fVar40 + fVar39 * fVar39;
    auVar441._28_4_ = auVar446._28_4_ + auVar446._28_4_ + auVar440._28_4_;
    fVar359 = (float)local_820._0_4_ * fVar112 * local_4c0 +
              local_4c0 * fVar231 * (float)local_840._0_4_ +
              fVar394 * local_4c0 * (float)local_7e0._0_4_;
    fVar367 = (float)local_820._4_4_ * fVar236 * fStack_4bc +
              fStack_4bc * fVar235 * (float)local_840._4_4_ +
              fVar403 * fStack_4bc * (float)local_7e0._4_4_;
    fVar368 = fStack_818 * fVar259 * fStack_4b8 +
              fStack_4b8 * fVar258 * fStack_838 + fVar404 * fStack_4b8 * fStack_7d8;
    fVar369 = fStack_814 * fVar286 * fStack_4b4 +
              fStack_4b4 * fVar284 * fStack_834 + fVar405 * fStack_4b4 * fStack_7d4;
    fVar370 = fStack_810 * fVar287 * fStack_4b0 +
              fStack_4b0 * fVar285 * fStack_830 + fVar406 * fStack_4b0 * fStack_7d0;
    fVar372 = fStack_80c * fVar321 * fStack_4ac +
              fStack_4ac * fVar318 * fStack_82c + fVar407 * fStack_4ac * fStack_7cc;
    fVar374 = fStack_808 * fVar36 * fStack_4a8 +
              fStack_4a8 * fVar35 * fStack_828 + fVar408 * fStack_4a8 * fStack_7c8;
    fVar288 = fStack_804 + fStack_824 + fStack_7c4;
    fVar376 = fVar234 * fVar112 * local_4c0 +
              local_4c0 * fVar231 * fVar111 + fVar394 * local_4c0 * fVar233;
    fVar387 = fVar257 * fVar236 * fStack_4bc +
              fStack_4bc * fVar235 * fVar256 + fVar403 * fStack_4bc * fVar255;
    fVar388 = fVar282 * fVar259 * fStack_4b8 +
              fStack_4b8 * fVar258 * fVar280 + fVar404 * fStack_4b8 * fVar278;
    fVar389 = fVar283 * fVar286 * fStack_4b4 +
              fStack_4b4 * fVar284 * fVar281 + fVar405 * fStack_4b4 * fVar279;
    fVar390 = fVar315 * fVar287 * fStack_4b0 +
              fStack_4b0 * fVar285 * fVar312 + fVar406 * fStack_4b0 * fVar309;
    fVar391 = fVar34 * fVar321 * fStack_4ac +
              fStack_4ac * fVar318 * fVar445 + fVar407 * fStack_4ac * fVar444;
    fVar392 = fVar41 * fVar36 * fStack_4a8 +
              fStack_4a8 * fVar35 * fVar40 + fVar408 * fStack_4a8 * fVar39;
    fVar393 = fStack_824 + fVar288;
    auVar64._4_4_ = fVar367 * fVar387;
    auVar64._0_4_ = fVar359 * fVar376;
    auVar64._8_4_ = fVar368 * fVar388;
    auVar64._12_4_ = fVar369 * fVar389;
    auVar64._16_4_ = fVar370 * fVar390;
    auVar64._20_4_ = fVar372 * fVar391;
    auVar64._24_4_ = fVar374 * fVar392;
    auVar64._28_4_ = fVar288;
    auVar127 = vsubps_avx(auVar429,auVar64);
    auVar65._4_4_ = fVar387 * fVar387;
    auVar65._0_4_ = fVar376 * fVar376;
    auVar65._8_4_ = fVar388 * fVar388;
    auVar65._12_4_ = fVar389 * fVar389;
    auVar65._16_4_ = fVar390 * fVar390;
    auVar65._20_4_ = fVar391 * fVar391;
    auVar65._24_4_ = fVar392 * fVar392;
    auVar65._28_4_ = fStack_824;
    auVar170 = vsubps_avx(auVar441,auVar65);
    auVar353 = vsqrtps_avx(auVar125);
    fVar288 = (auVar353._0_4_ + auVar180._0_4_) * 1.0000002;
    fVar145 = (auVar353._4_4_ + auVar180._4_4_) * 1.0000002;
    fVar147 = (auVar353._8_4_ + auVar180._8_4_) * 1.0000002;
    fVar149 = (auVar353._12_4_ + auVar180._12_4_) * 1.0000002;
    fVar150 = (auVar353._16_4_ + auVar180._16_4_) * 1.0000002;
    fVar151 = (auVar353._20_4_ + auVar180._20_4_) * 1.0000002;
    fVar152 = (auVar353._24_4_ + auVar180._24_4_) * 1.0000002;
    auVar66._4_4_ = fVar145 * fVar145;
    auVar66._0_4_ = fVar288 * fVar288;
    auVar66._8_4_ = fVar147 * fVar147;
    auVar66._12_4_ = fVar149 * fVar149;
    auVar66._16_4_ = fVar150 * fVar150;
    auVar66._20_4_ = fVar151 * fVar151;
    auVar66._24_4_ = fVar152 * fVar152;
    auVar66._28_4_ = auVar353._28_4_ + auVar180._28_4_;
    fVar145 = auVar127._0_4_ + auVar127._0_4_;
    fVar147 = auVar127._4_4_ + auVar127._4_4_;
    local_940._0_8_ = CONCAT44(fVar147,fVar145);
    local_940._8_4_ = auVar127._8_4_ + auVar127._8_4_;
    local_940._12_4_ = auVar127._12_4_ + auVar127._12_4_;
    local_940._16_4_ = auVar127._16_4_ + auVar127._16_4_;
    local_940._20_4_ = auVar127._20_4_ + auVar127._20_4_;
    local_940._24_4_ = auVar127._24_4_ + auVar127._24_4_;
    fVar288 = auVar127._28_4_;
    local_940._28_4_ = fVar288 + fVar288;
    auVar180 = vsubps_avx(auVar170,auVar66);
    local_380._4_4_ = fVar367 * fVar367;
    local_380._0_4_ = fVar359 * fVar359;
    local_380._8_4_ = fVar368 * fVar368;
    local_380._12_4_ = fVar369 * fVar369;
    local_380._16_4_ = fVar370 * fVar370;
    local_380._20_4_ = fVar372 * fVar372;
    local_380._24_4_ = fVar374 * fVar374;
    local_380._28_4_ = auVar170._28_4_;
    local_4e0 = vsubps_avx(local_2a0,local_380);
    auVar67._4_4_ = fVar147 * fVar147;
    auVar67._0_4_ = fVar145 * fVar145;
    auVar67._8_4_ = local_940._8_4_ * local_940._8_4_;
    auVar67._12_4_ = local_940._12_4_ * local_940._12_4_;
    auVar67._16_4_ = local_940._16_4_ * local_940._16_4_;
    auVar67._20_4_ = local_940._20_4_ * local_940._20_4_;
    auVar67._24_4_ = local_940._24_4_ * local_940._24_4_;
    auVar67._28_4_ = fVar288;
    auStack_918 = auVar67._8_24_;
    fVar149 = local_4e0._0_4_;
    fVar150 = local_4e0._4_4_;
    fVar151 = local_4e0._8_4_;
    fVar152 = local_4e0._12_4_;
    fVar371 = local_4e0._16_4_;
    fVar373 = local_4e0._20_4_;
    fVar375 = local_4e0._24_4_;
    auVar68._4_4_ = auVar180._4_4_ * fVar150 * 4.0;
    auVar68._0_4_ = auVar180._0_4_ * fVar149 * 4.0;
    auVar68._8_4_ = auVar180._8_4_ * fVar151 * 4.0;
    auVar68._12_4_ = auVar180._12_4_ * fVar152 * 4.0;
    auVar68._16_4_ = auVar180._16_4_ * fVar371 * 4.0;
    auVar68._20_4_ = auVar180._20_4_ * fVar373 * 4.0;
    auVar68._24_4_ = auVar180._24_4_ * fVar375 * 4.0;
    auVar68._28_4_ = 0x40800000;
    auVar127 = vsubps_avx(auVar67,auVar68);
    auVar125 = vcmpps_avx(auVar127,auVar171,5);
    fVar288 = local_4e0._28_4_;
    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0x7f,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar125 >> 0xbf,0) == '\0') &&
        (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar125[0x1f])
    {
      auVar354._8_4_ = 0x7f800000;
      auVar354._0_8_ = 0x7f8000007f800000;
      auVar354._12_4_ = 0x7f800000;
      auVar354._16_4_ = 0x7f800000;
      auVar354._20_4_ = 0x7f800000;
      auVar354._24_4_ = 0x7f800000;
      auVar354._28_4_ = 0x7f800000;
      auVar442._8_4_ = 0xff800000;
      auVar442._0_8_ = 0xff800000ff800000;
      auVar442._12_4_ = 0xff800000;
      auVar442._16_4_ = 0xff800000;
      auVar442._20_4_ = 0xff800000;
      auVar442._24_4_ = 0xff800000;
      auVar442._28_4_ = 0xff800000;
    }
    else {
      auVar171 = vcmpps_avx(auVar127,auVar171,5);
      auVar191 = vsqrtps_avx(auVar127);
      auVar298._0_4_ = fVar149 + fVar149;
      auVar298._4_4_ = fVar150 + fVar150;
      auVar298._8_4_ = fVar151 + fVar151;
      auVar298._12_4_ = fVar152 + fVar152;
      auVar298._16_4_ = fVar371 + fVar371;
      auVar298._20_4_ = fVar373 + fVar373;
      auVar298._24_4_ = fVar375 + fVar375;
      auVar298._28_4_ = fVar288 + fVar288;
      auVar127 = vrcpps_avx(auVar298);
      fVar291 = auVar127._0_4_;
      fVar308 = auVar127._4_4_;
      auVar69._4_4_ = auVar298._4_4_ * fVar308;
      auVar69._0_4_ = auVar298._0_4_ * fVar291;
      fVar311 = auVar127._8_4_;
      auVar69._8_4_ = auVar298._8_4_ * fVar311;
      fVar314 = auVar127._12_4_;
      auVar69._12_4_ = auVar298._12_4_ * fVar314;
      fVar317 = auVar127._16_4_;
      auVar69._16_4_ = auVar298._16_4_ * fVar317;
      fVar320 = auVar127._20_4_;
      auVar69._20_4_ = auVar298._20_4_ * fVar320;
      fVar323 = auVar127._24_4_;
      auVar69._24_4_ = auVar298._24_4_ * fVar323;
      auVar69._28_4_ = auVar298._28_4_;
      auVar355._8_4_ = 0x3f800000;
      auVar355._0_8_ = 0x3f8000003f800000;
      auVar355._12_4_ = 0x3f800000;
      auVar355._16_4_ = 0x3f800000;
      auVar355._20_4_ = 0x3f800000;
      auVar355._24_4_ = 0x3f800000;
      auVar355._28_4_ = 0x3f800000;
      auVar192 = vsubps_avx(auVar355,auVar69);
      fVar291 = fVar291 + fVar291 * auVar192._0_4_;
      fVar308 = fVar308 + fVar308 * auVar192._4_4_;
      fVar311 = fVar311 + fVar311 * auVar192._8_4_;
      fVar314 = fVar314 + fVar314 * auVar192._12_4_;
      fVar317 = fVar317 + fVar317 * auVar192._16_4_;
      fVar320 = fVar320 + fVar320 * auVar192._20_4_;
      fVar323 = fVar323 + fVar323 * auVar192._24_4_;
      auVar331._0_8_ = CONCAT44(fVar147,fVar145) ^ 0x8000000080000000;
      auVar331._8_4_ = -local_940._8_4_;
      auVar331._12_4_ = -local_940._12_4_;
      auVar331._16_4_ = -local_940._16_4_;
      auVar331._20_4_ = -local_940._20_4_;
      auVar331._24_4_ = -local_940._24_4_;
      auVar331._28_4_ = -local_940._28_4_;
      auVar193 = vsubps_avx(auVar331,auVar191);
      fVar145 = auVar193._0_4_ * fVar291;
      fVar147 = auVar193._4_4_ * fVar308;
      auVar70._4_4_ = fVar147;
      auVar70._0_4_ = fVar145;
      fVar336 = auVar193._8_4_ * fVar311;
      auVar70._8_4_ = fVar336;
      fVar338 = auVar193._12_4_ * fVar314;
      auVar70._12_4_ = fVar338;
      fVar340 = auVar193._16_4_ * fVar317;
      auVar70._16_4_ = fVar340;
      fVar342 = auVar193._20_4_ * fVar320;
      auVar70._20_4_ = fVar342;
      fVar344 = auVar193._24_4_ * fVar323;
      auVar70._24_4_ = fVar344;
      auVar70._28_4_ = auVar193._28_4_;
      auVar191 = vsubps_avx(auVar191,local_940);
      fVar291 = auVar191._0_4_ * fVar291;
      fVar308 = auVar191._4_4_ * fVar308;
      auVar71._4_4_ = fVar308;
      auVar71._0_4_ = fVar291;
      fVar311 = auVar191._8_4_ * fVar311;
      auVar71._8_4_ = fVar311;
      fVar314 = auVar191._12_4_ * fVar314;
      auVar71._12_4_ = fVar314;
      fVar317 = auVar191._16_4_ * fVar317;
      auVar71._16_4_ = fVar317;
      fVar320 = auVar191._20_4_ * fVar320;
      auVar71._20_4_ = fVar320;
      fVar323 = auVar191._24_4_ * fVar323;
      auVar71._24_4_ = fVar323;
      auVar71._28_4_ = auVar191._28_4_;
      local_340 = local_4c0 * (fVar376 + fVar359 * fVar145);
      fStack_33c = fStack_4bc * (fVar387 + fVar367 * fVar147);
      fStack_338 = fStack_4b8 * (fVar388 + fVar368 * fVar336);
      fStack_334 = fStack_4b4 * (fVar389 + fVar369 * fVar338);
      fStack_330 = fStack_4b0 * (fVar390 + fVar370 * fVar340);
      fStack_32c = fStack_4ac * (fVar391 + fVar372 * fVar342);
      fStack_328 = fStack_4a8 * (fVar392 + fVar374 * fVar344);
      fStack_324 = fVar393 + auVar127._28_4_ + auVar192._28_4_;
      auVar299._8_4_ = 0x7fffffff;
      auVar299._0_8_ = 0x7fffffff7fffffff;
      auVar299._12_4_ = 0x7fffffff;
      auVar299._16_4_ = 0x7fffffff;
      auVar299._20_4_ = 0x7fffffff;
      auVar299._24_4_ = 0x7fffffff;
      auVar299._28_4_ = 0x7fffffff;
      auVar127 = vandps_avx(local_380,auVar299);
      auVar191 = vmaxps_avx(local_460,auVar127);
      auVar72._4_4_ = auVar191._4_4_ * 1.9073486e-06;
      auVar72._0_4_ = auVar191._0_4_ * 1.9073486e-06;
      auVar72._8_4_ = auVar191._8_4_ * 1.9073486e-06;
      auVar72._12_4_ = auVar191._12_4_ * 1.9073486e-06;
      auVar72._16_4_ = auVar191._16_4_ * 1.9073486e-06;
      auVar72._20_4_ = auVar191._20_4_ * 1.9073486e-06;
      auVar72._24_4_ = auVar191._24_4_ * 1.9073486e-06;
      auVar72._28_4_ = auVar191._28_4_;
      auVar127 = vandps_avx(local_4e0,auVar299);
      auVar127 = vcmpps_avx(auVar127,auVar72,1);
      auVar356._8_4_ = 0x7f800000;
      auVar356._0_8_ = 0x7f8000007f800000;
      auVar356._12_4_ = 0x7f800000;
      auVar356._16_4_ = 0x7f800000;
      auVar356._20_4_ = 0x7f800000;
      auVar356._24_4_ = 0x7f800000;
      auVar356._28_4_ = 0x7f800000;
      auVar354 = vblendvps_avx(auVar356,auVar70,auVar171);
      local_360 = local_4c0 * (fVar376 + fVar359 * fVar291);
      fStack_35c = fStack_4bc * (fVar387 + fVar367 * fVar308);
      fStack_358 = fStack_4b8 * (fVar388 + fVar368 * fVar311);
      fStack_354 = fStack_4b4 * (fVar389 + fVar369 * fVar314);
      fStack_350 = fStack_4b0 * (fVar390 + fVar370 * fVar317);
      fStack_34c = fStack_4ac * (fVar391 + fVar372 * fVar320);
      fStack_348 = fStack_4a8 * (fVar392 + fVar374 * fVar323);
      fStack_344 = fVar393 + auVar191._28_4_;
      auVar300._8_4_ = 0xff800000;
      auVar300._0_8_ = 0xff800000ff800000;
      auVar300._12_4_ = 0xff800000;
      auVar300._16_4_ = 0xff800000;
      auVar300._20_4_ = 0xff800000;
      auVar300._24_4_ = 0xff800000;
      auVar300._28_4_ = 0xff800000;
      auVar442 = vblendvps_avx(auVar300,auVar71,auVar171);
      auVar191 = auVar171 & auVar127;
      if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar191 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar191 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar191 >> 0x7f,0) != '\0') ||
            (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar191 >> 0xbf,0) != '\0') ||
          (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar191[0x1f] < '\0') {
        auVar125 = vandps_avx(auVar127,auVar171);
        auVar263 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
        auVar127 = vcmpps_avx(auVar180,ZEXT832(0) << 0x20,2);
        auVar430._8_4_ = 0xff800000;
        auVar430._0_8_ = 0xff800000ff800000;
        auVar430._12_4_ = 0xff800000;
        auVar430._16_4_ = 0xff800000;
        auVar430._20_4_ = 0xff800000;
        auVar430._24_4_ = 0xff800000;
        auVar430._28_4_ = 0xff800000;
        auVar447._8_4_ = 0x7f800000;
        auVar447._0_8_ = 0x7f8000007f800000;
        auVar447._12_4_ = 0x7f800000;
        auVar447._16_4_ = 0x7f800000;
        auVar447._20_4_ = 0x7f800000;
        auVar447._24_4_ = 0x7f800000;
        auVar447._28_4_ = 0x7f800000;
        auVar180 = vblendvps_avx(auVar447,auVar430,auVar127);
        auVar158 = vpmovsxwd_avx(auVar263);
        auVar263 = vpunpckhwd_avx(auVar263,auVar263);
        auVar275._16_16_ = auVar263;
        auVar275._0_16_ = auVar158;
        auVar354 = vblendvps_avx(auVar354,auVar180,auVar275);
        auVar180 = vblendvps_avx(auVar430,auVar447,auVar127);
        auVar442 = vblendvps_avx(auVar442,auVar180,auVar275);
        auVar180 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar141._0_4_ = auVar125._0_4_ ^ auVar180._0_4_;
        auVar141._4_4_ = auVar125._4_4_ ^ auVar180._4_4_;
        auVar141._8_4_ = auVar125._8_4_ ^ auVar180._8_4_;
        auVar141._12_4_ = auVar125._12_4_ ^ auVar180._12_4_;
        auVar141._16_4_ = auVar125._16_4_ ^ auVar180._16_4_;
        auVar141._20_4_ = auVar125._20_4_ ^ auVar180._20_4_;
        auVar141._24_4_ = auVar125._24_4_ ^ auVar180._24_4_;
        auVar141._28_4_ = auVar125._28_4_ ^ auVar180._28_4_;
        auVar125 = vorps_avx(auVar127,auVar141);
        auVar125 = vandps_avx(auVar171,auVar125);
      }
    }
    auVar449 = ZEXT3264(local_a40);
    auVar180 = local_420 & auVar125;
    auVar305 = ZEXT3264(local_a60);
    if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar180 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar180 >> 0x7f,0) == '\0') &&
          (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar180 >> 0xbf,0) == '\0') &&
        (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar180[0x1f])
    {
      auVar358 = ZEXT3264(local_a00);
      auVar402 = ZEXT3264(local_a20);
    }
    else {
      fStack_4a4 = auVar30._28_4_ + auVar194._28_4_;
      auVar158 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      local_740._0_16_ = auVar158;
      auVar263 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8c0._0_4_));
      auVar263 = vshufps_avx(auVar263,auVar263,0);
      auVar270._16_16_ = auVar263;
      auVar270._0_16_ = auVar263;
      auVar127 = vminps_avx(auVar270,auVar442);
      fVar320 = auVar126._28_4_;
      auVar173._0_4_ =
           (float)local_820._0_4_ * fVar290 +
           (float)local_840._0_4_ * fVar324 + (float)local_7e0._0_4_ * fVar410;
      auVar173._4_4_ =
           (float)local_820._4_4_ * fVar307 +
           (float)local_840._4_4_ * fVar334 + (float)local_7e0._4_4_ * fVar416;
      auVar173._8_4_ = fStack_818 * fVar310 + fStack_838 * fVar335 + fStack_7d8 * fVar417;
      auVar173._12_4_ = fStack_814 * fVar313 + fStack_834 * fVar337 + fStack_7d4 * fVar419;
      auVar173._16_4_ = fStack_810 * fVar316 + fStack_830 * fVar339 + fStack_7d0 * fVar420;
      auVar173._20_4_ = fStack_80c * fVar319 + fStack_82c * fVar341 + fStack_7cc * fVar421;
      auVar173._24_4_ = fStack_808 * fVar322 + fStack_828 * fVar343 + fStack_7c8 * fVar422;
      auVar173._28_4_ = fVar320 + auVar330._28_4_ + fVar320;
      auVar180 = vrcpps_avx(auVar173);
      fVar145 = auVar180._0_4_;
      fVar147 = auVar180._4_4_;
      auVar73._4_4_ = auVar173._4_4_ * fVar147;
      auVar73._0_4_ = auVar173._0_4_ * fVar145;
      fVar291 = auVar180._8_4_;
      auVar73._8_4_ = auVar173._8_4_ * fVar291;
      fVar308 = auVar180._12_4_;
      auVar73._12_4_ = auVar173._12_4_ * fVar308;
      fVar311 = auVar180._16_4_;
      auVar73._16_4_ = auVar173._16_4_ * fVar311;
      fVar314 = auVar180._20_4_;
      auVar73._20_4_ = auVar173._20_4_ * fVar314;
      fVar317 = auVar180._24_4_;
      auVar73._24_4_ = auVar173._24_4_ * fVar317;
      auVar73._28_4_ = auVar169._28_4_;
      auVar383._8_4_ = 0x3f800000;
      auVar383._0_8_ = 0x3f8000003f800000;
      auVar383._12_4_ = 0x3f800000;
      auVar383._16_4_ = 0x3f800000;
      auVar383._20_4_ = 0x3f800000;
      auVar383._24_4_ = 0x3f800000;
      auVar383._28_4_ = 0x3f800000;
      auVar126 = vsubps_avx(auVar383,auVar73);
      auVar332._8_4_ = 0x7fffffff;
      auVar332._0_8_ = 0x7fffffff7fffffff;
      auVar332._12_4_ = 0x7fffffff;
      auVar332._16_4_ = 0x7fffffff;
      auVar332._20_4_ = 0x7fffffff;
      auVar332._24_4_ = 0x7fffffff;
      auVar332._28_4_ = 0x7fffffff;
      auVar180 = vandps_avx(auVar173,auVar332);
      auVar365._8_4_ = 0x219392ef;
      auVar365._0_8_ = 0x219392ef219392ef;
      auVar365._12_4_ = 0x219392ef;
      auVar365._16_4_ = 0x219392ef;
      auVar365._20_4_ = 0x219392ef;
      auVar365._24_4_ = 0x219392ef;
      auVar365._28_4_ = 0x219392ef;
      auVar30 = vcmpps_avx(auVar180,auVar365,1);
      auVar74._4_4_ =
           (fVar147 + fVar147 * auVar126._4_4_) *
           -(fVar257 * fVar307 + fVar256 * fVar334 + fVar255 * fVar416);
      auVar74._0_4_ =
           (fVar145 + fVar145 * auVar126._0_4_) *
           -(fVar234 * fVar290 + fVar111 * fVar324 + fVar233 * fVar410);
      auVar74._8_4_ =
           (fVar291 + fVar291 * auVar126._8_4_) *
           -(fVar282 * fVar310 + fVar280 * fVar335 + fVar278 * fVar417);
      auVar74._12_4_ =
           (fVar308 + fVar308 * auVar126._12_4_) *
           -(fVar283 * fVar313 + fVar281 * fVar337 + fVar279 * fVar419);
      auVar74._16_4_ =
           (fVar311 + fVar311 * auVar126._16_4_) *
           -(fVar315 * fVar316 + fVar312 * fVar339 + fVar309 * fVar420);
      auVar74._20_4_ =
           (fVar314 + fVar314 * auVar126._20_4_) *
           -(fVar34 * fVar319 + fVar445 * fVar341 + fVar444 * fVar421);
      auVar74._24_4_ =
           (fVar317 + fVar317 * auVar126._24_4_) *
           -(fVar41 * fVar322 + fVar40 * fVar343 + fVar39 * fVar422);
      auVar74._28_4_ = -(fVar320 + auVar45._28_4_ + fVar320);
      auVar95 = ZEXT812(0);
      auVar180 = vcmpps_avx(auVar173,ZEXT1232(auVar95) << 0x20,1);
      auVar180 = vorps_avx(auVar30,auVar180);
      auVar357._8_4_ = 0xff800000;
      auVar357._0_8_ = 0xff800000ff800000;
      auVar357._12_4_ = 0xff800000;
      auVar357._16_4_ = 0xff800000;
      auVar357._20_4_ = 0xff800000;
      auVar357._24_4_ = 0xff800000;
      auVar357._28_4_ = 0xff800000;
      auVar180 = vblendvps_avx(auVar74,auVar357,auVar180);
      auVar45 = vcmpps_avx(auVar173,ZEXT1232(auVar95) << 0x20,6);
      auVar30 = vorps_avx(auVar30,auVar45);
      auVar401._8_4_ = 0x7f800000;
      auVar401._0_8_ = 0x7f8000007f800000;
      auVar401._12_4_ = 0x7f800000;
      auVar401._16_4_ = 0x7f800000;
      auVar401._20_4_ = 0x7f800000;
      auVar401._24_4_ = 0x7f800000;
      auVar401._28_4_ = 0x7f800000;
      auVar30 = vblendvps_avx(auVar74,auVar401,auVar30);
      auVar45 = vmaxps_avx(local_300,auVar354);
      auVar45 = vmaxps_avx(auVar45,auVar180);
      auVar126 = vminps_avx(auVar127,auVar30);
      auVar169 = ZEXT1232(auVar95) << 0x20;
      auVar180 = vsubps_avx(auVar169,auVar366);
      auVar30 = vsubps_avx(auVar169,local_a80);
      auVar75._4_4_ = auVar30._4_4_ * -fVar432;
      auVar75._0_4_ = auVar30._0_4_ * -fVar424;
      auVar75._8_4_ = auVar30._8_4_ * -fVar433;
      auVar75._12_4_ = auVar30._12_4_ * -fVar434;
      auVar75._16_4_ = auVar30._16_4_ * -fVar435;
      auVar75._20_4_ = auVar30._20_4_ * -fVar436;
      auVar75._24_4_ = auVar30._24_4_ * -fVar437;
      auVar75._28_4_ = auVar30._28_4_;
      auVar76._4_4_ = fVar237 * auVar180._4_4_;
      auVar76._0_4_ = fVar205 * auVar180._0_4_;
      auVar76._8_4_ = fVar260 * auVar180._8_4_;
      auVar76._12_4_ = fVar261 * auVar180._12_4_;
      auVar76._16_4_ = fVar289 * auVar180._16_4_;
      auVar76._20_4_ = fVar409 * auVar180._20_4_;
      auVar76._24_4_ = fVar37 * auVar180._24_4_;
      auVar76._28_4_ = auVar180._28_4_;
      auVar180 = vsubps_avx(auVar75,auVar76);
      auVar30 = vsubps_avx(auVar169,auVar195);
      auVar77._4_4_ = fVar254 * auVar30._4_4_;
      auVar77._0_4_ = fVar232 * auVar30._0_4_;
      auVar77._8_4_ = fVar276 * auVar30._8_4_;
      auVar77._12_4_ = fVar277 * auVar30._12_4_;
      auVar77._16_4_ = fVar306 * auVar30._16_4_;
      auVar77._20_4_ = fVar423 * auVar30._20_4_;
      uVar9 = auVar30._28_4_;
      auVar77._24_4_ = fVar38 * auVar30._24_4_;
      auVar77._28_4_ = uVar9;
      auVar366 = vsubps_avx(auVar180,auVar77);
      auVar78._4_4_ = (float)local_7e0._4_4_ * -fVar432;
      auVar78._0_4_ = (float)local_7e0._0_4_ * -fVar424;
      auVar78._8_4_ = fStack_7d8 * -fVar433;
      auVar78._12_4_ = fStack_7d4 * -fVar434;
      auVar78._16_4_ = fStack_7d0 * -fVar435;
      auVar78._20_4_ = fStack_7cc * -fVar436;
      auVar78._24_4_ = fStack_7c8 * -fVar437;
      auVar78._28_4_ = uVar102 ^ 0x80000000;
      auVar79._4_4_ = (float)local_840._4_4_ * fVar237;
      auVar79._0_4_ = (float)local_840._0_4_ * fVar205;
      auVar79._8_4_ = fStack_838 * fVar260;
      auVar79._12_4_ = fStack_834 * fVar261;
      auVar79._16_4_ = fStack_830 * fVar289;
      auVar79._20_4_ = fStack_82c * fVar409;
      auVar79._24_4_ = fStack_828 * fVar37;
      auVar79._28_4_ = uVar9;
      auVar180 = vsubps_avx(auVar78,auVar79);
      auVar80._4_4_ = fVar254 * (float)local_820._4_4_;
      auVar80._0_4_ = fVar232 * (float)local_820._0_4_;
      auVar80._8_4_ = fVar276 * fStack_818;
      auVar80._12_4_ = fVar277 * fStack_814;
      auVar80._16_4_ = fVar306 * fStack_810;
      auVar80._20_4_ = fVar423 * fStack_80c;
      auVar80._24_4_ = fVar38 * fStack_808;
      auVar80._28_4_ = uVar9;
      auVar384._8_4_ = 0x3f800000;
      auVar384._0_8_ = 0x3f8000003f800000;
      auVar384._12_4_ = 0x3f800000;
      auVar384._16_4_ = 0x3f800000;
      auVar384._20_4_ = 0x3f800000;
      auVar384._24_4_ = 0x3f800000;
      auVar384._28_4_ = 0x3f800000;
      auVar195 = vsubps_avx(auVar180,auVar80);
      auVar180 = vrcpps_avx(auVar195);
      fVar205 = auVar180._0_4_;
      fVar232 = auVar180._4_4_;
      auVar81._4_4_ = auVar195._4_4_ * fVar232;
      auVar81._0_4_ = auVar195._0_4_ * fVar205;
      fVar233 = auVar180._8_4_;
      auVar81._8_4_ = auVar195._8_4_ * fVar233;
      fVar111 = auVar180._12_4_;
      auVar81._12_4_ = auVar195._12_4_ * fVar111;
      fVar234 = auVar180._16_4_;
      auVar81._16_4_ = auVar195._16_4_ * fVar234;
      fVar237 = auVar180._20_4_;
      auVar81._20_4_ = auVar195._20_4_ * fVar237;
      fVar254 = auVar180._24_4_;
      auVar81._24_4_ = auVar195._24_4_ * fVar254;
      auVar81._28_4_ = fStack_804;
      auVar127 = vsubps_avx(auVar384,auVar81);
      auVar180 = vandps_avx(auVar195,auVar332);
      auVar333._8_4_ = 0x219392ef;
      auVar333._0_8_ = 0x219392ef219392ef;
      auVar333._12_4_ = 0x219392ef;
      auVar333._16_4_ = 0x219392ef;
      auVar333._20_4_ = 0x219392ef;
      auVar333._24_4_ = 0x219392ef;
      auVar333._28_4_ = 0x219392ef;
      auVar30 = vcmpps_avx(auVar180,auVar333,1);
      auVar82._4_4_ = (fVar232 + fVar232 * auVar127._4_4_) * -auVar366._4_4_;
      auVar82._0_4_ = (fVar205 + fVar205 * auVar127._0_4_) * -auVar366._0_4_;
      auVar82._8_4_ = (fVar233 + fVar233 * auVar127._8_4_) * -auVar366._8_4_;
      auVar82._12_4_ = (fVar111 + fVar111 * auVar127._12_4_) * -auVar366._12_4_;
      auVar82._16_4_ = (fVar234 + fVar234 * auVar127._16_4_) * -auVar366._16_4_;
      auVar82._20_4_ = (fVar237 + fVar237 * auVar127._20_4_) * -auVar366._20_4_;
      auVar82._24_4_ = (fVar254 + fVar254 * auVar127._24_4_) * -auVar366._24_4_;
      auVar82._28_4_ = auVar366._28_4_ ^ 0x80000000;
      auVar180 = vcmpps_avx(auVar195,auVar169,1);
      auVar180 = vorps_avx(auVar30,auVar180);
      auVar180 = vblendvps_avx(auVar82,auVar357,auVar180);
      _local_720 = vmaxps_avx(auVar45,auVar180);
      auVar366 = ZEXT1232(auVar95) << 0x20;
      auVar180 = vcmpps_avx(auVar195,auVar366,6);
      auVar180 = vorps_avx(auVar30,auVar180);
      auVar180 = vblendvps_avx(auVar82,auVar401,auVar180);
      auVar125 = vandps_avx(auVar125,local_420);
      local_3a0 = vminps_avx(auVar126,auVar180);
      auVar180 = vcmpps_avx(_local_720,local_3a0,2);
      auVar30 = auVar125 & auVar180;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0x7f,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0xbf,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar30[0x1f] < '\0') {
        auVar30 = vminps_avx(local_7c0,auVar130);
        auVar31 = vminps_avx(auVar31,auVar431);
        auVar30 = vminps_avx(auVar30,auVar31);
        auVar30 = vsubps_avx(auVar30,auVar353);
        auVar125 = vandps_avx(auVar180,auVar125);
        auVar97._4_4_ = fStack_33c;
        auVar97._0_4_ = local_340;
        auVar97._8_4_ = fStack_338;
        auVar97._12_4_ = fStack_334;
        auVar97._16_4_ = fStack_330;
        auVar97._20_4_ = fStack_32c;
        auVar97._24_4_ = fStack_328;
        auVar97._28_4_ = fStack_324;
        auVar180 = vminps_avx(auVar97,auVar384);
        auVar180 = vmaxps_avx(auVar180,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar110 + fVar153 * (auVar180._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar144 + fVar181 * (auVar180._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar146 + fVar182 * (auVar180._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar148 + fVar183 * (auVar180._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar110 + fVar153 * (auVar180._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar144 + fVar181 * (auVar180._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar146 + fVar182 * (auVar180._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar148 + auVar180._28_4_ + 7.0;
        auVar96._4_4_ = fStack_35c;
        auVar96._0_4_ = local_360;
        auVar96._8_4_ = fStack_358;
        auVar96._12_4_ = fStack_354;
        auVar96._16_4_ = fStack_350;
        auVar96._20_4_ = fStack_34c;
        auVar96._24_4_ = fStack_348;
        auVar96._28_4_ = fStack_344;
        auVar180 = vminps_avx(auVar96,auVar384);
        auVar180 = vmaxps_avx(auVar180,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar110 + fVar153 * (auVar180._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar144 + fVar181 * (auVar180._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar146 + fVar182 * (auVar180._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar148 + fVar183 * (auVar180._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar110 + fVar153 * (auVar180._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar144 + fVar181 * (auVar180._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar146 + fVar182 * (auVar180._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar148 + auVar180._28_4_ + 7.0;
        auVar83._4_4_ = auVar30._4_4_ * 0.99999976;
        auVar83._0_4_ = auVar30._0_4_ * 0.99999976;
        auVar83._8_4_ = auVar30._8_4_ * 0.99999976;
        auVar83._12_4_ = auVar30._12_4_ * 0.99999976;
        auVar83._16_4_ = auVar30._16_4_ * 0.99999976;
        auVar83._20_4_ = auVar30._20_4_ * 0.99999976;
        auVar83._24_4_ = auVar30._24_4_ * 0.99999976;
        auVar83._28_4_ = 0x3f7ffffc;
        auVar180 = vmaxps_avx(auVar366,auVar83);
        auVar84._4_4_ = auVar180._4_4_ * auVar180._4_4_;
        auVar84._0_4_ = auVar180._0_4_ * auVar180._0_4_;
        auVar84._8_4_ = auVar180._8_4_ * auVar180._8_4_;
        auVar84._12_4_ = auVar180._12_4_ * auVar180._12_4_;
        auVar84._16_4_ = auVar180._16_4_ * auVar180._16_4_;
        auVar84._20_4_ = auVar180._20_4_ * auVar180._20_4_;
        auVar84._24_4_ = auVar180._24_4_ * auVar180._24_4_;
        auVar84._28_4_ = auVar180._28_4_;
        local_8e0 = vsubps_avx(auVar170,auVar84);
        auVar85._4_4_ = local_8e0._4_4_ * fVar150 * 4.0;
        auVar85._0_4_ = local_8e0._0_4_ * fVar149 * 4.0;
        auVar85._8_4_ = local_8e0._8_4_ * fVar151 * 4.0;
        auVar85._12_4_ = local_8e0._12_4_ * fVar152 * 4.0;
        auVar85._16_4_ = local_8e0._16_4_ * fVar371 * 4.0;
        auVar85._20_4_ = local_8e0._20_4_ * fVar373 * 4.0;
        auVar85._24_4_ = local_8e0._24_4_ * fVar375 * 4.0;
        auVar85._28_4_ = auVar180._28_4_;
        auVar30 = vsubps_avx(auVar67,auVar85);
        auVar180 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,5);
        if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar180 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar180 >> 0x7f,0) == '\0') &&
              (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar180 >> 0xbf,0) == '\0') &&
            (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar180[0x1f]) {
          auVar195 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_880 = ZEXT832(0) << 0x20;
          _local_8a0 = ZEXT832(0) << 0x20;
          auVar222 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar248 = ZEXT828(0) << 0x20;
          auVar271._8_4_ = 0x7f800000;
          auVar271._0_8_ = 0x7f8000007f800000;
          auVar271._12_4_ = 0x7f800000;
          auVar271._16_4_ = 0x7f800000;
          auVar271._20_4_ = 0x7f800000;
          auVar271._24_4_ = 0x7f800000;
          auVar271._28_4_ = 0x7f800000;
          auVar301._8_4_ = 0xff800000;
          auVar301._0_8_ = 0xff800000ff800000;
          auVar301._12_4_ = 0xff800000;
          auVar301._16_4_ = 0xff800000;
          auVar301._20_4_ = 0xff800000;
          auVar301._24_4_ = 0xff800000;
          auVar301._28_4_ = 0xff800000;
          local_8e0 = auVar47;
          _local_860 = _local_880;
        }
        else {
          auVar195 = vsqrtps_avx(auVar30);
          auVar228._0_4_ = fVar149 + fVar149;
          auVar228._4_4_ = fVar150 + fVar150;
          auVar228._8_4_ = fVar151 + fVar151;
          auVar228._12_4_ = fVar152 + fVar152;
          auVar228._16_4_ = fVar371 + fVar371;
          auVar228._20_4_ = fVar373 + fVar373;
          auVar228._24_4_ = fVar375 + fVar375;
          auVar228._28_4_ = fVar288 + fVar288;
          auVar31 = vrcpps_avx(auVar228);
          fVar288 = auVar31._0_4_;
          fVar205 = auVar31._4_4_;
          auVar86._4_4_ = auVar228._4_4_ * fVar205;
          auVar86._0_4_ = auVar228._0_4_ * fVar288;
          fVar232 = auVar31._8_4_;
          auVar86._8_4_ = auVar228._8_4_ * fVar232;
          fVar233 = auVar31._12_4_;
          auVar86._12_4_ = auVar228._12_4_ * fVar233;
          fVar111 = auVar31._16_4_;
          auVar86._16_4_ = auVar228._16_4_ * fVar111;
          fVar234 = auVar31._20_4_;
          auVar86._20_4_ = auVar228._20_4_ * fVar234;
          fVar237 = auVar31._24_4_;
          auVar86._24_4_ = auVar228._24_4_ * fVar237;
          auVar86._28_4_ = auVar228._28_4_;
          auVar431 = vsubps_avx(auVar384,auVar86);
          fVar288 = fVar288 + fVar288 * auVar431._0_4_;
          fVar205 = fVar205 + fVar205 * auVar431._4_4_;
          fVar232 = fVar232 + fVar232 * auVar431._8_4_;
          fVar233 = fVar233 + fVar233 * auVar431._12_4_;
          fVar111 = fVar111 + fVar111 * auVar431._16_4_;
          fVar234 = fVar234 + fVar234 * auVar431._20_4_;
          fVar237 = fVar237 + fVar237 * auVar431._24_4_;
          fVar254 = auVar31._28_4_ + auVar431._28_4_;
          auVar250._0_8_ = local_940._0_8_ ^ 0x8000000080000000;
          auVar250._8_4_ = -local_940._8_4_;
          auVar250._12_4_ = -local_940._12_4_;
          auVar250._16_4_ = -local_940._16_4_;
          auVar250._20_4_ = -local_940._20_4_;
          auVar250._24_4_ = -local_940._24_4_;
          auVar250._28_4_ = -local_940._28_4_;
          auVar31 = vsubps_avx(auVar250,auVar195);
          fVar282 = auVar31._0_4_ * fVar288;
          fVar261 = auVar31._4_4_ * fVar205;
          auVar87._4_4_ = fVar261;
          auVar87._0_4_ = fVar282;
          fVar277 = auVar31._8_4_ * fVar232;
          auVar87._8_4_ = fVar277;
          fVar279 = auVar31._12_4_ * fVar233;
          auVar87._12_4_ = fVar279;
          fVar281 = auVar31._16_4_ * fVar111;
          auVar87._16_4_ = fVar281;
          fVar283 = auVar31._20_4_ * fVar234;
          auVar87._20_4_ = fVar283;
          fVar289 = auVar31._24_4_ * fVar237;
          auVar87._24_4_ = fVar289;
          auVar87._28_4_ = 0x80000000;
          auVar195 = vsubps_avx(auVar195,local_940);
          fVar288 = auVar195._0_4_ * fVar288;
          fVar205 = auVar195._4_4_ * fVar205;
          auVar88._4_4_ = fVar205;
          auVar88._0_4_ = fVar288;
          fVar232 = auVar195._8_4_ * fVar232;
          auVar88._8_4_ = fVar232;
          fVar233 = auVar195._12_4_ * fVar233;
          auVar88._12_4_ = fVar233;
          fVar111 = auVar195._16_4_ * fVar111;
          auVar88._16_4_ = fVar111;
          fVar234 = auVar195._20_4_ * fVar234;
          auVar88._20_4_ = fVar234;
          fVar237 = auVar195._24_4_ * fVar237;
          auVar88._24_4_ = fVar237;
          auVar88._28_4_ = fVar418;
          fVar255 = (fVar282 * fVar359 + fVar376) * local_4c0;
          fVar256 = (fVar261 * fVar367 + fVar387) * fStack_4bc;
          fVar257 = (fVar277 * fVar368 + fVar388) * fStack_4b8;
          fVar260 = (fVar279 * fVar369 + fVar389) * fStack_4b4;
          fVar276 = (fVar281 * fVar370 + fVar390) * fStack_4b0;
          fVar278 = (fVar283 * fVar372 + fVar391) * fStack_4ac;
          fVar280 = (fVar289 * fVar374 + fVar392) * fStack_4a8;
          local_9c0._28_4_ = auVar44._28_4_;
          auVar196._0_4_ = auVar427._0_4_ + fVar112 * fVar255;
          auVar196._4_4_ = auVar427._4_4_ + fVar236 * fVar256;
          auVar196._8_4_ = auVar427._8_4_ + fVar259 * fVar257;
          auVar196._12_4_ = auVar427._12_4_ + fVar286 * fVar260;
          auVar196._16_4_ = auVar427._16_4_ + fVar287 * fVar276;
          auVar196._20_4_ = auVar427._20_4_ + fVar321 * fVar278;
          auVar196._24_4_ = auVar427._24_4_ + fVar36 * fVar280;
          auVar196._28_4_ = auVar427._28_4_ + auVar195._28_4_ + fVar393;
          auVar89._4_4_ = fVar261 * (float)local_820._4_4_;
          auVar89._0_4_ = fVar282 * (float)local_820._0_4_;
          auVar89._8_4_ = fVar277 * fStack_818;
          auVar89._12_4_ = fVar279 * fStack_814;
          auVar89._16_4_ = fVar281 * fStack_810;
          auVar89._20_4_ = fVar283 * fStack_80c;
          auVar89._24_4_ = fVar289 * fStack_808;
          auVar89._28_4_ = fVar254;
          auVar195 = vsubps_avx(auVar89,auVar196);
          auVar229._0_4_ = auVar440._0_4_ + fVar231 * fVar255;
          auVar229._4_4_ = auVar440._4_4_ + fVar235 * fVar256;
          auVar229._8_4_ = auVar440._8_4_ + fVar258 * fVar257;
          auVar229._12_4_ = auVar440._12_4_ + fVar284 * fVar260;
          auVar229._16_4_ = auVar440._16_4_ + fVar285 * fVar276;
          auVar229._20_4_ = auVar440._20_4_ + fVar318 * fVar278;
          auVar229._24_4_ = auVar440._24_4_ + fVar35 * fVar280;
          auVar229._28_4_ = auVar440._28_4_ + fVar254;
          auVar272._0_4_ = (float)local_840._0_4_ * fVar282;
          auVar272._4_4_ = (float)local_840._4_4_ * fVar261;
          auVar272._8_4_ = fStack_838 * fVar277;
          auVar272._12_4_ = fStack_834 * fVar279;
          auVar272._16_4_ = fStack_830 * fVar281;
          auVar272._20_4_ = fStack_82c * fVar283;
          auVar272._24_4_ = fStack_828 * fVar289;
          auVar272._28_4_ = 0;
          _local_aa0 = vsubps_avx(auVar272,auVar229);
          auVar251._0_4_ = auVar446._0_4_ + fVar394 * fVar255;
          auVar251._4_4_ = auVar446._4_4_ + fVar403 * fVar256;
          auVar251._8_4_ = auVar446._8_4_ + fVar404 * fVar257;
          auVar251._12_4_ = auVar446._12_4_ + fVar405 * fVar260;
          auVar251._16_4_ = auVar446._16_4_ + fVar406 * fVar276;
          auVar251._20_4_ = auVar446._20_4_ + fVar407 * fVar278;
          auVar251._24_4_ = auVar446._24_4_ + fVar408 * fVar280;
          auVar251._28_4_ = auVar446._28_4_ + auVar31._28_4_;
          auVar90._4_4_ = (float)local_7e0._4_4_ * fVar261;
          auVar90._0_4_ = (float)local_7e0._0_4_ * fVar282;
          auVar90._8_4_ = fStack_7d8 * fVar277;
          auVar90._12_4_ = fStack_7d4 * fVar279;
          auVar90._16_4_ = fStack_7d0 * fVar281;
          auVar90._20_4_ = fStack_7cc * fVar283;
          auVar90._24_4_ = fStack_7c8 * fVar289;
          auVar90._28_4_ = 0;
          auVar31 = vsubps_avx(auVar90,auVar251);
          auVar248 = auVar31._0_28_;
          fVar254 = (fVar288 * fVar359 + fVar376) * local_4c0;
          fVar255 = (fVar205 * fVar367 + fVar387) * fStack_4bc;
          fVar256 = (fVar232 * fVar368 + fVar388) * fStack_4b8;
          fVar257 = (fVar233 * fVar369 + fVar389) * fStack_4b4;
          fVar260 = (fVar111 * fVar370 + fVar390) * fStack_4b0;
          fVar276 = (fVar234 * fVar372 + fVar391) * fStack_4ac;
          fVar278 = (fVar237 * fVar374 + fVar392) * fStack_4a8;
          auVar302._0_4_ = auVar427._0_4_ + fVar112 * fVar254;
          auVar302._4_4_ = auVar427._4_4_ + fVar236 * fVar255;
          auVar302._8_4_ = auVar427._8_4_ + fVar259 * fVar256;
          auVar302._12_4_ = auVar427._12_4_ + fVar286 * fVar257;
          auVar302._16_4_ = auVar427._16_4_ + fVar287 * fVar260;
          auVar302._20_4_ = auVar427._20_4_ + fVar321 * fVar276;
          auVar302._24_4_ = auVar427._24_4_ + fVar36 * fVar278;
          auVar302._28_4_ = auVar427._28_4_ + (float)local_9c0._28_4_;
          auVar91._4_4_ = fVar205 * (float)local_820._4_4_;
          auVar91._0_4_ = fVar288 * (float)local_820._0_4_;
          auVar91._8_4_ = fVar232 * fStack_818;
          auVar91._12_4_ = fVar233 * fStack_814;
          auVar91._16_4_ = fVar111 * fStack_810;
          auVar91._20_4_ = fVar234 * fStack_80c;
          auVar91._24_4_ = fVar237 * fStack_808;
          auVar91._28_4_ = fStack_804;
          _local_860 = vsubps_avx(auVar91,auVar302);
          auVar303._0_4_ = auVar440._0_4_ + fVar231 * fVar254;
          auVar303._4_4_ = auVar440._4_4_ + fVar235 * fVar255;
          auVar303._8_4_ = auVar440._8_4_ + fVar258 * fVar256;
          auVar303._12_4_ = auVar440._12_4_ + fVar284 * fVar257;
          auVar303._16_4_ = auVar440._16_4_ + fVar285 * fVar260;
          auVar303._20_4_ = auVar440._20_4_ + fVar318 * fVar276;
          auVar303._24_4_ = auVar440._24_4_ + fVar35 * fVar278;
          auVar303._28_4_ = auVar440._28_4_ + local_860._28_4_;
          auVar92._4_4_ = (float)local_840._4_4_ * fVar205;
          auVar92._0_4_ = (float)local_840._0_4_ * fVar288;
          auVar92._8_4_ = fStack_838 * fVar232;
          auVar92._12_4_ = fStack_834 * fVar233;
          auVar92._16_4_ = fStack_830 * fVar111;
          auVar92._20_4_ = fStack_82c * fVar234;
          auVar92._24_4_ = fStack_828 * fVar237;
          auVar92._28_4_ = fStack_804;
          _local_880 = vsubps_avx(auVar92,auVar303);
          auVar273._0_4_ = auVar446._0_4_ + fVar394 * fVar254;
          auVar273._4_4_ = auVar446._4_4_ + fVar403 * fVar255;
          auVar273._8_4_ = auVar446._8_4_ + fVar404 * fVar256;
          auVar273._12_4_ = auVar446._12_4_ + fVar405 * fVar257;
          auVar273._16_4_ = auVar446._16_4_ + fVar406 * fVar260;
          auVar273._20_4_ = auVar446._20_4_ + fVar407 * fVar276;
          auVar273._24_4_ = auVar446._24_4_ + fVar408 * fVar278;
          auVar273._28_4_ = auVar446._28_4_ + fVar393 + 0.0;
          auVar93._4_4_ = (float)local_7e0._4_4_ * fVar205;
          auVar93._0_4_ = (float)local_7e0._0_4_ * fVar288;
          auVar93._8_4_ = fStack_7d8 * fVar232;
          auVar93._12_4_ = fStack_7d4 * fVar233;
          auVar93._16_4_ = fStack_7d0 * fVar111;
          auVar93._20_4_ = fStack_7cc * fVar234;
          auVar93._24_4_ = fStack_7c8 * fVar237;
          auVar93._28_4_ = local_880._28_4_;
          _local_8a0 = vsubps_avx(auVar93,auVar273);
          auVar366 = vcmpps_avx(auVar30,auVar366,5);
          auVar274._8_4_ = 0x7f800000;
          auVar274._0_8_ = 0x7f8000007f800000;
          auVar274._12_4_ = 0x7f800000;
          auVar274._16_4_ = 0x7f800000;
          auVar274._20_4_ = 0x7f800000;
          auVar274._24_4_ = 0x7f800000;
          auVar274._28_4_ = 0x7f800000;
          auVar271 = vblendvps_avx(auVar274,auVar87,auVar366);
          auVar385._8_4_ = 0x7fffffff;
          auVar385._0_8_ = 0x7fffffff7fffffff;
          auVar385._12_4_ = 0x7fffffff;
          auVar385._16_4_ = 0x7fffffff;
          auVar385._20_4_ = 0x7fffffff;
          auVar385._24_4_ = 0x7fffffff;
          auVar385._28_4_ = 0x7fffffff;
          auVar30 = vandps_avx(auVar385,local_380);
          auVar30 = vmaxps_avx(local_460,auVar30);
          auVar94._4_4_ = auVar30._4_4_ * 1.9073486e-06;
          auVar94._0_4_ = auVar30._0_4_ * 1.9073486e-06;
          auVar94._8_4_ = auVar30._8_4_ * 1.9073486e-06;
          auVar94._12_4_ = auVar30._12_4_ * 1.9073486e-06;
          auVar94._16_4_ = auVar30._16_4_ * 1.9073486e-06;
          auVar94._20_4_ = auVar30._20_4_ * 1.9073486e-06;
          auVar94._24_4_ = auVar30._24_4_ * 1.9073486e-06;
          auVar94._28_4_ = auVar30._28_4_;
          auVar30 = vandps_avx(auVar385,local_4e0);
          auVar30 = vcmpps_avx(auVar30,auVar94,1);
          auVar304._8_4_ = 0xff800000;
          auVar304._0_8_ = 0xff800000ff800000;
          auVar304._12_4_ = 0xff800000;
          auVar304._16_4_ = 0xff800000;
          auVar304._20_4_ = 0xff800000;
          auVar304._24_4_ = 0xff800000;
          auVar304._28_4_ = 0xff800000;
          auVar301 = vblendvps_avx(auVar304,auVar88,auVar366);
          auVar31 = auVar366 & auVar30;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0x7f,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0xbf,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar31[0x1f] < '\0') {
            auVar180 = vandps_avx(auVar30,auVar366);
            auVar263 = vpackssdw_avx(auVar180._0_16_,auVar180._16_16_);
            auVar431 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar31 = vcmpps_avx(local_8e0,auVar431,2);
            auVar443._8_4_ = 0xff800000;
            auVar443._0_8_ = 0xff800000ff800000;
            auVar443._12_4_ = 0xff800000;
            auVar443._16_4_ = 0xff800000;
            auVar443._20_4_ = 0xff800000;
            auVar443._24_4_ = 0xff800000;
            auVar443._28_4_ = 0xff800000;
            auVar448._8_4_ = 0x7f800000;
            auVar448._0_8_ = 0x7f8000007f800000;
            auVar448._12_4_ = 0x7f800000;
            auVar448._16_4_ = 0x7f800000;
            auVar448._20_4_ = 0x7f800000;
            auVar448._24_4_ = 0x7f800000;
            auVar448._28_4_ = 0x7f800000;
            auVar30 = vblendvps_avx(auVar448,auVar443,auVar31);
            auVar118 = vpmovsxwd_avx(auVar263);
            auVar263 = vpunpckhwd_avx(auVar263,auVar263);
            auVar386._16_16_ = auVar263;
            auVar386._0_16_ = auVar118;
            auVar271 = vblendvps_avx(auVar271,auVar30,auVar386);
            auVar30 = vblendvps_avx(auVar443,auVar448,auVar31);
            auVar301 = vblendvps_avx(auVar301,auVar30,auVar386);
            auVar30 = vcmpps_avx(auVar431,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar142._0_4_ = auVar30._0_4_ ^ auVar180._0_4_;
            auVar142._4_4_ = auVar30._4_4_ ^ auVar180._4_4_;
            auVar142._8_4_ = auVar30._8_4_ ^ auVar180._8_4_;
            auVar142._12_4_ = auVar30._12_4_ ^ auVar180._12_4_;
            auVar142._16_4_ = auVar30._16_4_ ^ auVar180._16_4_;
            auVar142._20_4_ = auVar30._20_4_ ^ auVar180._20_4_;
            auVar142._24_4_ = auVar30._24_4_ ^ auVar180._24_4_;
            auVar142._28_4_ = auVar30._28_4_ ^ auVar180._28_4_;
            auVar180 = vorps_avx(auVar31,auVar142);
            auVar180 = vandps_avx(auVar366,auVar180);
          }
          auVar222 = local_aa0._0_28_;
          local_a80 = auVar195;
        }
        _local_400 = _local_720;
        local_3e0 = vminps_avx(local_3a0,auVar271);
        _local_800 = vmaxps_avx(_local_720,auVar301);
        local_3c0 = _local_800;
        auVar30 = vcmpps_avx(_local_720,local_3e0,2);
        local_680 = vandps_avx(auVar125,auVar30);
        auVar30 = vcmpps_avx(_local_800,local_3a0,2);
        auVar125 = vandps_avx(auVar125,auVar30);
        auVar30 = vorps_avx(auVar125,local_680);
        if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0x7f,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0xbf,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar30[0x1f] < '\0') {
          local_9c0 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_6c0._0_4_ = auVar180._0_4_ ^ local_9c0._0_4_;
          local_6c0._4_4_ = auVar180._4_4_ ^ local_9c0._4_4_;
          local_6c0._8_4_ = auVar180._8_4_ ^ local_9c0._8_4_;
          local_6c0._12_4_ = auVar180._12_4_ ^ local_9c0._12_4_;
          local_6c0._16_4_ = auVar180._16_4_ ^ local_9c0._16_4_;
          local_6c0._20_4_ = auVar180._20_4_ ^ local_9c0._20_4_;
          local_6c0._24_4_ = auVar180._24_4_ ^ local_9c0._24_4_;
          local_6c0._28_4_ = (uint)auVar180._28_4_ ^ (uint)local_9c0._28_4_;
          auVar133._0_4_ =
               auVar195._0_4_ * (float)local_820._0_4_ +
               auVar222._0_4_ * (float)local_840._0_4_ + (float)local_7e0._0_4_ * auVar248._0_4_;
          auVar133._4_4_ =
               auVar195._4_4_ * (float)local_820._4_4_ +
               auVar222._4_4_ * (float)local_840._4_4_ + (float)local_7e0._4_4_ * auVar248._4_4_;
          auVar133._8_4_ =
               auVar195._8_4_ * fStack_818 +
               auVar222._8_4_ * fStack_838 + fStack_7d8 * auVar248._8_4_;
          auVar133._12_4_ =
               auVar195._12_4_ * fStack_814 +
               auVar222._12_4_ * fStack_834 + fStack_7d4 * auVar248._12_4_;
          auVar133._16_4_ =
               auVar195._16_4_ * fStack_810 +
               auVar222._16_4_ * fStack_830 + fStack_7d0 * auVar248._16_4_;
          auVar133._20_4_ =
               auVar195._20_4_ * fStack_80c +
               auVar222._20_4_ * fStack_82c + fStack_7cc * auVar248._20_4_;
          auVar133._24_4_ =
               auVar195._24_4_ * fStack_808 +
               auVar222._24_4_ * fStack_828 + fStack_7c8 * auVar248._24_4_;
          auVar133._28_4_ = auVar180._28_4_ + local_9c0._28_4_ + auVar195._28_4_;
          auVar175._8_4_ = 0x7fffffff;
          auVar175._0_8_ = 0x7fffffff7fffffff;
          auVar175._12_4_ = 0x7fffffff;
          auVar175._16_4_ = 0x7fffffff;
          auVar175._20_4_ = 0x7fffffff;
          auVar175._24_4_ = 0x7fffffff;
          auVar175._28_4_ = 0x7fffffff;
          auVar180 = vandps_avx(auVar133,auVar175);
          auVar176._8_4_ = 0x3e99999a;
          auVar176._0_8_ = 0x3e99999a3e99999a;
          auVar176._12_4_ = 0x3e99999a;
          auVar176._16_4_ = 0x3e99999a;
          auVar176._20_4_ = 0x3e99999a;
          auVar176._24_4_ = 0x3e99999a;
          auVar176._28_4_ = 0x3e99999a;
          auVar180 = vcmpps_avx(auVar180,auVar176,1);
          auVar180 = vorps_avx(auVar180,local_6c0);
          auVar177._8_4_ = 3;
          auVar177._0_8_ = 0x300000003;
          auVar177._12_4_ = 3;
          auVar177._16_4_ = 3;
          auVar177._20_4_ = 3;
          auVar177._24_4_ = 3;
          auVar177._28_4_ = 3;
          auVar197._8_4_ = 2;
          auVar197._0_8_ = 0x200000002;
          auVar197._12_4_ = 2;
          auVar197._16_4_ = 2;
          auVar197._20_4_ = 2;
          auVar197._24_4_ = 2;
          auVar197._28_4_ = 2;
          auVar180 = vblendvps_avx(auVar197,auVar177,auVar180);
          local_6e0 = ZEXT432(local_cc8);
          local_700 = vpshufd_avx(ZEXT416(local_cc8),0);
          auVar263 = vpcmpgtd_avx(auVar180._16_16_,local_700);
          auStack_6f0 = auVar32._16_16_;
          auVar118 = vpcmpgtd_avx(auVar180._0_16_,local_700);
          auVar178._16_16_ = auVar263;
          auVar178._0_16_ = auVar118;
          local_6a0 = vblendps_avx(ZEXT1632(auVar118),auVar178,0xf0);
          local_640 = vandnps_avx(local_6a0,local_680);
          auVar358 = ZEXT3264(local_640);
          auVar180 = local_680 & ~local_6a0;
          auVar305 = ZEXT3264(local_a60);
          if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar180 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar180 >> 0x7f,0) == '\0') &&
                (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar180 >> 0xbf,0) == '\0') &&
              (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar180[0x1f]) {
            auVar263 = vshufps_avx(auVar158,auVar158,0);
            auVar134._16_16_ = auVar263;
            auVar134._0_16_ = auVar263;
            auVar248 = local_820._0_28_;
          }
          else {
            local_960._4_4_ = (float)local_720._4_4_ + local_900._4_4_;
            local_960._0_4_ = (float)local_720._0_4_ + (float)local_900;
            fStack_958 = fStack_718 + (float)uStack_8f8;
            fStack_954 = fStack_714 + uStack_8f8._4_4_;
            fStack_950 = fStack_710 + (float)uStack_8f0;
            fStack_94c = fStack_70c + uStack_8f0._4_4_;
            fStack_948 = fStack_708 + (float)uStack_8e8;
            fStack_944 = fStack_704 + uStack_8e8._4_4_;
            local_740 = auVar125;
            do {
              auVar135._8_4_ = 0x7f800000;
              auVar135._0_8_ = 0x7f8000007f800000;
              auVar135._12_4_ = 0x7f800000;
              auVar135._16_4_ = 0x7f800000;
              auVar135._20_4_ = 0x7f800000;
              auVar135._24_4_ = 0x7f800000;
              auVar135._28_4_ = 0x7f800000;
              auVar125 = auVar358._0_32_;
              auVar180 = vblendvps_avx(auVar135,_local_720,auVar125);
              auVar30 = vshufps_avx(auVar180,auVar180,0xb1);
              auVar30 = vminps_avx(auVar180,auVar30);
              auVar366 = vshufpd_avx(auVar30,auVar30,5);
              auVar30 = vminps_avx(auVar30,auVar366);
              auVar366 = vperm2f128_avx(auVar30,auVar30,1);
              auVar30 = vminps_avx(auVar30,auVar366);
              auVar180 = vcmpps_avx(auVar180,auVar30,0);
              auVar30 = auVar125 & auVar180;
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar125 = vandps_avx(auVar180,auVar125);
              }
              uVar99 = vmovmskps_avx(auVar125);
              uVar102 = 0;
              if (uVar99 != 0) {
                for (; (uVar99 >> uVar102 & 1) == 0; uVar102 = uVar102 + 1) {
                }
              }
              uVar101 = (ulong)uVar102;
              *(undefined4 *)(local_640 + uVar101 * 4) = 0;
              fVar288 = local_1a0[uVar101];
              uVar102 = *(uint *)(local_400 + uVar101 * 4);
              fVar231 = auVar157._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar231 = sqrtf((float)local_980._0_4_);
              }
              auVar158 = vminps_avx(_local_ae0,_local_b00);
              auVar263 = vmaxps_avx(_local_ae0,_local_b00);
              auVar118 = vminps_avx(_local_af0,_local_b10);
              auVar122 = vminps_avx(auVar158,auVar118);
              auVar158 = vmaxps_avx(_local_af0,_local_b10);
              auVar118 = vmaxps_avx(auVar263,auVar158);
              auVar209._8_4_ = 0x7fffffff;
              auVar209._0_8_ = 0x7fffffff7fffffff;
              auVar209._12_4_ = 0x7fffffff;
              auVar263 = vandps_avx(auVar122,auVar209);
              auVar158 = vandps_avx(auVar118,auVar209);
              auVar263 = vmaxps_avx(auVar263,auVar158);
              auVar158 = vmovshdup_avx(auVar263);
              auVar158 = vmaxss_avx(auVar158,auVar263);
              auVar263 = vshufpd_avx(auVar263,auVar263,1);
              auVar263 = vmaxss_avx(auVar263,auVar158);
              fVar112 = auVar263._0_4_ * 1.9073486e-06;
              local_760._0_4_ = fVar231 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar118,auVar118,0xff);
              auVar263 = vinsertps_avx(ZEXT416(uVar102),ZEXT416((uint)fVar288),0x10);
              lVar106 = 5;
              do {
                auVar158 = vmovshdup_avx(auVar263);
                fVar257 = auVar158._0_4_;
                fVar233 = 1.0 - fVar257;
                auVar158 = vshufps_avx(auVar263,auVar263,0x55);
                fVar288 = auVar158._0_4_;
                fVar231 = auVar158._4_4_;
                fVar205 = auVar158._8_4_;
                fVar232 = auVar158._12_4_;
                auVar158 = vshufps_avx(ZEXT416((uint)fVar233),ZEXT416((uint)fVar233),0);
                fVar111 = auVar158._0_4_;
                fVar234 = auVar158._4_4_;
                fVar235 = auVar158._8_4_;
                fVar236 = auVar158._12_4_;
                fVar237 = (float)local_af0._0_4_ * fVar288 + (float)local_b00._0_4_ * fVar111;
                fVar254 = (float)local_af0._4_4_ * fVar231 + (float)local_b00._4_4_ * fVar234;
                fVar255 = fStack_ae8 * fVar205 + fStack_af8 * fVar235;
                fVar256 = fStack_ae4 * fVar232 + fStack_af4 * fVar236;
                auVar264._0_4_ =
                     fVar111 * ((float)local_b00._0_4_ * fVar288 + fVar111 * (float)local_ae0._0_4_)
                     + fVar288 * fVar237;
                auVar264._4_4_ =
                     fVar234 * ((float)local_b00._4_4_ * fVar231 + fVar234 * (float)local_ae0._4_4_)
                     + fVar231 * fVar254;
                auVar264._8_4_ =
                     fVar235 * (fStack_af8 * fVar205 + fVar235 * fStack_ad8) + fVar205 * fVar255;
                auVar264._12_4_ =
                     fVar236 * (fStack_af4 * fVar232 + fVar236 * fStack_ad4) + fVar232 * fVar256;
                auVar210._0_4_ =
                     fVar111 * fVar237 +
                     fVar288 * (fVar288 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar111)
                ;
                auVar210._4_4_ =
                     fVar234 * fVar254 +
                     fVar231 * (fVar231 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar234)
                ;
                auVar210._8_4_ =
                     fVar235 * fVar255 + fVar205 * (fVar205 * fStack_b08 + fStack_ae8 * fVar235);
                auVar210._12_4_ =
                     fVar236 * fVar256 + fVar232 * (fVar232 * fStack_b04 + fStack_ae4 * fVar236);
                auVar158 = vshufps_avx(auVar263,auVar263,0);
                auVar159._0_4_ = auVar158._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar159._4_4_ = auVar158._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar159._8_4_ = auVar158._8_4_ * fStack_968 + 0.0;
                auVar159._12_4_ = auVar158._12_4_ * fStack_964 + 0.0;
                auVar117._0_4_ = fVar111 * auVar264._0_4_ + fVar288 * auVar210._0_4_;
                auVar117._4_4_ = fVar234 * auVar264._4_4_ + fVar231 * auVar210._4_4_;
                auVar117._8_4_ = fVar235 * auVar264._8_4_ + fVar205 * auVar210._8_4_;
                auVar117._12_4_ = fVar236 * auVar264._12_4_ + fVar232 * auVar210._12_4_;
                local_8e0._0_16_ = auVar117;
                auVar158 = vsubps_avx(auVar159,auVar117);
                _local_aa0 = auVar158;
                auVar158 = vdpps_avx(auVar158,auVar158,0x7f);
                local_a80._0_16_ = auVar158;
                if (auVar158._0_4_ < 0.0) {
                  fVar288 = sqrtf(auVar158._0_4_);
                }
                else {
                  auVar158 = vsqrtss_avx(auVar158,auVar158);
                  fVar288 = auVar158._0_4_;
                }
                auVar158 = vsubps_avx(auVar210,auVar264);
                auVar293._0_4_ = auVar158._0_4_ * 3.0;
                auVar293._4_4_ = auVar158._4_4_ * 3.0;
                auVar293._8_4_ = auVar158._8_4_ * 3.0;
                auVar293._12_4_ = auVar158._12_4_ * 3.0;
                auVar158 = vshufps_avx(ZEXT416((uint)(fVar257 * 6.0)),ZEXT416((uint)(fVar257 * 6.0))
                                       ,0);
                auVar118 = ZEXT416((uint)((fVar233 - (fVar257 + fVar257)) * 6.0));
                auVar122 = vshufps_avx(auVar118,auVar118,0);
                auVar118 = ZEXT416((uint)((fVar257 - (fVar233 + fVar233)) * 6.0));
                auVar188 = vshufps_avx(auVar118,auVar118,0);
                auVar217 = vshufps_avx(ZEXT416((uint)(fVar233 * 6.0)),ZEXT416((uint)(fVar233 * 6.0))
                                       ,0);
                auVar118 = vdpps_avx(auVar293,auVar293,0x7f);
                auVar160._0_4_ =
                     auVar217._0_4_ * (float)local_ae0._0_4_ +
                     auVar188._0_4_ * (float)local_b00._0_4_ +
                     auVar158._0_4_ * (float)local_b10._0_4_ +
                     auVar122._0_4_ * (float)local_af0._0_4_;
                auVar160._4_4_ =
                     auVar217._4_4_ * (float)local_ae0._4_4_ +
                     auVar188._4_4_ * (float)local_b00._4_4_ +
                     auVar158._4_4_ * (float)local_b10._4_4_ +
                     auVar122._4_4_ * (float)local_af0._4_4_;
                auVar160._8_4_ =
                     auVar217._8_4_ * fStack_ad8 +
                     auVar188._8_4_ * fStack_af8 +
                     auVar158._8_4_ * fStack_b08 + auVar122._8_4_ * fStack_ae8;
                auVar160._12_4_ =
                     auVar217._12_4_ * fStack_ad4 +
                     auVar188._12_4_ * fStack_af4 +
                     auVar158._12_4_ * fStack_b04 + auVar122._12_4_ * fStack_ae4;
                auVar158 = vblendps_avx(auVar118,_DAT_01f7aa10,0xe);
                auVar122 = vrsqrtss_avx(auVar158,auVar158);
                fVar205 = auVar122._0_4_;
                fVar231 = auVar118._0_4_;
                auVar122 = vdpps_avx(auVar293,auVar160,0x7f);
                auVar188 = vshufps_avx(auVar118,auVar118,0);
                auVar161._0_4_ = auVar160._0_4_ * auVar188._0_4_;
                auVar161._4_4_ = auVar160._4_4_ * auVar188._4_4_;
                auVar161._8_4_ = auVar160._8_4_ * auVar188._8_4_;
                auVar161._12_4_ = auVar160._12_4_ * auVar188._12_4_;
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar240._0_4_ = auVar293._0_4_ * auVar122._0_4_;
                auVar240._4_4_ = auVar293._4_4_ * auVar122._4_4_;
                auVar240._8_4_ = auVar293._8_4_ * auVar122._8_4_;
                auVar240._12_4_ = auVar293._12_4_ * auVar122._12_4_;
                auVar217 = vsubps_avx(auVar161,auVar240);
                auVar122 = vrcpss_avx(auVar158,auVar158);
                auVar158 = vmaxss_avx(ZEXT416((uint)fVar112),
                                      ZEXT416((uint)(auVar263._0_4_ * (float)local_760._0_4_)));
                auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - fVar231 * auVar122._0_4_)));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                uVar101 = CONCAT44(auVar293._4_4_,auVar293._0_4_);
                auVar345._0_8_ = uVar101 ^ 0x8000000080000000;
                auVar345._8_4_ = -auVar293._8_4_;
                auVar345._12_4_ = -auVar293._12_4_;
                auVar188 = ZEXT416((uint)(fVar205 * 1.5 +
                                         fVar231 * -0.5 * fVar205 * fVar205 * fVar205));
                auVar188 = vshufps_avx(auVar188,auVar188,0);
                auVar211._0_4_ = auVar188._0_4_ * auVar217._0_4_ * auVar122._0_4_;
                auVar211._4_4_ = auVar188._4_4_ * auVar217._4_4_ * auVar122._4_4_;
                auVar211._8_4_ = auVar188._8_4_ * auVar217._8_4_ * auVar122._8_4_;
                auVar211._12_4_ = auVar188._12_4_ * auVar217._12_4_ * auVar122._12_4_;
                local_9a0._0_4_ = auVar293._0_4_ * auVar188._0_4_;
                local_9a0._4_4_ = auVar293._4_4_ * auVar188._4_4_;
                local_9a0._8_4_ = auVar293._8_4_ * auVar188._8_4_;
                local_9a0._12_4_ = auVar293._12_4_ * auVar188._12_4_;
                if (fVar231 < 0.0) {
                  fVar231 = sqrtf(fVar231);
                }
                else {
                  auVar118 = vsqrtss_avx(auVar118,auVar118);
                  fVar231 = auVar118._0_4_;
                }
                auVar118 = vdpps_avx(_local_aa0,local_9a0._0_16_,0x7f);
                fVar288 = (fVar112 / fVar231) * (fVar288 + 1.0) + fVar288 * fVar112 + auVar158._0_4_
                ;
                auVar122 = vdpps_avx(auVar345,local_9a0._0_16_,0x7f);
                auVar188 = vdpps_avx(_local_aa0,auVar211,0x7f);
                auVar217 = vdpps_avx(_local_970,local_9a0._0_16_,0x7f);
                auVar12 = vdpps_avx(_local_aa0,auVar345,0x7f);
                fVar231 = auVar122._0_4_ + auVar188._0_4_;
                fVar205 = auVar118._0_4_;
                auVar119._0_4_ = fVar205 * fVar205;
                auVar119._4_4_ = auVar118._4_4_ * auVar118._4_4_;
                auVar119._8_4_ = auVar118._8_4_ * auVar118._8_4_;
                auVar119._12_4_ = auVar118._12_4_ * auVar118._12_4_;
                auVar188 = vsubps_avx(local_a80._0_16_,auVar119);
                local_9a0._0_16_ = ZEXT416((uint)fVar231);
                auVar122 = vdpps_avx(_local_aa0,_local_970,0x7f);
                fVar232 = auVar12._0_4_ - fVar205 * fVar231;
                fVar205 = auVar122._0_4_ - fVar205 * auVar217._0_4_;
                auVar122 = vrsqrtss_avx(auVar188,auVar188);
                fVar233 = auVar188._0_4_;
                fVar231 = auVar122._0_4_;
                fVar231 = fVar231 * 1.5 + fVar233 * -0.5 * fVar231 * fVar231 * fVar231;
                if (fVar233 < 0.0) {
                  local_940._0_4_ = fVar232;
                  local_780._0_4_ = fVar205;
                  local_7a0._0_4_ = fVar231;
                  fVar233 = sqrtf(fVar233);
                  fVar231 = (float)local_7a0._0_4_;
                  fVar232 = (float)local_940._0_4_;
                  fVar205 = (float)local_780._0_4_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar188,auVar188);
                  fVar233 = auVar122._0_4_;
                }
                auVar12 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar13 = vshufps_avx(auVar293,auVar293,0xff);
                fVar232 = fVar232 * fVar231 - auVar13._0_4_;
                auVar241._0_8_ = auVar217._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = auVar217._8_4_ ^ 0x80000000;
                auVar241._12_4_ = auVar217._12_4_ ^ 0x80000000;
                auVar265._0_4_ = -fVar232;
                auVar265._4_4_ = 0x80000000;
                auVar265._8_4_ = 0x80000000;
                auVar265._12_4_ = 0x80000000;
                auVar122 = vinsertps_avx(auVar265,ZEXT416((uint)(fVar205 * fVar231)),0x1c);
                auVar217 = vmovsldup_avx(ZEXT416((uint)(local_9a0._0_4_ * fVar205 * fVar231 -
                                                       auVar217._0_4_ * fVar232)));
                auVar122 = vdivps_avx(auVar122,auVar217);
                auVar188 = vinsertps_avx(local_9a0._0_16_,auVar241,0x10);
                auVar188 = vdivps_avx(auVar188,auVar217);
                auVar217 = vmovsldup_avx(auVar118);
                auVar120 = ZEXT416((uint)(fVar233 - auVar12._0_4_));
                auVar12 = vmovsldup_avx(auVar120);
                auVar186._0_4_ = auVar217._0_4_ * auVar122._0_4_ + auVar12._0_4_ * auVar188._0_4_;
                auVar186._4_4_ = auVar217._4_4_ * auVar122._4_4_ + auVar12._4_4_ * auVar188._4_4_;
                auVar186._8_4_ = auVar217._8_4_ * auVar122._8_4_ + auVar12._8_4_ * auVar188._8_4_;
                auVar186._12_4_ =
                     auVar217._12_4_ * auVar122._12_4_ + auVar12._12_4_ * auVar188._12_4_;
                auVar263 = vsubps_avx(auVar263,auVar186);
                auVar187._8_4_ = 0x7fffffff;
                auVar187._0_8_ = 0x7fffffff7fffffff;
                auVar187._12_4_ = 0x7fffffff;
                auVar118 = vandps_avx(auVar118,auVar187);
                if (auVar118._0_4_ < fVar288) {
                  auVar212._8_4_ = 0x7fffffff;
                  auVar212._0_8_ = 0x7fffffff7fffffff;
                  auVar212._12_4_ = 0x7fffffff;
                  auVar118 = vandps_avx(auVar120,auVar212);
                  if (auVar118._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + fVar288 + auVar158._0_4_) {
                    fVar288 = auVar263._0_4_ + (float)local_8c0._0_4_;
                    auVar305 = ZEXT3264(local_a60);
                    if ((fVar288 < fVar206) ||
                       (fVar231 = *(float *)(ray + k * 4 + 0x100), fVar231 < fVar288)) break;
                    auVar158 = vmovshdup_avx(auVar263);
                    fVar112 = auVar158._0_4_;
                    if ((fVar112 < 0.0) || (1.0 < fVar112)) break;
                    auVar158 = vrsqrtss_avx(local_a80._0_16_,local_a80._0_16_);
                    fVar205 = auVar158._0_4_;
                    pGVar24 = (context->scene->geometries).items[uVar104].ptr;
                    if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar158 = ZEXT416((uint)(fVar205 * 1.5 +
                                             local_a80._0_4_ * -0.5 * fVar205 * fVar205 * fVar205));
                    auVar158 = vshufps_avx(auVar158,auVar158,0);
                    auVar213._0_4_ = auVar158._0_4_ * (float)local_aa0._0_4_;
                    auVar213._4_4_ = auVar158._4_4_ * (float)local_aa0._4_4_;
                    auVar213._8_4_ = auVar158._8_4_ * fStack_a98;
                    auVar213._12_4_ = auVar158._12_4_ * fStack_a94;
                    auVar162._0_4_ = auVar293._0_4_ + auVar13._0_4_ * auVar213._0_4_;
                    auVar162._4_4_ = auVar293._4_4_ + auVar13._4_4_ * auVar213._4_4_;
                    auVar162._8_4_ = auVar293._8_4_ + auVar13._8_4_ * auVar213._8_4_;
                    auVar162._12_4_ = auVar293._12_4_ + auVar13._12_4_ * auVar213._12_4_;
                    auVar158 = vshufps_avx(auVar213,auVar213,0xc9);
                    auVar118 = vshufps_avx(auVar293,auVar293,0xc9);
                    auVar214._0_4_ = auVar118._0_4_ * auVar213._0_4_;
                    auVar214._4_4_ = auVar118._4_4_ * auVar213._4_4_;
                    auVar214._8_4_ = auVar118._8_4_ * auVar213._8_4_;
                    auVar214._12_4_ = auVar118._12_4_ * auVar213._12_4_;
                    auVar242._0_4_ = auVar293._0_4_ * auVar158._0_4_;
                    auVar242._4_4_ = auVar293._4_4_ * auVar158._4_4_;
                    auVar242._8_4_ = auVar293._8_4_ * auVar158._8_4_;
                    auVar242._12_4_ = auVar293._12_4_ * auVar158._12_4_;
                    auVar122 = vsubps_avx(auVar242,auVar214);
                    auVar158 = vshufps_avx(auVar122,auVar122,0xc9);
                    auVar118 = vshufps_avx(auVar162,auVar162,0xc9);
                    auVar243._0_4_ = auVar118._0_4_ * auVar158._0_4_;
                    auVar243._4_4_ = auVar118._4_4_ * auVar158._4_4_;
                    auVar243._8_4_ = auVar118._8_4_ * auVar158._8_4_;
                    auVar243._12_4_ = auVar118._12_4_ * auVar158._12_4_;
                    auVar158 = vshufps_avx(auVar122,auVar122,0xd2);
                    auVar163._0_4_ = auVar162._0_4_ * auVar158._0_4_;
                    auVar163._4_4_ = auVar162._4_4_ * auVar158._4_4_;
                    auVar163._8_4_ = auVar162._8_4_ * auVar158._8_4_;
                    auVar163._12_4_ = auVar162._12_4_ * auVar158._12_4_;
                    auVar158 = vsubps_avx(auVar243,auVar163);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar288;
                      uVar9 = vextractps_avx(auVar158,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                      uVar9 = vextractps_avx(auVar158,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar158._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar112;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_920;
                      *(uint *)(ray + k * 4 + 0x240) = uVar104;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar29 = context->user;
                    auStack_590 = vshufps_avx(auVar263,auVar263,0x55);
                    auStack_5f0 = vshufps_avx(auVar158,auVar158,0x55);
                    auStack_5d0 = vshufps_avx(auVar158,auVar158,0xaa);
                    auStack_5b0 = vshufps_avx(auVar158,auVar158,0);
                    local_600 = (RTCHitN  [16])auStack_5f0;
                    local_5e0 = auStack_5d0;
                    local_5c0 = auStack_5b0;
                    local_5a0 = auStack_590;
                    local_580 = ZEXT832(0) << 0x20;
                    local_560 = local_4a0._0_8_;
                    uStack_558 = local_4a0._8_8_;
                    uStack_550 = local_4a0._16_8_;
                    uStack_548 = local_4a0._24_8_;
                    local_540 = local_480._0_8_;
                    uStack_538 = local_480._8_8_;
                    uStack_530 = local_480._16_8_;
                    uStack_528 = local_480._24_8_;
                    *(undefined8 *)(local_9c8 + 8) = local_9c0._0_8_;
                    *(undefined8 *)(local_9c8 + 10) = local_9c0._8_8_;
                    *(undefined8 *)(local_9c8 + 0xc) = local_9c0._16_8_;
                    *(undefined8 *)(local_9c8 + 0xe) = local_9c0._24_8_;
                    *(undefined8 *)local_9c8 = local_9c0._0_8_;
                    *(undefined8 *)(local_9c8 + 2) = local_9c0._8_8_;
                    *(undefined8 *)(local_9c8 + 4) = local_9c0._16_8_;
                    *(undefined8 *)(local_9c8 + 6) = local_9c0._24_8_;
                    local_520 = pRVar29->instID[0];
                    uStack_51c = local_520;
                    uStack_518 = local_520;
                    uStack_514 = local_520;
                    uStack_510 = local_520;
                    uStack_50c = local_520;
                    uStack_508 = local_520;
                    uStack_504 = local_520;
                    local_500 = pRVar29->instPrimID[0];
                    uStack_4fc = local_500;
                    uStack_4f8 = local_500;
                    uStack_4f4 = local_500;
                    uStack_4f0 = local_500;
                    uStack_4ec = local_500;
                    uStack_4e8 = local_500;
                    uStack_4e4 = local_500;
                    *(float *)(ray + k * 4 + 0x100) = fVar288;
                    local_b40 = *local_9d0;
                    local_b30 = *local_9d8;
                    local_ad0.valid = (int *)local_b40;
                    local_ad0.geometryUserPtr = pGVar24->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_600;
                    local_ad0.N = 8;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar24->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar24->intersectionFilterN)(&local_ad0);
                      auVar305 = ZEXT3264(local_a60);
                    }
                    auVar263 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                    auVar158 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                    auVar198._16_16_ = auVar158;
                    auVar198._0_16_ = auVar263;
                    auVar125 = local_9c0 & ~auVar198;
                    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar125 >> 0x7f,0) != '\0') ||
                          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar125 >> 0xbf,0) != '\0') ||
                        (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar125[0x1f] < '\0') {
                      p_Var28 = context->args->filter;
                      if ((p_Var28 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var28)(&local_ad0);
                        auVar305 = ZEXT3264(local_a60);
                      }
                      auVar263 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                      auVar158 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                      auVar136._16_16_ = auVar158;
                      auVar136._0_16_ = auVar263;
                      auVar125 = local_9c0 & ~auVar136;
                      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar125 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar125 >> 0x7f,0) != '\0') ||
                            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar125 >> 0xbf,0) != '\0') ||
                          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar125[0x1f] < '\0') {
                        auVar137._0_4_ = auVar263._0_4_ ^ local_9c0._0_4_;
                        auVar137._4_4_ = auVar263._4_4_ ^ local_9c0._4_4_;
                        auVar137._8_4_ = auVar263._8_4_ ^ local_9c0._8_4_;
                        auVar137._12_4_ = auVar263._12_4_ ^ local_9c0._12_4_;
                        auVar137._16_4_ = auVar158._0_4_ ^ local_9c0._16_4_;
                        auVar137._20_4_ = auVar158._4_4_ ^ local_9c0._20_4_;
                        auVar137._24_4_ = auVar158._8_4_ ^ local_9c0._24_4_;
                        auVar137._28_4_ = auVar158._12_4_ ^ local_9c0._28_4_;
                        auVar125 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])local_ad0.hit);
                        *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x20));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x40));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x60));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x80));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x100));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar125;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar231;
                    break;
                  }
                }
                lVar106 = lVar106 + -1;
                auVar305 = ZEXT3264(local_a60);
              } while (lVar106 != 0);
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar134._4_4_ = uVar9;
              auVar134._0_4_ = uVar9;
              auVar134._8_4_ = uVar9;
              auVar134._12_4_ = uVar9;
              auVar134._16_4_ = uVar9;
              auVar134._20_4_ = uVar9;
              auVar134._24_4_ = uVar9;
              auVar134._28_4_ = uVar9;
              auVar180 = vcmpps_avx(_local_960,auVar134,2);
              auVar125 = vandps_avx(auVar180,local_640);
              auVar358 = ZEXT3264(auVar125);
              auVar180 = local_640 & auVar180;
              auVar248 = local_820._0_28_;
              local_640 = auVar125;
            } while ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar180 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar180 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar180 >> 0x7f,0) != '\0') ||
                       (auVar180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar180 >> 0xbf,0) != '\0') ||
                     (auVar180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar180[0x1f] < '\0');
            auVar358 = ZEXT3264(local_3c0);
            auVar125 = local_740;
          }
          auVar179._0_4_ =
               auVar248._0_4_ * (float)local_860._0_4_ +
               (float)local_840._0_4_ * (float)local_880._0_4_ +
               (float)local_7e0._0_4_ * (float)local_8a0._0_4_;
          auVar179._4_4_ =
               auVar248._4_4_ * (float)local_860._4_4_ +
               (float)local_840._4_4_ * (float)local_880._4_4_ +
               (float)local_7e0._4_4_ * (float)local_8a0._4_4_;
          auVar179._8_4_ =
               auVar248._8_4_ * fStack_858 + fStack_838 * fStack_878 + fStack_7d8 * fStack_898;
          auVar179._12_4_ =
               auVar248._12_4_ * fStack_854 + fStack_834 * fStack_874 + fStack_7d4 * fStack_894;
          auVar179._16_4_ =
               auVar248._16_4_ * fStack_850 + fStack_830 * fStack_870 + fStack_7d0 * fStack_890;
          auVar179._20_4_ =
               auVar248._20_4_ * fStack_84c + fStack_82c * fStack_86c + fStack_7cc * fStack_88c;
          auVar179._24_4_ =
               auVar248._24_4_ * fStack_848 + fStack_828 * fStack_868 + fStack_7c8 * fStack_888;
          auVar179._28_4_ = fStack_824 + fStack_824 + auVar358._28_4_;
          auVar199._8_4_ = 0x7fffffff;
          auVar199._0_8_ = 0x7fffffff7fffffff;
          auVar199._12_4_ = 0x7fffffff;
          auVar199._16_4_ = 0x7fffffff;
          auVar199._20_4_ = 0x7fffffff;
          auVar199._24_4_ = 0x7fffffff;
          auVar199._28_4_ = 0x7fffffff;
          auVar180 = vandps_avx(auVar179,auVar199);
          auVar200._8_4_ = 0x3e99999a;
          auVar200._0_8_ = 0x3e99999a3e99999a;
          auVar200._12_4_ = 0x3e99999a;
          auVar200._16_4_ = 0x3e99999a;
          auVar200._20_4_ = 0x3e99999a;
          auVar200._24_4_ = 0x3e99999a;
          auVar200._28_4_ = 0x3e99999a;
          auVar180 = vcmpps_avx(auVar180,auVar200,1);
          auVar30 = vorps_avx(auVar180,local_6c0);
          auVar201._0_4_ = (float)local_800._0_4_ + (float)local_900;
          auVar201._4_4_ = (float)local_800._4_4_ + local_900._4_4_;
          auVar201._8_4_ = fStack_7f8 + (float)uStack_8f8;
          auVar201._12_4_ = fStack_7f4 + uStack_8f8._4_4_;
          auVar201._16_4_ = fStack_7f0 + (float)uStack_8f0;
          auVar201._20_4_ = fStack_7ec + uStack_8f0._4_4_;
          auVar201._24_4_ = fStack_7e8 + (float)uStack_8e8;
          auVar201._28_4_ = fStack_7e4 + uStack_8e8._4_4_;
          auVar180 = vcmpps_avx(auVar201,auVar134,2);
          _local_8a0 = vandps_avx(auVar125,auVar180);
          auVar202._8_4_ = 3;
          auVar202._0_8_ = 0x300000003;
          auVar202._12_4_ = 3;
          auVar202._16_4_ = 3;
          auVar202._20_4_ = 3;
          auVar202._24_4_ = 3;
          auVar202._28_4_ = 3;
          auVar230._8_4_ = 2;
          auVar230._0_8_ = 0x200000002;
          auVar230._12_4_ = 2;
          auVar230._16_4_ = 2;
          auVar230._20_4_ = 2;
          auVar230._24_4_ = 2;
          auVar230._28_4_ = 2;
          auVar125 = vblendvps_avx(auVar230,auVar202,auVar30);
          auVar263 = vpcmpgtd_avx(auVar125._16_16_,local_700);
          auVar158 = vpshufd_avx(local_6e0._0_16_,0);
          auVar158 = vpcmpgtd_avx(auVar125._0_16_,auVar158);
          auVar203._16_16_ = auVar263;
          auVar203._0_16_ = auVar134._0_16_;
          _local_880 = vblendps_avx(ZEXT1632(auVar158),auVar203,0xf0);
          auVar125 = vandnps_avx(_local_880,_local_8a0);
          auVar180 = _local_8a0 & ~_local_880;
          local_660 = auVar125;
          if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar180 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar180 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar180 >> 0x7f,0) != '\0') ||
                (auVar180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar180 >> 0xbf,0) != '\0') ||
              (auVar180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar180[0x1f] < '\0') {
            local_860._4_4_ = local_900._4_4_ + local_3c0._4_4_;
            local_860._0_4_ = (float)local_900 + local_3c0._0_4_;
            fStack_858 = (float)uStack_8f8 + local_3c0._8_4_;
            fStack_854 = uStack_8f8._4_4_ + local_3c0._12_4_;
            fStack_850 = (float)uStack_8f0 + local_3c0._16_4_;
            fStack_84c = uStack_8f0._4_4_ + local_3c0._20_4_;
            fStack_848 = (float)uStack_8e8 + local_3c0._24_4_;
            fStack_844 = uStack_8e8._4_4_ + local_3c0._28_4_;
            _local_960 = local_3c0;
            do {
              auVar138._8_4_ = 0x7f800000;
              auVar138._0_8_ = 0x7f8000007f800000;
              auVar138._12_4_ = 0x7f800000;
              auVar138._16_4_ = 0x7f800000;
              auVar138._20_4_ = 0x7f800000;
              auVar138._24_4_ = 0x7f800000;
              auVar138._28_4_ = 0x7f800000;
              auVar180 = vblendvps_avx(auVar138,_local_960,auVar125);
              auVar30 = vshufps_avx(auVar180,auVar180,0xb1);
              auVar30 = vminps_avx(auVar180,auVar30);
              auVar366 = vshufpd_avx(auVar30,auVar30,5);
              auVar30 = vminps_avx(auVar30,auVar366);
              auVar366 = vperm2f128_avx(auVar30,auVar30,1);
              auVar30 = vminps_avx(auVar30,auVar366);
              auVar30 = vcmpps_avx(auVar180,auVar30,0);
              auVar366 = auVar125 & auVar30;
              auVar180 = auVar125;
              if ((((((((auVar366 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar366 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar366 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar366 >> 0x7f,0) != '\0') ||
                    (auVar366 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar366 >> 0xbf,0) != '\0') ||
                  (auVar366 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar366[0x1f] < '\0') {
                auVar180 = vandps_avx(auVar30,auVar125);
              }
              uVar99 = vmovmskps_avx(auVar180);
              uVar102 = 0;
              if (uVar99 != 0) {
                for (; (uVar99 >> uVar102 & 1) == 0; uVar102 = uVar102 + 1) {
                }
              }
              uVar101 = (ulong)uVar102;
              local_660 = auVar125;
              *(undefined4 *)(local_660 + uVar101 * 4) = 0;
              fVar288 = local_1c0[uVar101];
              uVar102 = *(uint *)(local_3a0 + uVar101 * 4);
              fVar231 = auVar42._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar231 = sqrtf((float)local_980._0_4_);
              }
              auVar158 = vminps_avx(_local_ae0,_local_b00);
              auVar263 = vmaxps_avx(_local_ae0,_local_b00);
              auVar118 = vminps_avx(_local_af0,_local_b10);
              auVar122 = vminps_avx(auVar158,auVar118);
              auVar158 = vmaxps_avx(_local_af0,_local_b10);
              auVar118 = vmaxps_avx(auVar263,auVar158);
              auVar215._8_4_ = 0x7fffffff;
              auVar215._0_8_ = 0x7fffffff7fffffff;
              auVar215._12_4_ = 0x7fffffff;
              auVar263 = vandps_avx(auVar122,auVar215);
              auVar158 = vandps_avx(auVar118,auVar215);
              auVar263 = vmaxps_avx(auVar263,auVar158);
              auVar158 = vmovshdup_avx(auVar263);
              auVar158 = vmaxss_avx(auVar158,auVar263);
              auVar263 = vshufpd_avx(auVar263,auVar263,1);
              auVar263 = vmaxss_avx(auVar263,auVar158);
              local_a80._0_4_ = auVar263._0_4_ * 1.9073486e-06;
              local_760._0_4_ = fVar231 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar118,auVar118,0xff);
              auVar263 = vinsertps_avx(ZEXT416(uVar102),ZEXT416((uint)fVar288),0x10);
              lVar106 = 5;
              do {
                auVar158 = vmovshdup_avx(auVar263);
                fVar256 = auVar158._0_4_;
                fVar232 = 1.0 - fVar256;
                auVar158 = vshufps_avx(auVar263,auVar263,0x55);
                fVar288 = auVar158._0_4_;
                fVar231 = auVar158._4_4_;
                fVar112 = auVar158._8_4_;
                fVar205 = auVar158._12_4_;
                auVar158 = vshufps_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar232),0);
                fVar233 = auVar158._0_4_;
                fVar111 = auVar158._4_4_;
                fVar234 = auVar158._8_4_;
                fVar235 = auVar158._12_4_;
                fVar236 = (float)local_af0._0_4_ * fVar288 + (float)local_b00._0_4_ * fVar233;
                fVar237 = (float)local_af0._4_4_ * fVar231 + (float)local_b00._4_4_ * fVar111;
                fVar254 = fStack_ae8 * fVar112 + fStack_af8 * fVar234;
                fVar255 = fStack_ae4 * fVar205 + fStack_af4 * fVar235;
                auVar266._0_4_ =
                     fVar233 * ((float)local_b00._0_4_ * fVar288 + fVar233 * (float)local_ae0._0_4_)
                     + fVar288 * fVar236;
                auVar266._4_4_ =
                     fVar111 * ((float)local_b00._4_4_ * fVar231 + fVar111 * (float)local_ae0._4_4_)
                     + fVar231 * fVar237;
                auVar266._8_4_ =
                     fVar234 * (fStack_af8 * fVar112 + fVar234 * fStack_ad8) + fVar112 * fVar254;
                auVar266._12_4_ =
                     fVar235 * (fStack_af4 * fVar205 + fVar235 * fStack_ad4) + fVar205 * fVar255;
                auVar216._0_4_ =
                     fVar233 * fVar236 +
                     fVar288 * (fVar288 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar233)
                ;
                auVar216._4_4_ =
                     fVar111 * fVar237 +
                     fVar231 * (fVar231 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar111)
                ;
                auVar216._8_4_ =
                     fVar234 * fVar254 + fVar112 * (fVar112 * fStack_b08 + fStack_ae8 * fVar234);
                auVar216._12_4_ =
                     fVar235 * fVar255 + fVar205 * (fVar205 * fStack_b04 + fStack_ae4 * fVar235);
                auVar158 = vshufps_avx(auVar263,auVar263,0);
                auVar164._0_4_ = auVar158._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar164._4_4_ = auVar158._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar164._8_4_ = auVar158._8_4_ * fStack_968 + 0.0;
                auVar164._12_4_ = auVar158._12_4_ * fStack_964 + 0.0;
                auVar121._0_4_ = fVar233 * auVar266._0_4_ + fVar288 * auVar216._0_4_;
                auVar121._4_4_ = fVar111 * auVar266._4_4_ + fVar231 * auVar216._4_4_;
                auVar121._8_4_ = fVar234 * auVar266._8_4_ + fVar112 * auVar216._8_4_;
                auVar121._12_4_ = fVar235 * auVar266._12_4_ + fVar205 * auVar216._12_4_;
                local_8e0._0_16_ = auVar121;
                auVar158 = vsubps_avx(auVar164,auVar121);
                _local_aa0 = auVar158;
                auVar158 = vdpps_avx(auVar158,auVar158,0x7f);
                fVar288 = auVar158._0_4_;
                if (fVar288 < 0.0) {
                  fVar231 = sqrtf(fVar288);
                }
                else {
                  auVar118 = vsqrtss_avx(auVar158,auVar158);
                  fVar231 = auVar118._0_4_;
                }
                auVar118 = vsubps_avx(auVar216,auVar266);
                auVar294._0_4_ = auVar118._0_4_ * 3.0;
                auVar294._4_4_ = auVar118._4_4_ * 3.0;
                auVar294._8_4_ = auVar118._8_4_ * 3.0;
                auVar294._12_4_ = auVar118._12_4_ * 3.0;
                auVar118 = vshufps_avx(ZEXT416((uint)(fVar256 * 6.0)),ZEXT416((uint)(fVar256 * 6.0))
                                       ,0);
                auVar122 = ZEXT416((uint)((fVar232 - (fVar256 + fVar256)) * 6.0));
                auVar188 = vshufps_avx(auVar122,auVar122,0);
                auVar122 = ZEXT416((uint)((fVar256 - (fVar232 + fVar232)) * 6.0));
                auVar217 = vshufps_avx(auVar122,auVar122,0);
                auVar12 = vshufps_avx(ZEXT416((uint)(fVar232 * 6.0)),ZEXT416((uint)(fVar232 * 6.0)),
                                      0);
                auVar122 = vdpps_avx(auVar294,auVar294,0x7f);
                auVar165._0_4_ =
                     auVar12._0_4_ * (float)local_ae0._0_4_ +
                     auVar217._0_4_ * (float)local_b00._0_4_ +
                     auVar118._0_4_ * (float)local_b10._0_4_ +
                     auVar188._0_4_ * (float)local_af0._0_4_;
                auVar165._4_4_ =
                     auVar12._4_4_ * (float)local_ae0._4_4_ +
                     auVar217._4_4_ * (float)local_b00._4_4_ +
                     auVar118._4_4_ * (float)local_b10._4_4_ +
                     auVar188._4_4_ * (float)local_af0._4_4_;
                auVar165._8_4_ =
                     auVar12._8_4_ * fStack_ad8 +
                     auVar217._8_4_ * fStack_af8 +
                     auVar118._8_4_ * fStack_b08 + auVar188._8_4_ * fStack_ae8;
                auVar165._12_4_ =
                     auVar12._12_4_ * fStack_ad4 +
                     auVar217._12_4_ * fStack_af4 +
                     auVar118._12_4_ * fStack_b04 + auVar188._12_4_ * fStack_ae4;
                auVar118 = vblendps_avx(auVar122,_DAT_01f7aa10,0xe);
                auVar188 = vrsqrtss_avx(auVar118,auVar118);
                fVar205 = auVar188._0_4_;
                fVar112 = auVar122._0_4_;
                auVar188 = vdpps_avx(auVar294,auVar165,0x7f);
                auVar217 = vshufps_avx(auVar122,auVar122,0);
                auVar166._0_4_ = auVar165._0_4_ * auVar217._0_4_;
                auVar166._4_4_ = auVar165._4_4_ * auVar217._4_4_;
                auVar166._8_4_ = auVar165._8_4_ * auVar217._8_4_;
                auVar166._12_4_ = auVar165._12_4_ * auVar217._12_4_;
                auVar188 = vshufps_avx(auVar188,auVar188,0);
                auVar244._0_4_ = auVar294._0_4_ * auVar188._0_4_;
                auVar244._4_4_ = auVar294._4_4_ * auVar188._4_4_;
                auVar244._8_4_ = auVar294._8_4_ * auVar188._8_4_;
                auVar244._12_4_ = auVar294._12_4_ * auVar188._12_4_;
                auVar12 = vsubps_avx(auVar166,auVar244);
                auVar188 = vrcpss_avx(auVar118,auVar118);
                auVar118 = vmaxss_avx(ZEXT416((uint)local_a80._0_4_),
                                      ZEXT416((uint)(auVar263._0_4_ * (float)local_760._0_4_)));
                auVar188 = ZEXT416((uint)(auVar188._0_4_ * (2.0 - fVar112 * auVar188._0_4_)));
                auVar188 = vshufps_avx(auVar188,auVar188,0);
                uVar101 = CONCAT44(auVar294._4_4_,auVar294._0_4_);
                auVar346._0_8_ = uVar101 ^ 0x8000000080000000;
                auVar346._8_4_ = -auVar294._8_4_;
                auVar346._12_4_ = -auVar294._12_4_;
                auVar217 = ZEXT416((uint)(fVar205 * 1.5 +
                                         fVar112 * -0.5 * fVar205 * fVar205 * fVar205));
                auVar217 = vshufps_avx(auVar217,auVar217,0);
                auVar218._0_4_ = auVar217._0_4_ * auVar12._0_4_ * auVar188._0_4_;
                auVar218._4_4_ = auVar217._4_4_ * auVar12._4_4_ * auVar188._4_4_;
                auVar218._8_4_ = auVar217._8_4_ * auVar12._8_4_ * auVar188._8_4_;
                auVar218._12_4_ = auVar217._12_4_ * auVar12._12_4_ * auVar188._12_4_;
                local_9a0._0_4_ = auVar294._0_4_ * auVar217._0_4_;
                local_9a0._4_4_ = auVar294._4_4_ * auVar217._4_4_;
                local_9a0._8_4_ = auVar294._8_4_ * auVar217._8_4_;
                local_9a0._12_4_ = auVar294._12_4_ * auVar217._12_4_;
                if (fVar112 < 0.0) {
                  fVar112 = sqrtf(fVar112);
                }
                else {
                  auVar122 = vsqrtss_avx(auVar122,auVar122);
                  fVar112 = auVar122._0_4_;
                }
                auVar122 = vdpps_avx(_local_aa0,local_9a0._0_16_,0x7f);
                fVar231 = ((float)local_a80._0_4_ / fVar112) * (fVar231 + 1.0) +
                          fVar231 * (float)local_a80._0_4_ + auVar118._0_4_;
                auVar188 = vdpps_avx(auVar346,local_9a0._0_16_,0x7f);
                auVar217 = vdpps_avx(_local_aa0,auVar218,0x7f);
                auVar12 = vdpps_avx(_local_970,local_9a0._0_16_,0x7f);
                auVar13 = vdpps_avx(_local_aa0,auVar346,0x7f);
                fVar112 = auVar188._0_4_ + auVar217._0_4_;
                fVar205 = auVar122._0_4_;
                auVar123._0_4_ = fVar205 * fVar205;
                auVar123._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                auVar123._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                auVar123._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                auVar217 = vsubps_avx(auVar158,auVar123);
                local_9a0._0_16_ = ZEXT416((uint)fVar112);
                auVar188 = vdpps_avx(_local_aa0,_local_970,0x7f);
                fVar232 = auVar13._0_4_ - fVar205 * fVar112;
                fVar205 = auVar188._0_4_ - fVar205 * auVar12._0_4_;
                auVar188 = vrsqrtss_avx(auVar217,auVar217);
                fVar233 = auVar217._0_4_;
                fVar112 = auVar188._0_4_;
                fVar112 = fVar112 * 1.5 + fVar233 * -0.5 * fVar112 * fVar112 * fVar112;
                if (fVar233 < 0.0) {
                  local_940._0_4_ = fVar232;
                  local_780._0_4_ = fVar205;
                  local_7a0._0_4_ = fVar112;
                  fVar233 = sqrtf(fVar233);
                  fVar112 = (float)local_7a0._0_4_;
                  fVar232 = (float)local_940._0_4_;
                  fVar205 = (float)local_780._0_4_;
                }
                else {
                  auVar188 = vsqrtss_avx(auVar217,auVar217);
                  fVar233 = auVar188._0_4_;
                }
                auVar13 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar120 = vshufps_avx(auVar294,auVar294,0xff);
                fVar232 = fVar232 * fVar112 - auVar120._0_4_;
                auVar245._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
                auVar245._8_4_ = auVar12._8_4_ ^ 0x80000000;
                auVar245._12_4_ = auVar12._12_4_ ^ 0x80000000;
                auVar267._0_4_ = -fVar232;
                auVar267._4_4_ = 0x80000000;
                auVar267._8_4_ = 0x80000000;
                auVar267._12_4_ = 0x80000000;
                auVar188 = vinsertps_avx(auVar267,ZEXT416((uint)(fVar205 * fVar112)),0x1c);
                auVar12 = vmovsldup_avx(ZEXT416((uint)(local_9a0._0_4_ * fVar205 * fVar112 -
                                                      auVar12._0_4_ * fVar232)));
                auVar188 = vdivps_avx(auVar188,auVar12);
                auVar217 = vinsertps_avx(local_9a0._0_16_,auVar245,0x10);
                auVar217 = vdivps_avx(auVar217,auVar12);
                auVar12 = vmovsldup_avx(auVar122);
                auVar124 = ZEXT416((uint)(fVar233 - auVar13._0_4_));
                auVar13 = vmovsldup_avx(auVar124);
                auVar189._0_4_ = auVar12._0_4_ * auVar188._0_4_ + auVar13._0_4_ * auVar217._0_4_;
                auVar189._4_4_ = auVar12._4_4_ * auVar188._4_4_ + auVar13._4_4_ * auVar217._4_4_;
                auVar189._8_4_ = auVar12._8_4_ * auVar188._8_4_ + auVar13._8_4_ * auVar217._8_4_;
                auVar189._12_4_ =
                     auVar12._12_4_ * auVar188._12_4_ + auVar13._12_4_ * auVar217._12_4_;
                auVar263 = vsubps_avx(auVar263,auVar189);
                auVar190._8_4_ = 0x7fffffff;
                auVar190._0_8_ = 0x7fffffff7fffffff;
                auVar190._12_4_ = 0x7fffffff;
                auVar122 = vandps_avx(auVar122,auVar190);
                if (auVar122._0_4_ < fVar231) {
                  auVar219._8_4_ = 0x7fffffff;
                  auVar219._0_8_ = 0x7fffffff7fffffff;
                  auVar219._12_4_ = 0x7fffffff;
                  auVar122 = vandps_avx(auVar124,auVar219);
                  if (auVar122._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + fVar231 + auVar118._0_4_) {
                    fVar231 = auVar263._0_4_ + (float)local_8c0._0_4_;
                    auVar305 = ZEXT3264(local_a60);
                    if ((fVar231 < fVar206) ||
                       (fVar112 = *(float *)(ray + k * 4 + 0x100), fVar112 < fVar231)) break;
                    auVar118 = vmovshdup_avx(auVar263);
                    fVar205 = auVar118._0_4_;
                    if ((fVar205 < 0.0) || (1.0 < fVar205)) break;
                    auVar158 = vrsqrtss_avx(auVar158,auVar158);
                    fVar232 = auVar158._0_4_;
                    pGVar24 = (context->scene->geometries).items[uVar104].ptr;
                    if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar158 = ZEXT416((uint)(fVar232 * 1.5 +
                                             fVar288 * -0.5 * fVar232 * fVar232 * fVar232));
                    auVar158 = vshufps_avx(auVar158,auVar158,0);
                    auVar220._0_4_ = auVar158._0_4_ * (float)local_aa0._0_4_;
                    auVar220._4_4_ = auVar158._4_4_ * (float)local_aa0._4_4_;
                    auVar220._8_4_ = auVar158._8_4_ * fStack_a98;
                    auVar220._12_4_ = auVar158._12_4_ * fStack_a94;
                    auVar167._0_4_ = auVar294._0_4_ + auVar120._0_4_ * auVar220._0_4_;
                    auVar167._4_4_ = auVar294._4_4_ + auVar120._4_4_ * auVar220._4_4_;
                    auVar167._8_4_ = auVar294._8_4_ + auVar120._8_4_ * auVar220._8_4_;
                    auVar167._12_4_ = auVar294._12_4_ + auVar120._12_4_ * auVar220._12_4_;
                    auVar158 = vshufps_avx(auVar220,auVar220,0xc9);
                    auVar118 = vshufps_avx(auVar294,auVar294,0xc9);
                    auVar221._0_4_ = auVar118._0_4_ * auVar220._0_4_;
                    auVar221._4_4_ = auVar118._4_4_ * auVar220._4_4_;
                    auVar221._8_4_ = auVar118._8_4_ * auVar220._8_4_;
                    auVar221._12_4_ = auVar118._12_4_ * auVar220._12_4_;
                    auVar246._0_4_ = auVar294._0_4_ * auVar158._0_4_;
                    auVar246._4_4_ = auVar294._4_4_ * auVar158._4_4_;
                    auVar246._8_4_ = auVar294._8_4_ * auVar158._8_4_;
                    auVar246._12_4_ = auVar294._12_4_ * auVar158._12_4_;
                    auVar122 = vsubps_avx(auVar246,auVar221);
                    auVar158 = vshufps_avx(auVar122,auVar122,0xc9);
                    auVar118 = vshufps_avx(auVar167,auVar167,0xc9);
                    auVar247._0_4_ = auVar118._0_4_ * auVar158._0_4_;
                    auVar247._4_4_ = auVar118._4_4_ * auVar158._4_4_;
                    auVar247._8_4_ = auVar118._8_4_ * auVar158._8_4_;
                    auVar247._12_4_ = auVar118._12_4_ * auVar158._12_4_;
                    auVar158 = vshufps_avx(auVar122,auVar122,0xd2);
                    auVar168._0_4_ = auVar167._0_4_ * auVar158._0_4_;
                    auVar168._4_4_ = auVar167._4_4_ * auVar158._4_4_;
                    auVar168._8_4_ = auVar167._8_4_ * auVar158._8_4_;
                    auVar168._12_4_ = auVar167._12_4_ * auVar158._12_4_;
                    auVar158 = vsubps_avx(auVar247,auVar168);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar231;
                      uVar9 = vextractps_avx(auVar158,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                      uVar9 = vextractps_avx(auVar158,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar158._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar205;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_920;
                      *(uint *)(ray + k * 4 + 0x240) = uVar104;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar29 = context->user;
                    auStack_590 = vshufps_avx(auVar263,auVar263,0x55);
                    auStack_5f0 = vshufps_avx(auVar158,auVar158,0x55);
                    auStack_5d0 = vshufps_avx(auVar158,auVar158,0xaa);
                    auStack_5b0 = vshufps_avx(auVar158,auVar158,0);
                    local_600 = (RTCHitN  [16])auStack_5f0;
                    local_5e0 = auStack_5d0;
                    local_5c0 = auStack_5b0;
                    local_5a0 = auStack_590;
                    local_580 = ZEXT832(0) << 0x20;
                    local_560 = local_4a0._0_8_;
                    uStack_558 = local_4a0._8_8_;
                    uStack_550 = local_4a0._16_8_;
                    uStack_548 = local_4a0._24_8_;
                    local_540 = local_480._0_8_;
                    uStack_538 = local_480._8_8_;
                    uStack_530 = local_480._16_8_;
                    uStack_528 = local_480._24_8_;
                    *(undefined8 *)(local_9c8 + 8) = local_9c0._0_8_;
                    *(undefined8 *)(local_9c8 + 10) = local_9c0._8_8_;
                    *(undefined8 *)(local_9c8 + 0xc) = local_9c0._16_8_;
                    *(undefined8 *)(local_9c8 + 0xe) = local_9c0._24_8_;
                    *(undefined8 *)local_9c8 = local_9c0._0_8_;
                    *(undefined8 *)(local_9c8 + 2) = local_9c0._8_8_;
                    *(undefined8 *)(local_9c8 + 4) = local_9c0._16_8_;
                    *(undefined8 *)(local_9c8 + 6) = local_9c0._24_8_;
                    local_520 = pRVar29->instID[0];
                    uStack_51c = local_520;
                    uStack_518 = local_520;
                    uStack_514 = local_520;
                    uStack_510 = local_520;
                    uStack_50c = local_520;
                    uStack_508 = local_520;
                    uStack_504 = local_520;
                    local_500 = pRVar29->instPrimID[0];
                    uStack_4fc = local_500;
                    uStack_4f8 = local_500;
                    uStack_4f4 = local_500;
                    uStack_4f0 = local_500;
                    uStack_4ec = local_500;
                    uStack_4e8 = local_500;
                    uStack_4e4 = local_500;
                    *(float *)(ray + k * 4 + 0x100) = fVar231;
                    local_b40 = *local_9d0;
                    local_b30 = *local_9d8;
                    local_ad0.valid = (int *)local_b40;
                    local_ad0.geometryUserPtr = pGVar24->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_600;
                    local_ad0.N = 8;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar24->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar24->intersectionFilterN)(&local_ad0);
                      auVar305 = ZEXT3264(local_a60);
                    }
                    auVar263 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                    auVar158 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                    auVar204._16_16_ = auVar158;
                    auVar204._0_16_ = auVar263;
                    auVar125 = local_9c0 & ~auVar204;
                    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar125 >> 0x7f,0) != '\0') ||
                          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar125 >> 0xbf,0) != '\0') ||
                        (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar125[0x1f] < '\0') {
                      p_Var28 = context->args->filter;
                      if ((p_Var28 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var28)(&local_ad0);
                        auVar305 = ZEXT3264(local_a60);
                      }
                      auVar263 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                      auVar158 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                      auVar139._16_16_ = auVar158;
                      auVar139._0_16_ = auVar263;
                      auVar125 = local_9c0 & ~auVar139;
                      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar125 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar125 >> 0x7f,0) != '\0') ||
                            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar125 >> 0xbf,0) != '\0') ||
                          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar125[0x1f] < '\0') {
                        auVar140._0_4_ = auVar263._0_4_ ^ local_9c0._0_4_;
                        auVar140._4_4_ = auVar263._4_4_ ^ local_9c0._4_4_;
                        auVar140._8_4_ = auVar263._8_4_ ^ local_9c0._8_4_;
                        auVar140._12_4_ = auVar263._12_4_ ^ local_9c0._12_4_;
                        auVar140._16_4_ = auVar158._0_4_ ^ local_9c0._16_4_;
                        auVar140._20_4_ = auVar158._4_4_ ^ local_9c0._20_4_;
                        auVar140._24_4_ = auVar158._8_4_ ^ local_9c0._24_4_;
                        auVar140._28_4_ = auVar158._12_4_ ^ local_9c0._28_4_;
                        auVar125 = vmaskmovps_avx(auVar140,*(undefined1 (*) [32])local_ad0.hit);
                        *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar140,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x20));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar140,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x40));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar140,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x60));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar140,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x80));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar140,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar140,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar140,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar140,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x100));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar125;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar112;
                    break;
                  }
                }
                lVar106 = lVar106 + -1;
                auVar305 = ZEXT3264(local_a60);
              } while (lVar106 != 0);
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar134._4_4_ = uVar9;
              auVar134._0_4_ = uVar9;
              auVar134._8_4_ = uVar9;
              auVar134._12_4_ = uVar9;
              auVar134._16_4_ = uVar9;
              auVar134._20_4_ = uVar9;
              auVar134._24_4_ = uVar9;
              auVar134._28_4_ = uVar9;
              auVar180 = vcmpps_avx(_local_860,auVar134,2);
              auVar125 = vandps_avx(auVar180,local_660);
              local_660 = local_660 & auVar180;
            } while ((((((((local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_660 >> 0x7f,0) != '\0') ||
                       (local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_660 >> 0xbf,0) != '\0') ||
                     (local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_660[0x1f] < '\0');
            local_660 = auVar125;
          }
          auVar402 = ZEXT3264(local_a20);
          auVar358 = ZEXT3264(local_a00);
          auVar449 = ZEXT3264(local_a40);
          auVar125 = vandps_avx(local_6a0,local_680);
          auVar180 = vandps_avx(_local_8a0,_local_880);
          auVar252._0_4_ = (float)local_900 + local_400._0_4_;
          auVar252._4_4_ = local_900._4_4_ + local_400._4_4_;
          auVar252._8_4_ = (float)uStack_8f8 + local_400._8_4_;
          auVar252._12_4_ = uStack_8f8._4_4_ + local_400._12_4_;
          auVar252._16_4_ = (float)uStack_8f0 + local_400._16_4_;
          auVar252._20_4_ = uStack_8f0._4_4_ + local_400._20_4_;
          auVar252._24_4_ = (float)uStack_8e8 + local_400._24_4_;
          auVar252._28_4_ = uStack_8e8._4_4_ + local_400._28_4_;
          auVar30 = vcmpps_avx(auVar252,auVar134,2);
          auVar125 = vandps_avx(auVar30,auVar125);
          auVar253._0_4_ = (float)local_900 + local_3c0._0_4_;
          auVar253._4_4_ = local_900._4_4_ + local_3c0._4_4_;
          auVar253._8_4_ = (float)uStack_8f8 + local_3c0._8_4_;
          auVar253._12_4_ = uStack_8f8._4_4_ + local_3c0._12_4_;
          auVar253._16_4_ = (float)uStack_8f0 + local_3c0._16_4_;
          auVar253._20_4_ = uStack_8f0._4_4_ + local_3c0._20_4_;
          auVar253._24_4_ = (float)uStack_8e8 + local_3c0._24_4_;
          auVar253._28_4_ = uStack_8e8._4_4_ + local_3c0._28_4_;
          auVar30 = vcmpps_avx(auVar253,auVar134,2);
          auVar180 = vandps_avx(auVar30,auVar180);
          auVar180 = vorps_avx(auVar125,auVar180);
          if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar180 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar180 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar180 >> 0x7f,0) != '\0') ||
                (auVar180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar180 >> 0xbf,0) != '\0') ||
              (auVar180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar180[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar109 * 0x60) = auVar180;
            auVar125 = vblendvps_avx(local_3c0,_local_400,auVar125);
            *(undefined1 (*) [32])(auStack_160 + uVar109 * 0x60) = auVar125;
            uVar10 = vmovlps_avx(local_610);
            (&uStack_140)[uVar109 * 0xc] = uVar10;
            aiStack_138[uVar109 * 0x18] = local_cc8 + 1;
            iVar108 = iVar108 + 1;
          }
          goto LAB_0117a0b3;
        }
      }
      auVar402 = ZEXT3264(local_a20);
      auVar358 = ZEXT3264(local_a00);
      auVar449 = ZEXT3264(local_a40);
      auVar305 = ZEXT3264(local_a60);
    }
LAB_0117a0b3:
    auVar296 = local_440;
    if (iVar108 == 0) break;
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar131._4_4_ = uVar9;
    auVar131._0_4_ = uVar9;
    auVar131._8_4_ = uVar9;
    auVar131._12_4_ = uVar9;
    auVar131._16_4_ = uVar9;
    auVar131._20_4_ = uVar9;
    auVar131._24_4_ = uVar9;
    auVar131._28_4_ = uVar9;
    uVar102 = -iVar108;
    pauVar100 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar108 - 1) * 0x60);
    while( true ) {
      auVar125 = pauVar100[1];
      auVar174._0_4_ = (float)local_900 + auVar125._0_4_;
      auVar174._4_4_ = local_900._4_4_ + auVar125._4_4_;
      auVar174._8_4_ = (float)uStack_8f8 + auVar125._8_4_;
      auVar174._12_4_ = uStack_8f8._4_4_ + auVar125._12_4_;
      auVar174._16_4_ = (float)uStack_8f0 + auVar125._16_4_;
      auVar174._20_4_ = uStack_8f0._4_4_ + auVar125._20_4_;
      auVar174._24_4_ = (float)uStack_8e8 + auVar125._24_4_;
      auVar174._28_4_ = uStack_8e8._4_4_ + auVar125._28_4_;
      auVar30 = vcmpps_avx(auVar174,auVar131,2);
      auVar180 = vandps_avx(auVar30,*pauVar100);
      _local_600 = auVar180;
      auVar30 = *pauVar100 & auVar30;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0x7f,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0xbf,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar30[0x1f] < '\0') break;
      pauVar100 = pauVar100 + -3;
      uVar102 = uVar102 + 1;
      if (uVar102 == 0) goto LAB_0117bd29;
    }
    auVar132._8_4_ = 0x7f800000;
    auVar132._0_8_ = 0x7f8000007f800000;
    auVar132._12_4_ = 0x7f800000;
    auVar132._16_4_ = 0x7f800000;
    auVar132._20_4_ = 0x7f800000;
    auVar132._24_4_ = 0x7f800000;
    auVar132._28_4_ = 0x7f800000;
    auVar125 = vblendvps_avx(auVar132,auVar125,auVar180);
    auVar30 = vshufps_avx(auVar125,auVar125,0xb1);
    auVar30 = vminps_avx(auVar125,auVar30);
    auVar366 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vminps_avx(auVar30,auVar366);
    auVar366 = vperm2f128_avx(auVar30,auVar30,1);
    auVar30 = vminps_avx(auVar30,auVar366);
    auVar125 = vcmpps_avx(auVar125,auVar30,0);
    auVar30 = auVar180 & auVar125;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0x7f,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar30 >> 0xbf,0) != '\0') ||
        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar30[0x1f] < '\0')
    {
      auVar180 = vandps_avx(auVar125,auVar180);
    }
    auVar116._8_8_ = 0;
    auVar116._0_8_ = *(ulong *)pauVar100[2];
    local_cc8 = *(uint *)(pauVar100[2] + 8);
    uVar103 = vmovmskps_avx(auVar180);
    uVar99 = 0;
    if (uVar103 != 0) {
      for (; (uVar103 >> uVar99 & 1) == 0; uVar99 = uVar99 + 1) {
      }
    }
    *(undefined4 *)(local_600 + (ulong)uVar99 * 4) = 0;
    *pauVar100 = _local_600;
    uVar103 = ~uVar102;
    if ((((((((_local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_600 >> 0x7f,0) != '\0') ||
          (_local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_600 >> 0xbf,0) != '\0') ||
        (_local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_600[0x1f] < '\0') {
      uVar103 = -uVar102;
    }
    uVar109 = (ulong)uVar103;
    auVar263 = vshufps_avx(auVar116,auVar116,0);
    auVar158 = vshufps_avx(auVar116,auVar116,0x55);
    auVar158 = vsubps_avx(auVar158,auVar263);
    local_400._4_4_ = auVar263._4_4_ + auVar158._4_4_ * 0.14285715;
    local_400._0_4_ = auVar263._0_4_ + auVar158._0_4_ * 0.0;
    fStack_3f8 = auVar263._8_4_ + auVar158._8_4_ * 0.2857143;
    fStack_3f4 = auVar263._12_4_ + auVar158._12_4_ * 0.42857146;
    fStack_3f0 = auVar263._0_4_ + auVar158._0_4_ * 0.5714286;
    fStack_3ec = auVar263._4_4_ + auVar158._4_4_ * 0.71428573;
    fStack_3e8 = auVar263._8_4_ + auVar158._8_4_ * 0.8571429;
    fStack_3e4 = auVar263._12_4_ + auVar158._12_4_;
    local_610._8_8_ = 0;
    local_610._0_8_ = *(ulong *)(local_400 + (ulong)uVar99 * 4);
  } while( true );
LAB_0117bd29:
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar143._4_4_ = uVar9;
  auVar143._0_4_ = uVar9;
  auVar143._8_4_ = uVar9;
  auVar143._12_4_ = uVar9;
  auVar143._16_4_ = uVar9;
  auVar143._20_4_ = uVar9;
  auVar143._24_4_ = uVar9;
  auVar143._28_4_ = uVar9;
  auVar125 = vcmpps_avx(local_320,auVar143,2);
  uVar104 = vmovmskps_avx(auVar125);
  uVar98 = uVar98 - 1 & uVar98 & uVar104;
  if (uVar98 == 0) {
    return;
  }
  goto LAB_01178eaf;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }